

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx512::CurveNiMBIntersectorK<4,8>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  float *pfVar5;
  Primitive PVar6;
  uint uVar7;
  undefined4 uVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  RTCRayQueryContext *pRVar13;
  RTCFilterFunctionN p_Var14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  float fVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [12];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  byte bVar68;
  byte bVar69;
  ulong uVar70;
  byte bVar71;
  uint uVar72;
  byte bVar73;
  byte bVar74;
  byte bVar75;
  long lVar76;
  ulong uVar77;
  long lVar78;
  bool bVar79;
  ulong uVar80;
  uint uVar81;
  uint uVar141;
  uint uVar142;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  uint uVar144;
  uint uVar145;
  uint uVar146;
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  uint uVar143;
  uint uVar147;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar140 [32];
  float fVar148;
  undefined4 uVar149;
  float fVar171;
  float fVar173;
  vint4 bi_2;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar172;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  vint4 bi_1;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar199;
  float fVar218;
  float fVar219;
  vint4 bi;
  float fVar220;
  undefined1 auVar213 [32];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [64];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  float fVar244;
  vint4 ai_2;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar245;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  vint4 ai_1;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [64];
  float fVar251;
  float fVar257;
  float fVar258;
  vint4 ai;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  float fVar259;
  float fVar260;
  float fVar261;
  float fVar262;
  undefined1 auVar256 [32];
  float fVar263;
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  float fVar274;
  undefined1 auVar272 [28];
  undefined1 auVar273 [64];
  float fVar276;
  undefined1 auVar277 [16];
  float fVar275;
  float fVar282;
  undefined1 auVar278 [32];
  float fVar280;
  float fVar281;
  float fVar283;
  float fVar284;
  float fVar285;
  undefined1 auVar279 [64];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  float fVar290;
  undefined1 auVar288 [32];
  undefined1 auVar289 [64];
  undefined1 auVar291 [16];
  undefined1 auVar292 [32];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [64];
  undefined1 auVar297 [16];
  undefined1 auVar298 [64];
  undefined1 auVar299 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  RTCFilterFunctionNArguments local_970;
  undefined1 local_940 [32];
  undefined1 local_910 [16];
  undefined1 (*local_8f8) [32];
  Primitive *local_8f0;
  ulong local_8e8;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [16];
  undefined1 local_870 [16];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined1 local_7c0 [16];
  undefined1 local_7b0 [16];
  float local_7a0;
  float fStack_79c;
  float fStack_798;
  float fStack_794;
  undefined1 local_790 [16];
  undefined1 local_780 [16];
  undefined1 local_770 [16];
  float local_760;
  float fStack_75c;
  float fStack_758;
  float fStack_754;
  ulong local_748;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_630 [16];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  RTCHitN local_580 [32];
  undefined1 local_560 [32];
  undefined4 local_540;
  undefined4 uStack_53c;
  undefined4 uStack_538;
  undefined4 uStack_534;
  undefined4 uStack_530;
  undefined4 uStack_52c;
  undefined4 uStack_528;
  undefined4 uStack_524;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [32];
  uint local_4a0;
  uint uStack_49c;
  uint uStack_498;
  uint uStack_494;
  uint uStack_490;
  uint uStack_48c;
  uint uStack_488;
  uint uStack_484;
  uint local_480;
  uint uStack_47c;
  uint uStack_478;
  uint uStack_474;
  uint uStack_470;
  uint uStack_46c;
  uint uStack_468;
  uint uStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined4 local_360;
  undefined4 uStack_35c;
  undefined4 uStack_358;
  undefined4 uStack_354;
  undefined4 uStack_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined4 local_2e0;
  undefined4 uStack_2dc;
  undefined4 uStack_2d8;
  undefined4 uStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [7];
  float fStack_144;
  undefined8 uStack_140;
  float afStack_138 [66];
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar136 [32];
  undefined1 auVar139 [32];
  undefined1 auVar127 [32];
  undefined1 auVar271 [64];
  undefined1 auVar293 [64];
  
  PVar6 = prim[1];
  uVar80 = (ulong)(byte)PVar6;
  lVar78 = uVar80 * 0x25;
  fVar251 = *(float *)(prim + lVar78 + 0x12);
  auVar86 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar86 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar85 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar85 = vinsertps_avx(auVar85,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar86 = vsubps_avx(auVar86,*(undefined1 (*) [16])(prim + lVar78 + 6));
  auVar221._0_4_ = fVar251 * auVar86._0_4_;
  auVar221._4_4_ = fVar251 * auVar86._4_4_;
  auVar221._8_4_ = fVar251 * auVar86._8_4_;
  auVar221._12_4_ = fVar251 * auVar86._12_4_;
  auVar86 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 * 4 + 6)));
  auVar150._0_4_ = fVar251 * auVar85._0_4_;
  auVar150._4_4_ = fVar251 * auVar85._4_4_;
  auVar150._8_4_ = fVar251 * auVar85._8_4_;
  auVar150._12_4_ = fVar251 * auVar85._12_4_;
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 * 5 + 6)));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar88 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 * 6 + 6)));
  auVar277 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 * 0xf + 6)));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar277 = vcvtdq2ps_avx(auVar277);
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar80 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar90 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 * 0x1a + 6)));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 * 0x1b + 6)));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar269 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 * 0x1c + 6)));
  auVar269 = vcvtdq2ps_avx(auVar269);
  auVar246._4_4_ = auVar150._0_4_;
  auVar246._0_4_ = auVar150._0_4_;
  auVar246._8_4_ = auVar150._0_4_;
  auVar246._12_4_ = auVar150._0_4_;
  auVar92 = vshufps_avx(auVar150,auVar150,0x55);
  auVar91 = vshufps_avx(auVar150,auVar150,0xaa);
  fVar251 = auVar91._0_4_;
  auVar200._0_4_ = fVar251 * auVar88._0_4_;
  fVar171 = auVar91._4_4_;
  auVar200._4_4_ = fVar171 * auVar88._4_4_;
  fVar257 = auVar91._8_4_;
  auVar200._8_4_ = fVar257 * auVar88._8_4_;
  fVar258 = auVar91._12_4_;
  auVar200._12_4_ = fVar258 * auVar88._12_4_;
  auVar178._0_4_ = auVar22._0_4_ * fVar251;
  auVar178._4_4_ = auVar22._4_4_ * fVar171;
  auVar178._8_4_ = auVar22._8_4_ * fVar257;
  auVar178._12_4_ = auVar22._12_4_ * fVar258;
  auVar151._0_4_ = auVar269._0_4_ * fVar251;
  auVar151._4_4_ = auVar269._4_4_ * fVar171;
  auVar151._8_4_ = auVar269._8_4_ * fVar257;
  auVar151._12_4_ = auVar269._12_4_ * fVar258;
  auVar91 = vfmadd231ps_fma(auVar200,auVar92,auVar85);
  auVar93 = vfmadd231ps_fma(auVar178,auVar92,auVar89);
  auVar92 = vfmadd231ps_fma(auVar151,auVar87,auVar92);
  auVar94 = vfmadd231ps_fma(auVar91,auVar246,auVar86);
  auVar93 = vfmadd231ps_fma(auVar93,auVar246,auVar277);
  auVar28 = vfmadd231ps_fma(auVar92,auVar90,auVar246);
  auVar297._4_4_ = auVar221._0_4_;
  auVar297._0_4_ = auVar221._0_4_;
  auVar297._8_4_ = auVar221._0_4_;
  auVar297._12_4_ = auVar221._0_4_;
  auVar92 = vshufps_avx(auVar221,auVar221,0x55);
  auVar91 = vshufps_avx(auVar221,auVar221,0xaa);
  fVar251 = auVar91._0_4_;
  auVar247._0_4_ = fVar251 * auVar88._0_4_;
  fVar171 = auVar91._4_4_;
  auVar247._4_4_ = fVar171 * auVar88._4_4_;
  fVar257 = auVar91._8_4_;
  auVar247._8_4_ = fVar257 * auVar88._8_4_;
  fVar258 = auVar91._12_4_;
  auVar247._12_4_ = fVar258 * auVar88._12_4_;
  auVar234._0_4_ = auVar22._0_4_ * fVar251;
  auVar234._4_4_ = auVar22._4_4_ * fVar171;
  auVar234._8_4_ = auVar22._8_4_ * fVar257;
  auVar234._12_4_ = auVar22._12_4_ * fVar258;
  auVar222._0_4_ = auVar269._0_4_ * fVar251;
  auVar222._4_4_ = auVar269._4_4_ * fVar171;
  auVar222._8_4_ = auVar269._8_4_ * fVar257;
  auVar222._12_4_ = auVar269._12_4_ * fVar258;
  auVar85 = vfmadd231ps_fma(auVar247,auVar92,auVar85);
  auVar88 = vfmadd231ps_fma(auVar234,auVar92,auVar89);
  auVar89 = vfmadd231ps_fma(auVar222,auVar92,auVar87);
  auVar29 = vfmadd231ps_fma(auVar85,auVar297,auVar86);
  auVar150 = vfmadd231ps_fma(auVar88,auVar297,auVar277);
  auVar268._8_4_ = 0x7fffffff;
  auVar268._0_8_ = 0x7fffffff7fffffff;
  auVar268._12_4_ = 0x7fffffff;
  auVar151 = vfmadd231ps_fma(auVar89,auVar297,auVar90);
  auVar86 = vandps_avx(auVar268,auVar94);
  auVar264._8_4_ = 0x219392ef;
  auVar264._0_8_ = 0x219392ef219392ef;
  auVar264._12_4_ = 0x219392ef;
  uVar70 = vcmpps_avx512vl(auVar86,auVar264,1);
  bVar15 = (bool)((byte)uVar70 & 1);
  auVar82._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar94._0_4_;
  bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar94._4_4_;
  bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar94._8_4_;
  bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar94._12_4_;
  auVar86 = vandps_avx(auVar268,auVar93);
  uVar70 = vcmpps_avx512vl(auVar86,auVar264,1);
  bVar15 = (bool)((byte)uVar70 & 1);
  auVar83._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar93._0_4_;
  bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar83._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar93._4_4_;
  bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar83._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar93._8_4_;
  bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar83._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar93._12_4_;
  auVar86 = vandps_avx(auVar268,auVar28);
  uVar70 = vcmpps_avx512vl(auVar86,auVar264,1);
  bVar15 = (bool)((byte)uVar70 & 1);
  auVar84._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar28._0_4_;
  bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar28._4_4_;
  bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar28._8_4_;
  bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar28._12_4_;
  auVar85 = vrcp14ps_avx512vl(auVar82);
  auVar265._8_4_ = 0x3f800000;
  auVar265._0_8_ = &DAT_3f8000003f800000;
  auVar265._12_4_ = 0x3f800000;
  auVar86 = vfnmadd213ps_fma(auVar82,auVar85,auVar265);
  auVar94 = vfmadd132ps_fma(auVar86,auVar85,auVar85);
  auVar85 = vrcp14ps_avx512vl(auVar83);
  auVar86 = vfnmadd213ps_fma(auVar83,auVar85,auVar265);
  auVar28 = vfmadd132ps_fma(auVar86,auVar85,auVar85);
  auVar85 = vrcp14ps_avx512vl(auVar84);
  auVar86 = vfnmadd213ps_fma(auVar84,auVar85,auVar265);
  auVar27 = vfmadd132ps_fma(auVar86,auVar85,auVar85);
  fVar251 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar78 + 0x16)) *
            *(float *)(prim + lVar78 + 0x1a);
  auVar252._4_4_ = fVar251;
  auVar252._0_4_ = fVar251;
  auVar252._8_4_ = fVar251;
  auVar252._12_4_ = fVar251;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar80 * 7 + 6);
  auVar86 = vpmovsxwd_avx(auVar86);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar80 * 0xb + 6);
  auVar85 = vpmovsxwd_avx(auVar85);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar277 = vsubps_avx(auVar85,auVar86);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar80 * 9 + 6);
  auVar85 = vpmovsxwd_avx(auVar88);
  auVar88 = vfmadd213ps_fma(auVar277,auVar252,auVar86);
  auVar86 = vcvtdq2ps_avx(auVar85);
  auVar277._8_8_ = 0;
  auVar277._0_8_ = *(ulong *)(prim + uVar80 * 0xd + 6);
  auVar85 = vpmovsxwd_avx(auVar277);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar86);
  auVar277 = vfmadd213ps_fma(auVar85,auVar252,auVar86);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar80 * 0x12 + 6);
  auVar86 = vpmovsxwd_avx(auVar89);
  auVar86 = vcvtdq2ps_avx(auVar86);
  uVar70 = (ulong)(uint)((int)(uVar80 * 5) << 2);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar80 * 2 + uVar70 + 6);
  auVar85 = vpmovsxwd_avx(auVar22);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar86);
  auVar89 = vfmadd213ps_fma(auVar85,auVar252,auVar86);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar70 + 6);
  auVar86 = vpmovsxwd_avx(auVar90);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar80 * 0x18 + 6);
  auVar85 = vpmovsxwd_avx(auVar87);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar86);
  auVar22 = vfmadd213ps_fma(auVar85,auVar252,auVar86);
  auVar289 = ZEXT1664(auVar22);
  auVar269._8_8_ = 0;
  auVar269._0_8_ = *(ulong *)(prim + uVar80 * 0x1d + 6);
  auVar86 = vpmovsxwd_avx(auVar269);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar80 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar85 = vpmovsxwd_avx(auVar92);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar86);
  auVar90 = vfmadd213ps_fma(auVar85,auVar252,auVar86);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar80) + 6);
  auVar86 = vpmovsxwd_avx(auVar91);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar80 * 0x23 + 6);
  auVar85 = vpmovsxwd_avx(auVar93);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar86);
  auVar85 = vfmadd213ps_fma(auVar85,auVar252,auVar86);
  auVar86 = vsubps_avx(auVar88,auVar29);
  auVar253._0_4_ = auVar94._0_4_ * auVar86._0_4_;
  auVar253._4_4_ = auVar94._4_4_ * auVar86._4_4_;
  auVar253._8_4_ = auVar94._8_4_ * auVar86._8_4_;
  auVar253._12_4_ = auVar94._12_4_ * auVar86._12_4_;
  auVar86 = vsubps_avx(auVar277,auVar29);
  auVar201._0_4_ = auVar94._0_4_ * auVar86._0_4_;
  auVar201._4_4_ = auVar94._4_4_ * auVar86._4_4_;
  auVar201._8_4_ = auVar94._8_4_ * auVar86._8_4_;
  auVar201._12_4_ = auVar94._12_4_ * auVar86._12_4_;
  auVar86 = vsubps_avx(auVar89,auVar150);
  auVar248._0_4_ = auVar28._0_4_ * auVar86._0_4_;
  auVar248._4_4_ = auVar28._4_4_ * auVar86._4_4_;
  auVar248._8_4_ = auVar28._8_4_ * auVar86._8_4_;
  auVar248._12_4_ = auVar28._12_4_ * auVar86._12_4_;
  auVar86 = vsubps_avx(auVar22,auVar150);
  auVar179._0_4_ = auVar28._0_4_ * auVar86._0_4_;
  auVar179._4_4_ = auVar28._4_4_ * auVar86._4_4_;
  auVar179._8_4_ = auVar28._8_4_ * auVar86._8_4_;
  auVar179._12_4_ = auVar28._12_4_ * auVar86._12_4_;
  auVar86 = vsubps_avx(auVar90,auVar151);
  auVar235._0_4_ = auVar27._0_4_ * auVar86._0_4_;
  auVar235._4_4_ = auVar27._4_4_ * auVar86._4_4_;
  auVar235._8_4_ = auVar27._8_4_ * auVar86._8_4_;
  auVar235._12_4_ = auVar27._12_4_ * auVar86._12_4_;
  auVar86 = vsubps_avx(auVar85,auVar151);
  auVar152._0_4_ = auVar27._0_4_ * auVar86._0_4_;
  auVar152._4_4_ = auVar27._4_4_ * auVar86._4_4_;
  auVar152._8_4_ = auVar27._8_4_ * auVar86._8_4_;
  auVar152._12_4_ = auVar27._12_4_ * auVar86._12_4_;
  auVar86 = vpminsd_avx(auVar253,auVar201);
  auVar85 = vpminsd_avx(auVar248,auVar179);
  auVar86 = vmaxps_avx(auVar86,auVar85);
  auVar85 = vpminsd_avx(auVar235,auVar152);
  uVar149 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar94._4_4_ = uVar149;
  auVar94._0_4_ = uVar149;
  auVar94._8_4_ = uVar149;
  auVar94._12_4_ = uVar149;
  auVar85 = vmaxps_avx512vl(auVar85,auVar94);
  auVar86 = vmaxps_avx(auVar86,auVar85);
  auVar28._8_4_ = 0x3f7ffffa;
  auVar28._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar28._12_4_ = 0x3f7ffffa;
  local_630 = vmulps_avx512vl(auVar86,auVar28);
  auVar86 = vpmaxsd_avx(auVar253,auVar201);
  auVar85 = vpmaxsd_avx(auVar248,auVar179);
  auVar86 = vminps_avx(auVar86,auVar85);
  auVar85 = vpmaxsd_avx(auVar235,auVar152);
  uVar149 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar27._4_4_ = uVar149;
  auVar27._0_4_ = uVar149;
  auVar27._8_4_ = uVar149;
  auVar27._12_4_ = uVar149;
  auVar85 = vminps_avx512vl(auVar85,auVar27);
  auVar86 = vminps_avx(auVar86,auVar85);
  auVar29._8_4_ = 0x3f800003;
  auVar29._0_8_ = 0x3f8000033f800003;
  auVar29._12_4_ = 0x3f800003;
  auVar86 = vmulps_avx512vl(auVar86,auVar29);
  auVar85 = vpbroadcastd_avx512vl();
  uVar24 = vcmpps_avx512vl(local_630,auVar86,2);
  local_748 = vpcmpgtd_avx512vl(auVar85,_DAT_01ff0cf0);
  local_748 = ((byte)uVar24 & 0xf) & local_748;
  if ((char)local_748 == '\0') {
    return;
  }
  local_8f8 = (undefined1 (*) [32])&local_4a0;
  local_620 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar273 = ZEXT3264(CONCAT428(0x7fffffff,
                                CONCAT424(0x7fffffff,
                                          CONCAT420(0x7fffffff,
                                                    CONCAT416(0x7fffffff,
                                                              CONCAT412(0x7fffffff,
                                                                        CONCAT48(0x7fffffff,
                                                                                 0x7fffffff7fffffff)
                                                                       ))))));
  auVar279 = ZEXT3264(_DAT_02020f20);
  auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar299 = ZEXT3264(auVar95);
  local_8f0 = prim;
LAB_01c38837:
  lVar78 = 0;
  for (uVar70 = local_748; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
    lVar78 = lVar78 + 1;
  }
  uVar72 = *(uint *)(prim + 2);
  uVar7 = *(uint *)(prim + lVar78 * 4 + 6);
  pGVar9 = (context->scene->geometries).items[uVar72].ptr;
  uVar70 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           (ulong)uVar7 *
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar251 = (pGVar9->time_range).lower;
  fVar251 = pGVar9->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar251) / ((pGVar9->time_range).upper - fVar251));
  auVar86 = vroundss_avx(ZEXT416((uint)fVar251),ZEXT416((uint)fVar251),9);
  auVar86 = vminss_avx(auVar86,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
  auVar86 = vmaxss_avx(ZEXT816(0) << 0x20,auVar86);
  fVar251 = fVar251 - auVar86._0_4_;
  _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar76 = (long)(int)auVar86._0_4_ * 0x38;
  lVar78 = *(long *)(_Var10 + 0x10 + lVar76);
  lVar11 = *(long *)(_Var10 + 0x38 + lVar76);
  lVar12 = *(long *)(_Var10 + 0x48 + lVar76);
  pfVar5 = (float *)(lVar11 + uVar70 * lVar12);
  auVar202._0_4_ = fVar251 * *pfVar5;
  auVar202._4_4_ = fVar251 * pfVar5[1];
  auVar202._8_4_ = fVar251 * pfVar5[2];
  auVar202._12_4_ = fVar251 * pfVar5[3];
  pfVar5 = (float *)(lVar11 + (uVar70 + 1) * lVar12);
  auVar223._0_4_ = fVar251 * *pfVar5;
  auVar223._4_4_ = fVar251 * pfVar5[1];
  auVar223._8_4_ = fVar251 * pfVar5[2];
  auVar223._12_4_ = fVar251 * pfVar5[3];
  pfVar5 = (float *)(lVar11 + (uVar70 + 2) * lVar12);
  auVar236._0_4_ = fVar251 * *pfVar5;
  auVar236._4_4_ = fVar251 * pfVar5[1];
  auVar236._8_4_ = fVar251 * pfVar5[2];
  auVar236._12_4_ = fVar251 * pfVar5[3];
  pfVar5 = (float *)(lVar11 + lVar12 * (uVar70 + 3));
  auVar180._0_4_ = fVar251 * *pfVar5;
  auVar180._4_4_ = fVar251 * pfVar5[1];
  auVar180._8_4_ = fVar251 * pfVar5[2];
  auVar180._12_4_ = fVar251 * pfVar5[3];
  lVar11 = *(long *)(_Var10 + lVar76);
  fVar251 = 1.0 - fVar251;
  auVar153._4_4_ = fVar251;
  auVar153._0_4_ = fVar251;
  auVar153._8_4_ = fVar251;
  auVar153._12_4_ = fVar251;
  auVar88 = vfmadd231ps_fma(auVar202,auVar153,*(undefined1 (*) [16])(lVar11 + lVar78 * uVar70));
  auVar277 = vfmadd231ps_fma(auVar223,auVar153,
                             *(undefined1 (*) [16])(lVar11 + lVar78 * (uVar70 + 1)));
  auVar89 = vfmadd231ps_fma(auVar236,auVar153,*(undefined1 (*) [16])(lVar11 + lVar78 * (uVar70 + 2))
                           );
  auVar22 = vfmadd231ps_fma(auVar180,auVar153,*(undefined1 (*) [16])(lVar11 + lVar78 * (uVar70 + 3))
                           );
  auVar86 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar85 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar95 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
  local_8e0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xa0)));
  auVar298 = ZEXT3264(local_8e0);
  auVar86 = vunpcklps_avx512vl(auVar95._0_16_,local_8e0._0_16_);
  fVar251 = *(float *)(ray + k * 4 + 0xc0);
  auVar291._4_4_ = fVar251;
  auVar291._0_4_ = fVar251;
  auVar291._8_4_ = fVar251;
  auVar291._12_4_ = fVar251;
  fStack_730 = fVar251;
  _local_740 = auVar291;
  fStack_72c = fVar251;
  fStack_728 = fVar251;
  register0x0000151c = fVar251;
  auVar293 = ZEXT3264(_local_740);
  local_870 = vinsertps_avx(auVar86,auVar291,0x28);
  auVar296 = ZEXT1664(local_870);
  auVar249._0_4_ = auVar88._0_4_ + auVar277._0_4_ + auVar89._0_4_ + auVar22._0_4_;
  auVar249._4_4_ = auVar88._4_4_ + auVar277._4_4_ + auVar89._4_4_ + auVar22._4_4_;
  auVar249._8_4_ = auVar88._8_4_ + auVar277._8_4_ + auVar89._8_4_ + auVar22._8_4_;
  auVar249._12_4_ = auVar88._12_4_ + auVar277._12_4_ + auVar89._12_4_ + auVar22._12_4_;
  auVar30._8_4_ = 0x3e800000;
  auVar30._0_8_ = 0x3e8000003e800000;
  auVar30._12_4_ = 0x3e800000;
  auVar86 = vmulps_avx512vl(auVar249,auVar30);
  auVar86 = vsubps_avx(auVar86,auVar85);
  auVar86 = vdpps_avx(auVar86,local_870,0x7f);
  fVar171 = *(float *)(ray + k * 4 + 0x60);
  local_880 = vdpps_avx(local_870,local_870,0x7f);
  auVar269 = ZEXT816(0) << 0x40;
  auVar271 = ZEXT1664(auVar269);
  auVar254._4_12_ = ZEXT812(0) << 0x20;
  auVar254._0_4_ = local_880._0_4_;
  auVar87 = vrcp14ss_avx512f(auVar269,auVar254);
  auVar90 = vfnmadd213ss_fma(auVar87,local_880,ZEXT416(0x40000000));
  local_400 = auVar86._0_4_ * auVar87._0_4_ * auVar90._0_4_;
  auVar250 = ZEXT464((uint)local_400);
  auVar255._4_4_ = local_400;
  auVar255._0_4_ = local_400;
  auVar255._8_4_ = local_400;
  auVar255._12_4_ = local_400;
  fStack_6f0 = local_400;
  _local_700 = auVar255;
  fStack_6ec = local_400;
  fStack_6e8 = local_400;
  fStack_6e4 = local_400;
  auVar86 = vfmadd231ps_fma(auVar85,local_870,auVar255);
  auVar86 = vblendps_avx(auVar86,auVar269,8);
  auVar85 = vsubps_avx(auVar88,auVar86);
  auVar88 = vsubps_avx(auVar89,auVar86);
  auVar277 = vsubps_avx(auVar277,auVar86);
  auVar86 = vsubps_avx(auVar22,auVar86);
  local_1e0 = auVar85._0_4_;
  uStack_1dc = local_1e0;
  uStack_1d8 = local_1e0;
  uStack_1d4 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1cc = local_1e0;
  uStack_1c8 = local_1e0;
  uStack_1c4 = local_1e0;
  auVar97._8_4_ = 1;
  auVar97._0_8_ = 0x100000001;
  auVar97._12_4_ = 1;
  auVar97._16_4_ = 1;
  auVar97._20_4_ = 1;
  auVar97._24_4_ = 1;
  auVar97._28_4_ = 1;
  local_800 = ZEXT1632(auVar85);
  local_200 = vpermps_avx2(auVar97,local_800);
  auVar96._8_4_ = 2;
  auVar96._0_8_ = 0x200000002;
  auVar96._12_4_ = 2;
  auVar96._16_4_ = 2;
  auVar96._20_4_ = 2;
  auVar96._24_4_ = 2;
  auVar96._28_4_ = 2;
  local_220 = vpermps_avx2(auVar96,local_800);
  auVar98._8_4_ = 3;
  auVar98._0_8_ = 0x300000003;
  auVar98._12_4_ = 3;
  auVar98._16_4_ = 3;
  auVar98._20_4_ = 3;
  auVar98._24_4_ = 3;
  auVar98._28_4_ = 3;
  local_240 = vpermps_avx2(auVar98,local_800);
  local_260 = auVar277._0_4_;
  uStack_25c = local_260;
  uStack_258 = local_260;
  uStack_254 = local_260;
  uStack_250 = local_260;
  uStack_24c = local_260;
  uStack_248 = local_260;
  uStack_244 = local_260;
  local_840 = ZEXT1632(auVar277);
  local_280 = vpermps_avx2(auVar97,local_840);
  local_2a0 = vpermps_avx2(auVar96,local_840);
  local_2c0 = vpermps_avx2(auVar98,local_840);
  local_2e0 = auVar88._0_4_;
  uStack_2dc = local_2e0;
  uStack_2d8 = local_2e0;
  uStack_2d4 = local_2e0;
  uStack_2d0 = local_2e0;
  uStack_2cc = local_2e0;
  uStack_2c8 = local_2e0;
  uStack_2c4 = local_2e0;
  local_820 = ZEXT1632(auVar88);
  local_300 = vpermps_avx2(auVar97,local_820);
  local_320 = vpermps_avx2(auVar96,local_820);
  local_340 = vpermps_avx2(auVar98,local_820);
  local_360 = auVar86._0_4_;
  uStack_35c = local_360;
  uStack_358 = local_360;
  uStack_354 = local_360;
  uStack_350 = local_360;
  uStack_34c = local_360;
  uStack_348 = local_360;
  uStack_344 = local_360;
  _local_860 = ZEXT1632(auVar86);
  local_380 = vpermps_avx2(auVar97,_local_860);
  local_3a0 = vpermps_avx2(auVar96,_local_860);
  auVar96 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  local_3c0 = vpermps_avx2(auVar98,_local_860);
  auVar97 = vfmadd231ps_avx512vl(ZEXT432((uint)(fVar251 * fVar251)),local_8e0,local_8e0);
  auVar97 = vfmadd231ps_avx512vl(auVar97,auVar95,auVar95);
  local_3e0._0_4_ = auVar97._0_4_;
  local_3e0._4_4_ = local_3e0._0_4_;
  local_3e0._8_4_ = local_3e0._0_4_;
  local_3e0._12_4_ = local_3e0._0_4_;
  local_3e0._16_4_ = local_3e0._0_4_;
  local_3e0._20_4_ = local_3e0._0_4_;
  local_3e0._24_4_ = local_3e0._0_4_;
  local_3e0._28_4_ = local_3e0._0_4_;
  local_5a0 = vandps_avx(auVar273._0_32_,local_3e0);
  local_7b0 = ZEXT416((uint)local_400);
  local_400 = fVar171 - local_400;
  fStack_3fc = local_400;
  fStack_3f8 = local_400;
  fStack_3f4 = local_400;
  fStack_3f0 = local_400;
  fStack_3ec = local_400;
  fStack_3e8 = local_400;
  fStack_3e4 = local_400;
  local_5e0 = vpbroadcastd_avx512vl();
  uVar70 = 0;
  local_8e8 = 1;
  local_600 = vpbroadcastd_avx512vl();
  auVar86 = vsqrtss_avx(local_880,local_880);
  auVar85 = vsqrtss_avx(local_880,local_880);
  auVar217 = ZEXT1664(ZEXT816(0x3f80000000000000));
  do {
    local_910 = auVar217._0_16_;
    auVar88 = vmovshdup_avx(local_910);
    fVar251 = auVar217._0_4_;
    fVar23 = auVar88._0_4_ - fVar251;
    fVar262 = fVar23 * 0.04761905;
    auVar241._4_4_ = fVar251;
    auVar241._0_4_ = fVar251;
    auVar241._8_4_ = fVar251;
    auVar241._12_4_ = fVar251;
    auVar241._16_4_ = fVar251;
    auVar241._20_4_ = fVar251;
    auVar241._24_4_ = fVar251;
    auVar241._28_4_ = fVar251;
    local_8a0._4_4_ = fVar23;
    local_8a0._0_4_ = fVar23;
    local_8a0._8_4_ = fVar23;
    local_8a0._12_4_ = fVar23;
    local_8a0._16_4_ = fVar23;
    local_8a0._20_4_ = fVar23;
    local_8a0._24_4_ = fVar23;
    local_8a0._28_4_ = fVar23;
    auVar88 = vfmadd231ps_fma(auVar241,local_8a0,auVar279._0_32_);
    auVar98 = vsubps_avx512vl(auVar299._0_32_,ZEXT1632(auVar88));
    fVar251 = auVar98._0_4_;
    fVar258 = auVar98._4_4_;
    fVar260 = auVar98._8_4_;
    fVar274 = auVar98._12_4_;
    fVar263 = auVar98._16_4_;
    fVar245 = auVar98._20_4_;
    fVar276 = auVar98._24_4_;
    fVar148 = fVar251 * fVar251 * fVar251;
    fVar172 = fVar258 * fVar258 * fVar258;
    fVar173 = fVar260 * fVar260 * fVar260;
    fVar174 = fVar274 * fVar274 * fVar274;
    fVar175 = fVar263 * fVar263 * fVar263;
    fVar176 = fVar245 * fVar245 * fVar245;
    fVar177 = fVar276 * fVar276 * fVar276;
    fVar257 = auVar88._0_4_;
    fVar259 = auVar88._4_4_;
    fVar261 = auVar88._8_4_;
    fVar244 = auVar88._12_4_;
    fVar199 = fVar257 * fVar257 * fVar257;
    fVar218 = fVar259 * fVar259 * fVar259;
    fVar219 = fVar261 * fVar261 * fVar261;
    fVar220 = fVar244 * fVar244 * fVar244;
    fVar275 = fVar257 * fVar251;
    fVar280 = fVar259 * fVar258;
    fVar281 = fVar261 * fVar260;
    fVar282 = fVar244 * fVar274;
    fVar283 = fVar263 * 0.0;
    fVar284 = fVar245 * 0.0;
    fVar285 = fVar276 * 0.0;
    fVar290 = auVar289._28_4_ + auVar296._28_4_ + fVar23;
    auVar102._4_4_ = fVar172 * 0.16666667;
    auVar102._0_4_ = fVar148 * 0.16666667;
    auVar102._8_4_ = fVar173 * 0.16666667;
    auVar102._12_4_ = fVar174 * 0.16666667;
    auVar102._16_4_ = fVar175 * 0.16666667;
    auVar102._20_4_ = fVar176 * 0.16666667;
    auVar102._24_4_ = fVar177 * 0.16666667;
    auVar102._28_4_ = fVar290;
    auVar103._4_4_ =
         (fVar280 * fVar258 * 12.0 + fVar280 * fVar259 * 6.0 + fVar218 + fVar172 * 4.0) * 0.16666667
    ;
    auVar103._0_4_ =
         (fVar275 * fVar251 * 12.0 + fVar275 * fVar257 * 6.0 + fVar199 + fVar148 * 4.0) * 0.16666667
    ;
    auVar103._8_4_ =
         (fVar281 * fVar260 * 12.0 + fVar281 * fVar261 * 6.0 + fVar219 + fVar173 * 4.0) * 0.16666667
    ;
    auVar103._12_4_ =
         (fVar282 * fVar274 * 12.0 + fVar282 * fVar244 * 6.0 + fVar220 + fVar174 * 4.0) * 0.16666667
    ;
    auVar103._16_4_ =
         (fVar283 * fVar263 * 12.0 + fVar283 * 0.0 * 6.0 + fVar175 * 4.0 + 0.0) * 0.16666667;
    auVar103._20_4_ =
         (fVar284 * fVar245 * 12.0 + fVar284 * 0.0 * 6.0 + fVar176 * 4.0 + 0.0) * 0.16666667;
    auVar103._24_4_ =
         (fVar285 * fVar276 * 12.0 + fVar285 * 0.0 * 6.0 + fVar177 * 4.0 + 0.0) * 0.16666667;
    auVar103._28_4_ = auVar293._28_4_;
    auVar104._4_4_ =
         (fVar218 * 4.0 + fVar172 + fVar280 * fVar259 * 12.0 + fVar280 * fVar258 * 6.0) * 0.16666667
    ;
    auVar104._0_4_ =
         (fVar199 * 4.0 + fVar148 + fVar275 * fVar257 * 12.0 + fVar275 * fVar251 * 6.0) * 0.16666667
    ;
    auVar104._8_4_ =
         (fVar219 * 4.0 + fVar173 + fVar281 * fVar261 * 12.0 + fVar281 * fVar260 * 6.0) * 0.16666667
    ;
    auVar104._12_4_ =
         (fVar220 * 4.0 + fVar174 + fVar282 * fVar244 * 12.0 + fVar282 * fVar274 * 6.0) * 0.16666667
    ;
    auVar104._16_4_ = (fVar175 + 0.0 + fVar283 * 0.0 * 12.0 + fVar283 * fVar263 * 6.0) * 0.16666667;
    auVar104._20_4_ = (fVar176 + 0.0 + fVar284 * 0.0 * 12.0 + fVar284 * fVar245 * 6.0) * 0.16666667;
    auVar104._24_4_ = (fVar177 + 0.0 + fVar285 * 0.0 * 12.0 + fVar285 * fVar276 * 6.0) * 0.16666667;
    auVar104._28_4_ = auVar296._28_4_;
    auVar105._28_4_ = fVar290 + auVar293._28_4_ + auVar250._28_4_;
    auVar105._0_28_ =
         ZEXT1628(CONCAT412(fVar220 * 0.16666667,
                            CONCAT48(fVar219 * 0.16666667,
                                     CONCAT44(fVar218 * 0.16666667,fVar199 * 0.16666667))));
    auVar118._4_4_ = uStack_35c;
    auVar118._0_4_ = local_360;
    auVar118._8_4_ = uStack_358;
    auVar118._12_4_ = uStack_354;
    auVar118._16_4_ = uStack_350;
    auVar118._20_4_ = uStack_34c;
    auVar118._24_4_ = uStack_348;
    auVar118._28_4_ = uStack_344;
    auVar97 = vmulps_avx512vl(auVar118,auVar105);
    auVar99 = vmulps_avx512vl(local_380,auVar105);
    auVar100 = vmulps_avx512vl(local_3a0,auVar105);
    auVar101 = vmulps_avx512vl(local_3c0,auVar105);
    auVar213._4_4_ = uStack_2dc;
    auVar213._0_4_ = local_2e0;
    auVar213._8_4_ = uStack_2d8;
    auVar213._12_4_ = uStack_2d4;
    auVar213._16_4_ = uStack_2d0;
    auVar213._20_4_ = uStack_2cc;
    auVar213._24_4_ = uStack_2c8;
    auVar213._28_4_ = uStack_2c4;
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar104,auVar213);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar104,local_300);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar104,local_320);
    auVar101 = vfmadd231ps_avx512vl(auVar101,local_340,auVar104);
    auVar119._4_4_ = uStack_25c;
    auVar119._0_4_ = local_260;
    auVar119._8_4_ = uStack_258;
    auVar119._12_4_ = uStack_254;
    auVar119._16_4_ = uStack_250;
    auVar119._20_4_ = uStack_24c;
    auVar119._24_4_ = uStack_248;
    auVar119._28_4_ = uStack_244;
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar103,auVar119);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar103,local_280);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar103,local_2a0);
    auVar101 = vfmadd231ps_avx512vl(auVar101,local_2c0,auVar103);
    auVar120._4_4_ = uStack_1dc;
    auVar120._0_4_ = local_1e0;
    auVar120._8_4_ = uStack_1d8;
    auVar120._12_4_ = uStack_1d4;
    auVar120._16_4_ = uStack_1d0;
    auVar120._20_4_ = uStack_1cc;
    auVar120._24_4_ = uStack_1c8;
    auVar120._28_4_ = uStack_1c4;
    auVar277 = vfmadd231ps_fma(auVar97,auVar102,auVar120);
    auVar89 = vfmadd231ps_fma(auVar99,auVar102,local_200);
    auVar22 = vfmadd231ps_fma(auVar100,auVar102,local_220);
    auVar102 = vfmadd231ps_avx512vl(auVar101,local_240,auVar102);
    auVar99 = vxorps_avx512vl(auVar98,auVar96);
    auVar96 = vxorps_avx512vl(ZEXT1632(auVar88),auVar96);
    auVar124._0_4_ = auVar96._0_4_ * fVar257;
    auVar124._4_4_ = auVar96._4_4_ * fVar259;
    auVar124._8_4_ = auVar96._8_4_ * fVar261;
    auVar124._12_4_ = auVar96._12_4_ * fVar244;
    auVar124._16_4_ = auVar96._16_4_ * 0.0;
    auVar124._20_4_ = auVar96._20_4_ * 0.0;
    auVar124._24_4_ = auVar96._24_4_ * 0.0;
    auVar124._28_4_ = 0;
    auVar106._4_4_ = fVar280 * 4.0;
    auVar106._0_4_ = fVar275 * 4.0;
    auVar106._8_4_ = fVar281 * 4.0;
    auVar106._12_4_ = fVar282 * 4.0;
    auVar106._16_4_ = fVar283 * 4.0;
    auVar106._20_4_ = fVar284 * 4.0;
    auVar106._24_4_ = fVar285 * 4.0;
    auVar106._28_4_ = auVar279._28_4_;
    auVar97 = vsubps_avx(auVar124,auVar106);
    auVar107._4_4_ = auVar99._4_4_ * fVar258 * 0.5;
    auVar107._0_4_ = auVar99._0_4_ * fVar251 * 0.5;
    auVar107._8_4_ = auVar99._8_4_ * fVar260 * 0.5;
    auVar107._12_4_ = auVar99._12_4_ * fVar274 * 0.5;
    auVar107._16_4_ = auVar99._16_4_ * fVar263 * 0.5;
    auVar107._20_4_ = auVar99._20_4_ * fVar245 * 0.5;
    auVar107._24_4_ = auVar99._24_4_ * fVar276 * 0.5;
    auVar107._28_4_ = auVar98._28_4_;
    auVar108._4_4_ = auVar97._4_4_ * 0.5;
    auVar108._0_4_ = auVar97._0_4_ * 0.5;
    auVar108._8_4_ = auVar97._8_4_ * 0.5;
    auVar108._12_4_ = auVar97._12_4_ * 0.5;
    auVar108._16_4_ = auVar97._16_4_ * 0.5;
    auVar108._20_4_ = auVar97._20_4_ * 0.5;
    auVar108._24_4_ = auVar97._24_4_ * 0.5;
    auVar108._28_4_ = auVar97._28_4_;
    auVar112._4_4_ = (fVar258 * fVar258 + fVar280 * 4.0) * 0.5;
    auVar112._0_4_ = (fVar251 * fVar251 + fVar275 * 4.0) * 0.5;
    auVar112._8_4_ = (fVar260 * fVar260 + fVar281 * 4.0) * 0.5;
    auVar112._12_4_ = (fVar274 * fVar274 + fVar282 * 4.0) * 0.5;
    auVar112._16_4_ = (fVar263 * fVar263 + fVar283 * 4.0) * 0.5;
    auVar112._20_4_ = (fVar245 * fVar245 + fVar284 * 4.0) * 0.5;
    auVar112._24_4_ = (fVar276 * fVar276 + fVar285 * 4.0) * 0.5;
    auVar112._28_4_ = auVar271._28_4_ + auVar279._28_4_;
    auVar113._28_4_ = auVar273._28_4_;
    auVar113._0_28_ =
         ZEXT1628(CONCAT412(fVar244 * fVar244 * 0.5,
                            CONCAT48(fVar261 * fVar261 * 0.5,
                                     CONCAT44(fVar259 * fVar259 * 0.5,fVar257 * fVar257 * 0.5))));
    auVar97 = vmulps_avx512vl(auVar118,auVar113);
    auVar98 = vmulps_avx512vl(local_380,auVar113);
    auVar99 = vmulps_avx512vl(local_3a0,auVar113);
    auVar100 = vmulps_avx512vl(local_3c0,auVar113);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar112,auVar213);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar112,local_300);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar112,local_320);
    auVar100 = vfmadd231ps_avx512vl(auVar100,local_340,auVar112);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar108,auVar119);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar108,local_280);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar108,local_2a0);
    auVar100 = vfmadd231ps_avx512vl(auVar100,local_2c0,auVar108);
    auVar88 = vfmadd231ps_fma(auVar97,auVar107,auVar120);
    auVar90 = vfmadd231ps_fma(auVar98,auVar107,local_200);
    auVar87 = vfmadd231ps_fma(auVar99,auVar107,local_220);
    auVar97 = vfmadd231ps_avx512vl(auVar100,local_240,auVar107);
    auVar123._4_4_ = auVar88._4_4_ * fVar262;
    auVar123._0_4_ = auVar88._0_4_ * fVar262;
    auVar123._8_4_ = auVar88._8_4_ * fVar262;
    auVar123._12_4_ = auVar88._12_4_ * fVar262;
    auVar123._16_4_ = fVar262 * 0.0;
    auVar123._20_4_ = fVar262 * 0.0;
    auVar123._24_4_ = fVar262 * 0.0;
    auVar123._28_4_ = auVar96._28_4_;
    auVar289 = ZEXT3264(auVar123);
    auVar126._0_4_ = auVar90._0_4_ * fVar262;
    auVar126._4_4_ = auVar90._4_4_ * fVar262;
    auVar126._8_4_ = auVar90._8_4_ * fVar262;
    auVar126._12_4_ = auVar90._12_4_ * fVar262;
    auVar126._16_4_ = fVar262 * 0.0;
    auVar126._20_4_ = fVar262 * 0.0;
    auVar126._24_4_ = fVar262 * 0.0;
    auVar126._28_4_ = 0;
    auVar293 = ZEXT3264(auVar126);
    auVar127._0_4_ = auVar87._0_4_ * fVar262;
    auVar127._4_4_ = auVar87._4_4_ * fVar262;
    auVar127._8_4_ = auVar87._8_4_ * fVar262;
    auVar127._12_4_ = auVar87._12_4_ * fVar262;
    auVar127._16_4_ = fVar262 * 0.0;
    auVar127._20_4_ = fVar262 * 0.0;
    auVar127._24_4_ = fVar262 * 0.0;
    auVar127._28_4_ = 0;
    auVar296 = ZEXT3264(auVar127);
    fVar251 = auVar97._0_4_ * fVar262;
    fVar257 = auVar97._4_4_ * fVar262;
    auVar114._4_4_ = fVar257;
    auVar114._0_4_ = fVar251;
    fVar258 = auVar97._8_4_ * fVar262;
    auVar114._8_4_ = fVar258;
    fVar259 = auVar97._12_4_ * fVar262;
    auVar114._12_4_ = fVar259;
    fVar260 = auVar97._16_4_ * fVar262;
    auVar114._16_4_ = fVar260;
    fVar261 = auVar97._20_4_ * fVar262;
    auVar114._20_4_ = fVar261;
    fVar262 = auVar97._24_4_ * fVar262;
    auVar114._24_4_ = fVar262;
    auVar114._28_4_ = 0x40800000;
    auVar88 = vxorps_avx512vl(local_3c0._0_16_,local_3c0._0_16_);
    auVar103 = vpermt2ps_avx512vl(ZEXT1632(auVar277),_DAT_0205fd20,ZEXT1632(auVar88));
    auVar271 = ZEXT3264(auVar103);
    auVar104 = vpermt2ps_avx512vl(ZEXT1632(auVar89),_DAT_0205fd20,ZEXT1632(auVar88));
    auVar98 = ZEXT1632(auVar88);
    auVar105 = vpermt2ps_avx512vl(ZEXT1632(auVar22),_DAT_0205fd20,auVar98);
    auVar125._0_4_ = fVar251 + auVar102._0_4_;
    auVar125._4_4_ = fVar257 + auVar102._4_4_;
    auVar125._8_4_ = fVar258 + auVar102._8_4_;
    auVar125._12_4_ = fVar259 + auVar102._12_4_;
    auVar125._16_4_ = fVar260 + auVar102._16_4_;
    auVar125._20_4_ = fVar261 + auVar102._20_4_;
    auVar125._24_4_ = fVar262 + auVar102._24_4_;
    auVar125._28_4_ = auVar102._28_4_ + 4.0;
    auVar97 = vmaxps_avx(auVar102,auVar125);
    auVar96 = vminps_avx(auVar102,auVar125);
    auVar100 = vpermt2ps_avx512vl(auVar102,_DAT_0205fd20,auVar98);
    auVar106 = vpermt2ps_avx512vl(auVar123,_DAT_0205fd20,auVar98);
    auVar107 = vpermt2ps_avx512vl(auVar126,_DAT_0205fd20,auVar98);
    auVar250 = ZEXT3264(auVar107);
    auVar119 = ZEXT1632(auVar88);
    auVar108 = vpermt2ps_avx512vl(auVar127,_DAT_0205fd20,auVar119);
    auVar98 = vpermt2ps_avx512vl(auVar114,_DAT_0205fd20,auVar119);
    auVar101 = vsubps_avx512vl(auVar100,auVar98);
    auVar98 = vsubps_avx(auVar103,ZEXT1632(auVar277));
    auVar102 = vsubps_avx(auVar104,ZEXT1632(auVar89));
    local_6e0 = vsubps_avx512vl(auVar105,ZEXT1632(auVar22));
    auVar99 = vmulps_avx512vl(auVar102,auVar127);
    auVar99 = vfmsub231ps_avx512vl(auVar99,auVar126,local_6e0);
    auVar109 = vmulps_avx512vl(local_6e0,auVar123);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar127,auVar98);
    auVar110 = vmulps_avx512vl(auVar98,auVar126);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar123,auVar102);
    auVar110 = vmulps_avx512vl(auVar110,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar109,auVar109);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar99,auVar99);
    auVar99 = vmulps_avx512vl(local_6e0,local_6e0);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar102,auVar102);
    auVar110 = vfmadd231ps_avx512vl(auVar99,auVar98,auVar98);
    auVar111 = vrcp14ps_avx512vl(auVar110);
    auVar99._8_4_ = 0x3f800000;
    auVar99._0_8_ = &DAT_3f8000003f800000;
    auVar99._12_4_ = 0x3f800000;
    auVar99._16_4_ = 0x3f800000;
    auVar99._20_4_ = 0x3f800000;
    auVar99._24_4_ = 0x3f800000;
    auVar99._28_4_ = 0x3f800000;
    auVar99 = vfnmadd213ps_avx512vl(auVar111,auVar110,auVar99);
    auVar99 = vfmadd132ps_avx512vl(auVar99,auVar111,auVar111);
    auVar109 = vmulps_avx512vl(auVar109,auVar99);
    auVar111 = vmulps_avx512vl(auVar102,auVar108);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar107,local_6e0);
    auVar112 = vmulps_avx512vl(local_6e0,auVar106);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar108,auVar98);
    auVar113 = vmulps_avx512vl(auVar98,auVar107);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar106,auVar102);
    auVar113 = vmulps_avx512vl(auVar113,auVar113);
    auVar112 = vfmadd231ps_avx512vl(auVar113,auVar112,auVar112);
    auVar111 = vfmadd231ps_avx512vl(auVar112,auVar111,auVar111);
    auVar99 = vmulps_avx512vl(auVar111,auVar99);
    auVar99 = vmaxps_avx512vl(auVar109,auVar99);
    auVar99 = vsqrtps_avx512vl(auVar99);
    auVar109 = vmaxps_avx512vl(auVar101,auVar100);
    auVar97 = vmaxps_avx512vl(auVar97,auVar109);
    auVar109 = vaddps_avx512vl(auVar99,auVar97);
    auVar97 = vminps_avx512vl(auVar101,auVar100);
    auVar97 = vminps_avx(auVar96,auVar97);
    auVar97 = vsubps_avx512vl(auVar97,auVar99);
    auVar100._8_4_ = 0x3f800002;
    auVar100._0_8_ = 0x3f8000023f800002;
    auVar100._12_4_ = 0x3f800002;
    auVar100._16_4_ = 0x3f800002;
    auVar100._20_4_ = 0x3f800002;
    auVar100._24_4_ = 0x3f800002;
    auVar100._28_4_ = 0x3f800002;
    auVar96 = vmulps_avx512vl(auVar109,auVar100);
    auVar101._8_4_ = 0x3f7ffffc;
    auVar101._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar101._12_4_ = 0x3f7ffffc;
    auVar101._16_4_ = 0x3f7ffffc;
    auVar101._20_4_ = 0x3f7ffffc;
    auVar101._24_4_ = 0x3f7ffffc;
    auVar101._28_4_ = 0x3f7ffffc;
    auVar99 = vmulps_avx512vl(auVar97,auVar101);
    auVar117._4_4_ = auVar96._4_4_ * auVar96._4_4_;
    auVar117._0_4_ = auVar96._0_4_ * auVar96._0_4_;
    auVar117._8_4_ = auVar96._8_4_ * auVar96._8_4_;
    auVar117._12_4_ = auVar96._12_4_ * auVar96._12_4_;
    auVar117._16_4_ = auVar96._16_4_ * auVar96._16_4_;
    auVar117._20_4_ = auVar96._20_4_ * auVar96._20_4_;
    auVar117._24_4_ = auVar96._24_4_ * auVar96._24_4_;
    auVar117._28_4_ = auVar97._28_4_;
    auVar97 = vrsqrt14ps_avx512vl(auVar110);
    auVar109._8_4_ = 0xbf000000;
    auVar109._0_8_ = 0xbf000000bf000000;
    auVar109._12_4_ = 0xbf000000;
    auVar109._16_4_ = 0xbf000000;
    auVar109._20_4_ = 0xbf000000;
    auVar109._24_4_ = 0xbf000000;
    auVar109._28_4_ = 0xbf000000;
    auVar96 = vmulps_avx512vl(auVar110,auVar109);
    auVar115._4_4_ = auVar97._4_4_ * auVar96._4_4_;
    auVar115._0_4_ = auVar97._0_4_ * auVar96._0_4_;
    auVar115._8_4_ = auVar97._8_4_ * auVar96._8_4_;
    auVar115._12_4_ = auVar97._12_4_ * auVar96._12_4_;
    auVar115._16_4_ = auVar97._16_4_ * auVar96._16_4_;
    auVar115._20_4_ = auVar97._20_4_ * auVar96._20_4_;
    auVar115._24_4_ = auVar97._24_4_ * auVar96._24_4_;
    auVar115._28_4_ = auVar96._28_4_;
    auVar96 = vmulps_avx512vl(auVar97,auVar97);
    auVar96 = vmulps_avx512vl(auVar96,auVar115);
    auVar110._8_4_ = 0x3fc00000;
    auVar110._0_8_ = 0x3fc000003fc00000;
    auVar110._12_4_ = 0x3fc00000;
    auVar110._16_4_ = 0x3fc00000;
    auVar110._20_4_ = 0x3fc00000;
    auVar110._24_4_ = 0x3fc00000;
    auVar110._28_4_ = 0x3fc00000;
    auVar100 = vfmadd231ps_avx512vl(auVar96,auVar97,auVar110);
    auVar116._4_4_ = auVar100._4_4_ * auVar98._4_4_;
    auVar116._0_4_ = auVar100._0_4_ * auVar98._0_4_;
    auVar116._8_4_ = auVar100._8_4_ * auVar98._8_4_;
    auVar116._12_4_ = auVar100._12_4_ * auVar98._12_4_;
    auVar116._16_4_ = auVar100._16_4_ * auVar98._16_4_;
    auVar116._20_4_ = auVar100._20_4_ * auVar98._20_4_;
    auVar116._24_4_ = auVar100._24_4_ * auVar98._24_4_;
    auVar116._28_4_ = auVar97._28_4_;
    auVar97 = vmulps_avx512vl(auVar102,auVar100);
    auVar96 = vmulps_avx512vl(local_6e0,auVar100);
    local_940 = ZEXT1632(auVar277);
    auVar101 = vsubps_avx512vl(auVar119,local_940);
    auVar213 = ZEXT1632(auVar89);
    auVar109 = vsubps_avx512vl(auVar119,auVar213);
    local_8c0 = ZEXT1632(auVar22);
    auVar110 = vsubps_avx512vl(auVar119,local_8c0);
    auVar111 = vmulps_avx512vl(_local_740,auVar110);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar298._0_32_,auVar109);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar95,auVar101);
    auVar112 = vmulps_avx512vl(auVar110,auVar110);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar109,auVar109);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar101,auVar101);
    auVar113 = vmulps_avx512vl(_local_740,auVar96);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar97,auVar298._0_32_);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar116,auVar95);
    auVar96 = vmulps_avx512vl(auVar110,auVar96);
    auVar97 = vfmadd231ps_avx512vl(auVar96,auVar109,auVar97);
    auVar114 = vfmadd231ps_avx512vl(auVar97,auVar101,auVar116);
    auVar115 = vmulps_avx512vl(auVar113,auVar113);
    auVar97 = vsubps_avx(local_3e0,auVar115);
    auVar96 = vmulps_avx512vl(auVar113,auVar114);
    auVar96 = vsubps_avx512vl(auVar111,auVar96);
    auVar116 = vaddps_avx512vl(auVar96,auVar96);
    auVar96 = vmulps_avx512vl(auVar114,auVar114);
    auVar112 = vsubps_avx512vl(auVar112,auVar96);
    auVar96 = vsubps_avx(auVar112,auVar117);
    auVar117 = vmulps_avx512vl(auVar116,auVar116);
    auVar111._8_4_ = 0x40800000;
    auVar111._0_8_ = 0x4080000040800000;
    auVar111._12_4_ = 0x40800000;
    auVar111._16_4_ = 0x40800000;
    auVar111._20_4_ = 0x40800000;
    auVar111._24_4_ = 0x40800000;
    auVar111._28_4_ = 0x40800000;
    auVar111 = vmulps_avx512vl(auVar97,auVar111);
    auVar118 = vmulps_avx512vl(auVar111,auVar96);
    auVar118 = vsubps_avx512vl(auVar117,auVar118);
    uVar80 = vcmpps_avx512vl(auVar118,auVar119,5);
    bVar73 = (byte)uVar80;
    if (bVar73 == 0) {
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar122 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar118 = vsqrtps_avx512vl(auVar118);
      auVar119 = vaddps_avx512vl(auVar97,auVar97);
      auVar120 = vrcp14ps_avx512vl(auVar119);
      auVar34._8_4_ = 0x3f800000;
      auVar34._0_8_ = &DAT_3f8000003f800000;
      auVar34._12_4_ = 0x3f800000;
      auVar34._16_4_ = 0x3f800000;
      auVar34._20_4_ = 0x3f800000;
      auVar34._24_4_ = 0x3f800000;
      auVar34._28_4_ = 0x3f800000;
      auVar119 = vfnmadd213ps_avx512vl(auVar119,auVar120,auVar34);
      auVar119 = vfmadd132ps_avx512vl(auVar119,auVar120,auVar120);
      auVar35._8_4_ = 0x80000000;
      auVar35._0_8_ = 0x8000000080000000;
      auVar35._12_4_ = 0x80000000;
      auVar35._16_4_ = 0x80000000;
      auVar35._20_4_ = 0x80000000;
      auVar35._24_4_ = 0x80000000;
      auVar35._28_4_ = 0x80000000;
      auVar120 = vxorps_avx512vl(auVar116,auVar35);
      auVar120 = vsubps_avx512vl(auVar120,auVar118);
      auVar120 = vmulps_avx512vl(auVar120,auVar119);
      auVar118 = vsubps_avx512vl(auVar118,auVar116);
      auVar118 = vmulps_avx512vl(auVar118,auVar119);
      auVar119 = vfmadd213ps_avx512vl(auVar113,auVar120,auVar114);
      local_660 = vmulps_avx512vl(auVar100,auVar119);
      auVar119 = vfmadd213ps_avx512vl(auVar113,auVar118,auVar114);
      local_680 = vmulps_avx512vl(auVar100,auVar119);
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar119 = vblendmps_avx512vl(auVar119,auVar120);
      auVar121._0_4_ =
           (uint)(bVar73 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar73 & 1) * local_680._0_4_;
      bVar15 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar121._4_4_ = (uint)bVar15 * auVar119._4_4_ | (uint)!bVar15 * local_680._4_4_;
      bVar15 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar121._8_4_ = (uint)bVar15 * auVar119._8_4_ | (uint)!bVar15 * local_680._8_4_;
      bVar15 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar121._12_4_ = (uint)bVar15 * auVar119._12_4_ | (uint)!bVar15 * local_680._12_4_;
      bVar15 = (bool)((byte)(uVar80 >> 4) & 1);
      auVar121._16_4_ = (uint)bVar15 * auVar119._16_4_ | (uint)!bVar15 * local_680._16_4_;
      bVar15 = (bool)((byte)(uVar80 >> 5) & 1);
      auVar121._20_4_ = (uint)bVar15 * auVar119._20_4_ | (uint)!bVar15 * local_680._20_4_;
      bVar15 = (bool)((byte)(uVar80 >> 6) & 1);
      auVar121._24_4_ = (uint)bVar15 * auVar119._24_4_ | (uint)!bVar15 * local_680._24_4_;
      bVar15 = SUB81(uVar80 >> 7,0);
      auVar121._28_4_ = (uint)bVar15 * auVar119._28_4_ | (uint)!bVar15 * local_680._28_4_;
      auVar228._8_4_ = 0xff800000;
      auVar228._0_8_ = 0xff800000ff800000;
      auVar228._12_4_ = 0xff800000;
      auVar228._16_4_ = 0xff800000;
      auVar228._20_4_ = 0xff800000;
      auVar228._24_4_ = 0xff800000;
      auVar228._28_4_ = 0xff800000;
      auVar119 = vblendmps_avx512vl(auVar228,auVar118);
      auVar122._0_4_ =
           (uint)(bVar73 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar118._0_4_;
      bVar15 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar122._4_4_ = (uint)bVar15 * auVar119._4_4_ | (uint)!bVar15 * auVar118._4_4_;
      bVar15 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar122._8_4_ = (uint)bVar15 * auVar119._8_4_ | (uint)!bVar15 * auVar118._8_4_;
      bVar15 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar122._12_4_ = (uint)bVar15 * auVar119._12_4_ | (uint)!bVar15 * auVar118._12_4_;
      bVar15 = (bool)((byte)(uVar80 >> 4) & 1);
      auVar122._16_4_ = (uint)bVar15 * auVar119._16_4_ | (uint)!bVar15 * auVar118._16_4_;
      bVar15 = (bool)((byte)(uVar80 >> 5) & 1);
      auVar122._20_4_ = (uint)bVar15 * auVar119._20_4_ | (uint)!bVar15 * auVar118._20_4_;
      bVar15 = (bool)((byte)(uVar80 >> 6) & 1);
      auVar122._24_4_ = (uint)bVar15 * auVar119._24_4_ | (uint)!bVar15 * auVar118._24_4_;
      bVar15 = SUB81(uVar80 >> 7,0);
      auVar122._28_4_ = (uint)bVar15 * auVar119._28_4_ | (uint)!bVar15 * auVar118._28_4_;
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar115,auVar118);
      auVar119 = vmaxps_avx512vl(local_5a0,auVar118);
      auVar36._8_4_ = 0x36000000;
      auVar36._0_8_ = 0x3600000036000000;
      auVar36._12_4_ = 0x36000000;
      auVar36._16_4_ = 0x36000000;
      auVar36._20_4_ = 0x36000000;
      auVar36._24_4_ = 0x36000000;
      auVar36._28_4_ = 0x36000000;
      auVar119 = vmulps_avx512vl(auVar119,auVar36);
      vandps_avx512vl(auVar97,auVar118);
      uVar77 = vcmpps_avx512vl(auVar119,auVar119,1);
      uVar80 = uVar80 & uVar77;
      bVar75 = (byte)uVar80;
      if (bVar75 != 0) {
        uVar77 = vcmpps_avx512vl(auVar96,_DAT_02020f00,2);
        auVar242._8_4_ = 0xff800000;
        auVar242._0_8_ = 0xff800000ff800000;
        auVar242._12_4_ = 0xff800000;
        auVar242._16_4_ = 0xff800000;
        auVar242._20_4_ = 0xff800000;
        auVar242._24_4_ = 0xff800000;
        auVar242._28_4_ = 0xff800000;
        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar118 = vblendmps_avx512vl(auVar96,auVar242);
        bVar71 = (byte)uVar77;
        uVar81 = (uint)(bVar71 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar119._0_4_;
        bVar15 = (bool)((byte)(uVar77 >> 1) & 1);
        uVar141 = (uint)bVar15 * auVar118._4_4_ | (uint)!bVar15 * auVar119._4_4_;
        bVar15 = (bool)((byte)(uVar77 >> 2) & 1);
        uVar142 = (uint)bVar15 * auVar118._8_4_ | (uint)!bVar15 * auVar119._8_4_;
        bVar15 = (bool)((byte)(uVar77 >> 3) & 1);
        uVar143 = (uint)bVar15 * auVar118._12_4_ | (uint)!bVar15 * auVar119._12_4_;
        bVar15 = (bool)((byte)(uVar77 >> 4) & 1);
        uVar144 = (uint)bVar15 * auVar118._16_4_ | (uint)!bVar15 * auVar119._16_4_;
        bVar15 = (bool)((byte)(uVar77 >> 5) & 1);
        uVar145 = (uint)bVar15 * auVar118._20_4_ | (uint)!bVar15 * auVar119._20_4_;
        bVar15 = (bool)((byte)(uVar77 >> 6) & 1);
        uVar146 = (uint)bVar15 * auVar118._24_4_ | (uint)!bVar15 * auVar119._24_4_;
        bVar15 = SUB81(uVar77 >> 7,0);
        uVar147 = (uint)bVar15 * auVar118._28_4_ | (uint)!bVar15 * auVar119._28_4_;
        auVar121._0_4_ = (bVar75 & 1) * uVar81 | !(bool)(bVar75 & 1) * auVar121._0_4_;
        bVar15 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar121._4_4_ = bVar15 * uVar141 | !bVar15 * auVar121._4_4_;
        bVar15 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar121._8_4_ = bVar15 * uVar142 | !bVar15 * auVar121._8_4_;
        bVar15 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar121._12_4_ = bVar15 * uVar143 | !bVar15 * auVar121._12_4_;
        bVar15 = (bool)((byte)(uVar80 >> 4) & 1);
        auVar121._16_4_ = bVar15 * uVar144 | !bVar15 * auVar121._16_4_;
        bVar15 = (bool)((byte)(uVar80 >> 5) & 1);
        auVar121._20_4_ = bVar15 * uVar145 | !bVar15 * auVar121._20_4_;
        bVar15 = (bool)((byte)(uVar80 >> 6) & 1);
        auVar121._24_4_ = bVar15 * uVar146 | !bVar15 * auVar121._24_4_;
        bVar15 = SUB81(uVar80 >> 7,0);
        auVar121._28_4_ = bVar15 * uVar147 | !bVar15 * auVar121._28_4_;
        auVar96 = vblendmps_avx512vl(auVar242,auVar96);
        bVar15 = (bool)((byte)(uVar77 >> 1) & 1);
        bVar16 = (bool)((byte)(uVar77 >> 2) & 1);
        bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
        bVar18 = (bool)((byte)(uVar77 >> 4) & 1);
        bVar19 = (bool)((byte)(uVar77 >> 5) & 1);
        bVar20 = (bool)((byte)(uVar77 >> 6) & 1);
        bVar21 = SUB81(uVar77 >> 7,0);
        auVar122._0_4_ =
             (uint)(bVar75 & 1) *
             ((uint)(bVar71 & 1) * auVar96._0_4_ | !(bool)(bVar71 & 1) * uVar81) |
             !(bool)(bVar75 & 1) * auVar122._0_4_;
        bVar79 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar122._4_4_ =
             (uint)bVar79 * ((uint)bVar15 * auVar96._4_4_ | !bVar15 * uVar141) |
             !bVar79 * auVar122._4_4_;
        bVar15 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar122._8_4_ =
             (uint)bVar15 * ((uint)bVar16 * auVar96._8_4_ | !bVar16 * uVar142) |
             !bVar15 * auVar122._8_4_;
        bVar15 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar122._12_4_ =
             (uint)bVar15 * ((uint)bVar17 * auVar96._12_4_ | !bVar17 * uVar143) |
             !bVar15 * auVar122._12_4_;
        bVar15 = (bool)((byte)(uVar80 >> 4) & 1);
        auVar122._16_4_ =
             (uint)bVar15 * ((uint)bVar18 * auVar96._16_4_ | !bVar18 * uVar144) |
             !bVar15 * auVar122._16_4_;
        bVar15 = (bool)((byte)(uVar80 >> 5) & 1);
        auVar122._20_4_ =
             (uint)bVar15 * ((uint)bVar19 * auVar96._20_4_ | !bVar19 * uVar145) |
             !bVar15 * auVar122._20_4_;
        bVar15 = (bool)((byte)(uVar80 >> 6) & 1);
        auVar122._24_4_ =
             (uint)bVar15 * ((uint)bVar20 * auVar96._24_4_ | !bVar20 * uVar146) |
             !bVar15 * auVar122._24_4_;
        bVar15 = SUB81(uVar80 >> 7,0);
        auVar122._28_4_ =
             (uint)bVar15 * ((uint)bVar21 * auVar96._28_4_ | !bVar21 * uVar147) |
             !bVar15 * auVar122._28_4_;
        bVar73 = (~bVar75 | bVar71) & bVar73;
      }
    }
    if ((bVar73 & 0x7f) == 0) {
      auVar273 = ZEXT3264(CONCAT428(0x7fffffff,
                                    CONCAT424(0x7fffffff,
                                              CONCAT420(0x7fffffff,
                                                        CONCAT416(0x7fffffff,
                                                                  CONCAT412(0x7fffffff,
                                                                            CONCAT48(0x7fffffff,
                                                                                                                                                                          
                                                  0x7fffffff7fffffff)))))));
      auVar279 = ZEXT3264(_DAT_02020f20);
      auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar299 = ZEXT3264(auVar97);
      auVar298 = ZEXT3264(local_8e0);
    }
    else {
      fVar251 = *(float *)(ray + k * 4 + 0x100) - (float)local_7b0._0_4_;
      auVar229._4_4_ = fVar251;
      auVar229._0_4_ = fVar251;
      auVar229._8_4_ = fVar251;
      auVar229._12_4_ = fVar251;
      auVar229._16_4_ = fVar251;
      auVar229._20_4_ = fVar251;
      auVar229._24_4_ = fVar251;
      auVar229._28_4_ = fVar251;
      auVar118 = vminps_avx512vl(auVar229,auVar122);
      auVar67._4_4_ = fStack_3fc;
      auVar67._0_4_ = local_400;
      auVar67._8_4_ = fStack_3f8;
      auVar67._12_4_ = fStack_3f4;
      auVar67._16_4_ = fStack_3f0;
      auVar67._20_4_ = fStack_3ec;
      auVar67._24_4_ = fStack_3e8;
      auVar67._28_4_ = fStack_3e4;
      auVar96 = vmaxps_avx512vl(auVar67,auVar121);
      auVar110 = vmulps_avx512vl(auVar127,auVar110);
      auVar109 = vfmadd213ps_avx512vl(auVar109,auVar126,auVar110);
      auVar101 = vfmadd213ps_avx512vl(auVar101,auVar123,auVar109);
      auVar109 = vmulps_avx512vl(_local_740,auVar127);
      auVar298 = ZEXT3264(local_8e0);
      auVar109 = vfmadd231ps_avx512vl(auVar109,local_8e0,auVar126);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar95,auVar123);
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar109,auVar110);
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar24 = vcmpps_avx512vl(auVar110,auVar123,1);
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar101 = vxorps_avx512vl(auVar101,auVar119);
      auVar120 = vrcp14ps_avx512vl(auVar109);
      auVar124 = vxorps_avx512vl(auVar109,auVar119);
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar299 = ZEXT3264(auVar125);
      auVar126 = vfnmadd213ps_avx512vl(auVar120,auVar109,auVar125);
      auVar126 = vfmadd132ps_avx512vl(auVar126,auVar120,auVar120);
      auVar101 = vmulps_avx512vl(auVar126,auVar101);
      uVar25 = vcmpps_avx512vl(auVar109,auVar124,1);
      bVar75 = (byte)uVar24 | (byte)uVar25;
      auVar126 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar127 = vblendmps_avx512vl(auVar101,auVar126);
      auVar128._0_4_ =
           (uint)(bVar75 & 1) * auVar127._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar120._0_4_;
      bVar15 = (bool)(bVar75 >> 1 & 1);
      auVar128._4_4_ = (uint)bVar15 * auVar127._4_4_ | (uint)!bVar15 * auVar120._4_4_;
      bVar15 = (bool)(bVar75 >> 2 & 1);
      auVar128._8_4_ = (uint)bVar15 * auVar127._8_4_ | (uint)!bVar15 * auVar120._8_4_;
      bVar15 = (bool)(bVar75 >> 3 & 1);
      auVar128._12_4_ = (uint)bVar15 * auVar127._12_4_ | (uint)!bVar15 * auVar120._12_4_;
      bVar15 = (bool)(bVar75 >> 4 & 1);
      auVar128._16_4_ = (uint)bVar15 * auVar127._16_4_ | (uint)!bVar15 * auVar120._16_4_;
      bVar15 = (bool)(bVar75 >> 5 & 1);
      auVar128._20_4_ = (uint)bVar15 * auVar127._20_4_ | (uint)!bVar15 * auVar120._20_4_;
      bVar15 = (bool)(bVar75 >> 6 & 1);
      auVar128._24_4_ = (uint)bVar15 * auVar127._24_4_ | (uint)!bVar15 * auVar120._24_4_;
      auVar128._28_4_ =
           (uint)(bVar75 >> 7) * auVar127._28_4_ | (uint)!(bool)(bVar75 >> 7) * auVar120._28_4_;
      auVar96 = vmaxps_avx(auVar96,auVar128);
      uVar25 = vcmpps_avx512vl(auVar109,auVar124,6);
      bVar75 = (byte)uVar24 | (byte)uVar25;
      auVar296 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar129._0_4_ = (uint)(bVar75 & 1) * 0x7f800000 | (uint)!(bool)(bVar75 & 1) * auVar101._0_4_;
      bVar15 = (bool)(bVar75 >> 1 & 1);
      auVar129._4_4_ = (uint)bVar15 * 0x7f800000 | (uint)!bVar15 * auVar101._4_4_;
      bVar15 = (bool)(bVar75 >> 2 & 1);
      auVar129._8_4_ = (uint)bVar15 * 0x7f800000 | (uint)!bVar15 * auVar101._8_4_;
      bVar15 = (bool)(bVar75 >> 3 & 1);
      auVar129._12_4_ = (uint)bVar15 * 0x7f800000 | (uint)!bVar15 * auVar101._12_4_;
      bVar15 = (bool)(bVar75 >> 4 & 1);
      auVar129._16_4_ = (uint)bVar15 * 0x7f800000 | (uint)!bVar15 * auVar101._16_4_;
      bVar15 = (bool)(bVar75 >> 5 & 1);
      auVar129._20_4_ = (uint)bVar15 * 0x7f800000 | (uint)!bVar15 * auVar101._20_4_;
      bVar15 = (bool)(bVar75 >> 6 & 1);
      auVar129._24_4_ = (uint)bVar15 * 0x7f800000 | (uint)!bVar15 * auVar101._24_4_;
      auVar129._28_4_ =
           (uint)(bVar75 >> 7) * 0x7f800000 | (uint)!(bool)(bVar75 >> 7) * auVar101._28_4_;
      auVar101 = vminps_avx(auVar118,auVar129);
      auVar88 = vxorps_avx512vl(auVar124._0_16_,auVar124._0_16_);
      auVar109 = vsubps_avx512vl(ZEXT1632(auVar88),auVar103);
      auVar103 = vsubps_avx512vl(ZEXT1632(auVar88),auVar104);
      auVar118 = ZEXT1632(auVar88);
      auVar104 = vsubps_avx512vl(auVar118,auVar105);
      auVar104 = vmulps_avx512vl(auVar104,auVar108);
      auVar88 = vfnmsub231ps_fma(auVar104,auVar107,auVar103);
      auVar109 = vfnmadd231ps_avx512vl(ZEXT1632(auVar88),auVar106,auVar109);
      auVar103 = vmulps_avx512vl(_local_740,auVar108);
      auVar103 = vfnmsub231ps_avx512vl(auVar103,local_8e0,auVar107);
      auVar103 = vfnmadd231ps_avx512vl(auVar103,auVar95,auVar106);
      vandps_avx512vl(auVar103,auVar110);
      uVar24 = vcmpps_avx512vl(auVar103,auVar123,1);
      auVar109 = vxorps_avx512vl(auVar109,auVar119);
      auVar110 = vrcp14ps_avx512vl(auVar103);
      auVar104 = vxorps_avx512vl(auVar103,auVar119);
      auVar289 = ZEXT3264(auVar104);
      auVar105 = vfnmadd213ps_avx512vl(auVar110,auVar103,auVar125);
      auVar88 = vfmadd132ps_fma(auVar105,auVar110,auVar110);
      auVar293 = ZEXT1664(auVar88);
      fVar251 = auVar88._0_4_ * auVar109._0_4_;
      fVar257 = auVar88._4_4_ * auVar109._4_4_;
      auVar45._4_4_ = fVar257;
      auVar45._0_4_ = fVar251;
      fVar258 = auVar88._8_4_ * auVar109._8_4_;
      auVar45._8_4_ = fVar258;
      fVar259 = auVar88._12_4_ * auVar109._12_4_;
      auVar45._12_4_ = fVar259;
      fVar260 = auVar109._16_4_ * 0.0;
      auVar45._16_4_ = fVar260;
      fVar261 = auVar109._20_4_ * 0.0;
      auVar45._20_4_ = fVar261;
      fVar274 = auVar109._24_4_ * 0.0;
      auVar45._24_4_ = fVar274;
      auVar45._28_4_ = auVar109._28_4_;
      uVar25 = vcmpps_avx512vl(auVar103,auVar104,1);
      bVar75 = (byte)uVar24 | (byte)uVar25;
      auVar105 = vblendmps_avx512vl(auVar45,auVar126);
      auVar130._0_4_ =
           (uint)(bVar75 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar110._0_4_;
      bVar15 = (bool)(bVar75 >> 1 & 1);
      auVar130._4_4_ = (uint)bVar15 * auVar105._4_4_ | (uint)!bVar15 * auVar110._4_4_;
      bVar15 = (bool)(bVar75 >> 2 & 1);
      auVar130._8_4_ = (uint)bVar15 * auVar105._8_4_ | (uint)!bVar15 * auVar110._8_4_;
      bVar15 = (bool)(bVar75 >> 3 & 1);
      auVar130._12_4_ = (uint)bVar15 * auVar105._12_4_ | (uint)!bVar15 * auVar110._12_4_;
      bVar15 = (bool)(bVar75 >> 4 & 1);
      auVar130._16_4_ = (uint)bVar15 * auVar105._16_4_ | (uint)!bVar15 * auVar110._16_4_;
      bVar15 = (bool)(bVar75 >> 5 & 1);
      auVar130._20_4_ = (uint)bVar15 * auVar105._20_4_ | (uint)!bVar15 * auVar110._20_4_;
      bVar15 = (bool)(bVar75 >> 6 & 1);
      auVar130._24_4_ = (uint)bVar15 * auVar105._24_4_ | (uint)!bVar15 * auVar110._24_4_;
      auVar130._28_4_ =
           (uint)(bVar75 >> 7) * auVar105._28_4_ | (uint)!(bool)(bVar75 >> 7) * auVar110._28_4_;
      _local_720 = vmaxps_avx(auVar96,auVar130);
      uVar25 = vcmpps_avx512vl(auVar103,auVar104,6);
      bVar75 = (byte)uVar24 | (byte)uVar25;
      auVar131._0_4_ = (uint)(bVar75 & 1) * 0x7f800000 | (uint)!(bool)(bVar75 & 1) * (int)fVar251;
      bVar15 = (bool)(bVar75 >> 1 & 1);
      auVar131._4_4_ = (uint)bVar15 * 0x7f800000 | (uint)!bVar15 * (int)fVar257;
      bVar15 = (bool)(bVar75 >> 2 & 1);
      auVar131._8_4_ = (uint)bVar15 * 0x7f800000 | (uint)!bVar15 * (int)fVar258;
      bVar15 = (bool)(bVar75 >> 3 & 1);
      auVar131._12_4_ = (uint)bVar15 * 0x7f800000 | (uint)!bVar15 * (int)fVar259;
      bVar15 = (bool)(bVar75 >> 4 & 1);
      auVar131._16_4_ = (uint)bVar15 * 0x7f800000 | (uint)!bVar15 * (int)fVar260;
      bVar15 = (bool)(bVar75 >> 5 & 1);
      auVar131._20_4_ = (uint)bVar15 * 0x7f800000 | (uint)!bVar15 * (int)fVar261;
      bVar15 = (bool)(bVar75 >> 6 & 1);
      auVar131._24_4_ = (uint)bVar15 * 0x7f800000 | (uint)!bVar15 * (int)fVar274;
      auVar131._28_4_ =
           (uint)(bVar75 >> 7) * 0x7f800000 | (uint)!(bool)(bVar75 >> 7) * auVar109._28_4_;
      local_440 = vminps_avx(auVar101,auVar131);
      auVar271 = ZEXT3264(local_440);
      uVar24 = vcmpps_avx512vl(_local_720,local_440,2);
      bVar73 = bVar73 & 0x7f & (byte)uVar24;
      if (bVar73 == 0) {
        auVar273 = ZEXT3264(CONCAT428(0x7fffffff,
                                      CONCAT424(0x7fffffff,
                                                CONCAT420(0x7fffffff,
                                                          CONCAT416(0x7fffffff,
                                                                    CONCAT412(0x7fffffff,
                                                                              CONCAT48(0x7fffffff,
                                                                                                                                                                              
                                                  0x7fffffff7fffffff)))))));
        auVar279 = ZEXT3264(_DAT_02020f20);
      }
      else {
        auVar101 = vmaxps_avx512vl(auVar118,auVar99);
        auVar96 = vminps_avx512vl(local_660,auVar125);
        auVar52 = ZEXT412(0);
        auVar99 = ZEXT1232(auVar52) << 0x20;
        auVar96 = vmaxps_avx(auVar96,ZEXT1232(auVar52) << 0x20);
        auVar109 = vminps_avx512vl(local_680,auVar125);
        auVar292._8_4_ = 0x3e000000;
        auVar292._0_8_ = 0x3e0000003e000000;
        auVar292._12_4_ = 0x3e000000;
        auVar292._16_4_ = 0x3e000000;
        auVar292._20_4_ = 0x3e000000;
        auVar292._24_4_ = 0x3e000000;
        auVar292._28_4_ = 0x3e000000;
        auVar46._4_4_ = (auVar96._4_4_ + 1.0) * 0.125;
        auVar46._0_4_ = (auVar96._0_4_ + 0.0) * 0.125;
        auVar46._8_4_ = (auVar96._8_4_ + 2.0) * 0.125;
        auVar46._12_4_ = (auVar96._12_4_ + 3.0) * 0.125;
        auVar46._16_4_ = (auVar96._16_4_ + 4.0) * 0.125;
        auVar46._20_4_ = (auVar96._20_4_ + 5.0) * 0.125;
        auVar46._24_4_ = (auVar96._24_4_ + 6.0) * 0.125;
        auVar46._28_4_ = auVar96._28_4_ + 7.0;
        auVar88 = vfmadd213ps_fma(auVar46,local_8a0,auVar241);
        local_660 = ZEXT1632(auVar88);
        auVar96 = vmaxps_avx(auVar109,ZEXT1232(auVar52) << 0x20);
        auVar47._4_4_ = (auVar96._4_4_ + 1.0) * 0.125;
        auVar47._0_4_ = (auVar96._0_4_ + 0.0) * 0.125;
        auVar47._8_4_ = (auVar96._8_4_ + 2.0) * 0.125;
        auVar47._12_4_ = (auVar96._12_4_ + 3.0) * 0.125;
        auVar47._16_4_ = (auVar96._16_4_ + 4.0) * 0.125;
        auVar47._20_4_ = (auVar96._20_4_ + 5.0) * 0.125;
        auVar47._24_4_ = (auVar96._24_4_ + 6.0) * 0.125;
        auVar47._28_4_ = auVar96._28_4_ + 7.0;
        auVar88 = vfmadd213ps_fma(auVar47,local_8a0,auVar241);
        local_680 = ZEXT1632(auVar88);
        auVar230._0_4_ = auVar101._0_4_ * auVar101._0_4_;
        auVar230._4_4_ = auVar101._4_4_ * auVar101._4_4_;
        auVar230._8_4_ = auVar101._8_4_ * auVar101._8_4_;
        auVar230._12_4_ = auVar101._12_4_ * auVar101._12_4_;
        auVar230._16_4_ = auVar101._16_4_ * auVar101._16_4_;
        auVar230._20_4_ = auVar101._20_4_ * auVar101._20_4_;
        auVar230._24_4_ = auVar101._24_4_ * auVar101._24_4_;
        auVar230._28_4_ = 0;
        auVar96 = vsubps_avx(auVar112,auVar230);
        auVar101 = vmulps_avx512vl(auVar111,auVar96);
        auVar101 = vsubps_avx512vl(auVar117,auVar101);
        uVar24 = vcmpps_avx512vl(auVar101,ZEXT1232(auVar52) << 0x20,5);
        bVar75 = (byte)uVar24;
        if (bVar75 == 0) {
          auVar98 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar273 = ZEXT864(0) << 0x20;
          auVar101 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar109 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar272 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar132._8_4_ = 0x7f800000;
          auVar132._0_8_ = 0x7f8000007f800000;
          auVar132._12_4_ = 0x7f800000;
          auVar132._16_4_ = 0x7f800000;
          auVar132._20_4_ = 0x7f800000;
          auVar132._24_4_ = 0x7f800000;
          auVar132._28_4_ = 0x7f800000;
          auVar133._8_4_ = 0xff800000;
          auVar133._0_8_ = 0xff800000ff800000;
          auVar133._12_4_ = 0xff800000;
          auVar133._16_4_ = 0xff800000;
          auVar133._20_4_ = 0xff800000;
          auVar133._24_4_ = 0xff800000;
          auVar133._28_4_ = 0xff800000;
          auVar49 = local_8a0;
        }
        else {
          auVar89 = vxorps_avx512vl(auVar111._0_16_,auVar111._0_16_);
          uVar80 = vcmpps_avx512vl(auVar101,auVar118,5);
          auVar99 = vsqrtps_avx(auVar101);
          auVar243._0_4_ = auVar97._0_4_ + auVar97._0_4_;
          auVar243._4_4_ = auVar97._4_4_ + auVar97._4_4_;
          auVar243._8_4_ = auVar97._8_4_ + auVar97._8_4_;
          auVar243._12_4_ = auVar97._12_4_ + auVar97._12_4_;
          auVar243._16_4_ = auVar97._16_4_ + auVar97._16_4_;
          auVar243._20_4_ = auVar97._20_4_ + auVar97._20_4_;
          auVar243._24_4_ = auVar97._24_4_ + auVar97._24_4_;
          auVar243._28_4_ = auVar97._28_4_ + auVar97._28_4_;
          auVar101 = vrcp14ps_avx512vl(auVar243);
          auVar109 = vfnmadd213ps_avx512vl(auVar243,auVar101,auVar125);
          auVar88 = vfmadd132ps_fma(auVar109,auVar101,auVar101);
          auVar37._8_4_ = 0x80000000;
          auVar37._0_8_ = 0x8000000080000000;
          auVar37._12_4_ = 0x80000000;
          auVar37._16_4_ = 0x80000000;
          auVar37._20_4_ = 0x80000000;
          auVar37._24_4_ = 0x80000000;
          auVar37._28_4_ = 0x80000000;
          auVar101 = vxorps_avx512vl(auVar116,auVar37);
          auVar101 = vsubps_avx(auVar101,auVar99);
          fVar251 = auVar101._0_4_ * auVar88._0_4_;
          fVar257 = auVar101._4_4_ * auVar88._4_4_;
          auVar48._4_4_ = fVar257;
          auVar48._0_4_ = fVar251;
          fVar258 = auVar101._8_4_ * auVar88._8_4_;
          auVar48._8_4_ = fVar258;
          fVar259 = auVar101._12_4_ * auVar88._12_4_;
          auVar48._12_4_ = fVar259;
          fVar260 = auVar101._16_4_ * 0.0;
          auVar48._16_4_ = fVar260;
          fVar261 = auVar101._20_4_ * 0.0;
          auVar48._20_4_ = fVar261;
          fVar274 = auVar101._24_4_ * 0.0;
          auVar48._24_4_ = fVar274;
          auVar48._28_4_ = 0x3e000000;
          auVar99 = vsubps_avx512vl(auVar99,auVar116);
          auVar49._4_4_ = auVar99._4_4_ * auVar88._4_4_;
          auVar49._0_4_ = auVar99._0_4_ * auVar88._0_4_;
          auVar49._8_4_ = auVar99._8_4_ * auVar88._8_4_;
          auVar49._12_4_ = auVar99._12_4_ * auVar88._12_4_;
          auVar49._16_4_ = auVar99._16_4_ * 0.0;
          auVar49._20_4_ = auVar99._20_4_ * 0.0;
          auVar49._24_4_ = auVar99._24_4_ * 0.0;
          auVar49._28_4_ = fVar23;
          auVar99 = vfmadd213ps_avx512vl(auVar113,auVar48,auVar114);
          auVar50._4_4_ = auVar100._4_4_ * auVar99._4_4_;
          auVar50._0_4_ = auVar100._0_4_ * auVar99._0_4_;
          auVar50._8_4_ = auVar100._8_4_ * auVar99._8_4_;
          auVar50._12_4_ = auVar100._12_4_ * auVar99._12_4_;
          auVar50._16_4_ = auVar100._16_4_ * auVar99._16_4_;
          auVar50._20_4_ = auVar100._20_4_ * auVar99._20_4_;
          auVar50._24_4_ = auVar100._24_4_ * auVar99._24_4_;
          auVar50._28_4_ = auVar101._28_4_;
          auVar99 = vmulps_avx512vl(auVar95,auVar48);
          auVar109 = vmulps_avx512vl(local_8e0,auVar48);
          auVar278._0_4_ = fVar251 * (float)local_740._0_4_;
          auVar278._4_4_ = fVar257 * (float)local_740._4_4_;
          auVar278._8_4_ = fVar258 * fStack_738;
          auVar278._12_4_ = fVar259 * fStack_734;
          auVar278._16_4_ = fVar260 * fStack_730;
          auVar278._20_4_ = fVar261 * fStack_72c;
          auVar278._24_4_ = fVar274 * fStack_728;
          auVar278._28_4_ = 0;
          auVar101 = vfmadd213ps_avx512vl(auVar98,auVar50,local_940);
          auVar101 = vsubps_avx512vl(auVar99,auVar101);
          auVar99 = vfmadd213ps_avx512vl(auVar102,auVar50,auVar213);
          auVar109 = vsubps_avx512vl(auVar109,auVar99);
          auVar99 = vfmadd213ps_avx512vl(auVar50,local_6e0,local_8c0);
          auVar99 = vsubps_avx(auVar278,auVar99);
          auVar272 = auVar99._0_28_;
          auVar99 = vfmadd213ps_avx512vl(auVar113,auVar49,auVar114);
          auVar100 = vmulps_avx512vl(auVar100,auVar99);
          auVar99 = vmulps_avx512vl(auVar95,auVar49);
          auVar110 = vmulps_avx512vl(local_8e0,auVar49);
          auVar111 = vmulps_avx512vl(_local_740,auVar49);
          auVar88 = vfmadd213ps_fma(auVar98,auVar100,local_940);
          auVar99 = vsubps_avx(auVar99,ZEXT1632(auVar88));
          auVar88 = vfmadd213ps_fma(auVar102,auVar100,auVar213);
          auVar98 = vsubps_avx512vl(auVar110,ZEXT1632(auVar88));
          auVar102 = vfmadd213ps_avx512vl(local_6e0,auVar100,local_8c0);
          auVar102 = vsubps_avx512vl(auVar111,auVar102);
          auVar273 = ZEXT3264(auVar102);
          auVar162._8_4_ = 0x7f800000;
          auVar162._0_8_ = 0x7f8000007f800000;
          auVar162._12_4_ = 0x7f800000;
          auVar162._16_4_ = 0x7f800000;
          auVar162._20_4_ = 0x7f800000;
          auVar162._24_4_ = 0x7f800000;
          auVar162._28_4_ = 0x7f800000;
          auVar102 = vblendmps_avx512vl(auVar162,auVar48);
          bVar15 = (bool)((byte)uVar80 & 1);
          auVar132._0_4_ = (uint)bVar15 * auVar102._0_4_ | (uint)!bVar15 * auVar277._0_4_;
          bVar15 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar132._4_4_ = (uint)bVar15 * auVar102._4_4_ | (uint)!bVar15 * auVar277._4_4_;
          bVar15 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar132._8_4_ = (uint)bVar15 * auVar102._8_4_ | (uint)!bVar15 * auVar277._8_4_;
          bVar15 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar132._12_4_ = (uint)bVar15 * auVar102._12_4_ | (uint)!bVar15 * auVar277._12_4_;
          iVar1 = (uint)((byte)(uVar80 >> 4) & 1) * auVar102._16_4_;
          auVar132._16_4_ = iVar1;
          iVar2 = (uint)((byte)(uVar80 >> 5) & 1) * auVar102._20_4_;
          auVar132._20_4_ = iVar2;
          iVar3 = (uint)((byte)(uVar80 >> 6) & 1) * auVar102._24_4_;
          auVar132._24_4_ = iVar3;
          iVar4 = (uint)(byte)(uVar80 >> 7) * auVar102._28_4_;
          auVar132._28_4_ = iVar4;
          auVar163._8_4_ = 0xff800000;
          auVar163._0_8_ = 0xff800000ff800000;
          auVar163._12_4_ = 0xff800000;
          auVar163._16_4_ = 0xff800000;
          auVar163._20_4_ = 0xff800000;
          auVar163._24_4_ = 0xff800000;
          auVar163._28_4_ = 0xff800000;
          auVar102 = vblendmps_avx512vl(auVar163,auVar49);
          bVar15 = (bool)((byte)uVar80 & 1);
          auVar133._0_4_ = (uint)bVar15 * auVar102._0_4_ | (uint)!bVar15 * -0x800000;
          bVar15 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar133._4_4_ = (uint)bVar15 * auVar102._4_4_ | (uint)!bVar15 * -0x800000;
          bVar15 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar133._8_4_ = (uint)bVar15 * auVar102._8_4_ | (uint)!bVar15 * -0x800000;
          bVar15 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar133._12_4_ = (uint)bVar15 * auVar102._12_4_ | (uint)!bVar15 * -0x800000;
          bVar15 = (bool)((byte)(uVar80 >> 4) & 1);
          auVar133._16_4_ = (uint)bVar15 * auVar102._16_4_ | (uint)!bVar15 * -0x800000;
          bVar15 = (bool)((byte)(uVar80 >> 5) & 1);
          auVar133._20_4_ = (uint)bVar15 * auVar102._20_4_ | (uint)!bVar15 * -0x800000;
          bVar15 = (bool)((byte)(uVar80 >> 6) & 1);
          auVar133._24_4_ = (uint)bVar15 * auVar102._24_4_ | (uint)!bVar15 * -0x800000;
          bVar15 = SUB81(uVar80 >> 7,0);
          auVar133._28_4_ = (uint)bVar15 * auVar102._28_4_ | (uint)!bVar15 * -0x800000;
          auVar266._8_4_ = 0x7fffffff;
          auVar266._0_8_ = 0x7fffffff7fffffff;
          auVar266._12_4_ = 0x7fffffff;
          auVar266._16_4_ = 0x7fffffff;
          auVar266._20_4_ = 0x7fffffff;
          auVar266._24_4_ = 0x7fffffff;
          auVar266._28_4_ = 0x7fffffff;
          vandps_avx512vl(auVar115,auVar266);
          auVar102 = vmaxps_avx(local_5a0,auVar133);
          auVar38._8_4_ = 0x36000000;
          auVar38._0_8_ = 0x3600000036000000;
          auVar38._12_4_ = 0x36000000;
          auVar38._16_4_ = 0x36000000;
          auVar38._20_4_ = 0x36000000;
          auVar38._24_4_ = 0x36000000;
          auVar38._28_4_ = 0x36000000;
          auVar102 = vmulps_avx512vl(auVar102,auVar38);
          auVar97 = vandps_avx(auVar97,auVar266);
          uVar77 = vcmpps_avx512vl(auVar97,auVar102,1);
          uVar80 = uVar80 & uVar77;
          bVar71 = (byte)uVar80;
          auVar292 = local_5a0;
          if (bVar71 != 0) {
            uVar77 = vcmpps_avx512vl(auVar96,ZEXT1632(auVar89),2);
            auVar267._8_4_ = 0xff800000;
            auVar267._0_8_ = 0xff800000ff800000;
            auVar267._12_4_ = 0xff800000;
            auVar267._16_4_ = 0xff800000;
            auVar267._20_4_ = 0xff800000;
            auVar267._24_4_ = 0xff800000;
            auVar267._28_4_ = 0xff800000;
            auVar288._8_4_ = 0x7f800000;
            auVar288._0_8_ = 0x7f8000007f800000;
            auVar288._12_4_ = 0x7f800000;
            auVar288._16_4_ = 0x7f800000;
            auVar288._20_4_ = 0x7f800000;
            auVar288._24_4_ = 0x7f800000;
            auVar288._28_4_ = 0x7f800000;
            auVar97 = vblendmps_avx512vl(auVar288,auVar267);
            bVar74 = (byte)uVar77;
            uVar81 = (uint)(bVar74 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar102._0_4_
            ;
            bVar15 = (bool)((byte)(uVar77 >> 1) & 1);
            uVar141 = (uint)bVar15 * auVar97._4_4_ | (uint)!bVar15 * auVar102._4_4_;
            bVar15 = (bool)((byte)(uVar77 >> 2) & 1);
            uVar142 = (uint)bVar15 * auVar97._8_4_ | (uint)!bVar15 * auVar102._8_4_;
            bVar15 = (bool)((byte)(uVar77 >> 3) & 1);
            uVar143 = (uint)bVar15 * auVar97._12_4_ | (uint)!bVar15 * auVar102._12_4_;
            bVar15 = (bool)((byte)(uVar77 >> 4) & 1);
            uVar144 = (uint)bVar15 * auVar97._16_4_ | (uint)!bVar15 * auVar102._16_4_;
            bVar15 = (bool)((byte)(uVar77 >> 5) & 1);
            uVar145 = (uint)bVar15 * auVar97._20_4_ | (uint)!bVar15 * auVar102._20_4_;
            bVar15 = (bool)((byte)(uVar77 >> 6) & 1);
            uVar146 = (uint)bVar15 * auVar97._24_4_ | (uint)!bVar15 * auVar102._24_4_;
            bVar15 = SUB81(uVar77 >> 7,0);
            uVar147 = (uint)bVar15 * auVar97._28_4_ | (uint)!bVar15 * auVar102._28_4_;
            auVar132._0_4_ = (bVar71 & 1) * uVar81 | !(bool)(bVar71 & 1) * auVar132._0_4_;
            bVar15 = (bool)((byte)(uVar80 >> 1) & 1);
            auVar132._4_4_ = bVar15 * uVar141 | !bVar15 * auVar132._4_4_;
            bVar15 = (bool)((byte)(uVar80 >> 2) & 1);
            auVar132._8_4_ = bVar15 * uVar142 | !bVar15 * auVar132._8_4_;
            bVar15 = (bool)((byte)(uVar80 >> 3) & 1);
            auVar132._12_4_ = bVar15 * uVar143 | !bVar15 * auVar132._12_4_;
            bVar15 = (bool)((byte)(uVar80 >> 4) & 1);
            auVar132._16_4_ = bVar15 * uVar144 | (uint)!bVar15 * iVar1;
            bVar15 = (bool)((byte)(uVar80 >> 5) & 1);
            auVar132._20_4_ = bVar15 * uVar145 | (uint)!bVar15 * iVar2;
            bVar15 = (bool)((byte)(uVar80 >> 6) & 1);
            auVar132._24_4_ = bVar15 * uVar146 | (uint)!bVar15 * iVar3;
            bVar15 = SUB81(uVar80 >> 7,0);
            auVar132._28_4_ = bVar15 * uVar147 | (uint)!bVar15 * iVar4;
            auVar97 = vblendmps_avx512vl(auVar267,auVar288);
            bVar15 = (bool)((byte)(uVar77 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar77 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
            bVar18 = (bool)((byte)(uVar77 >> 4) & 1);
            bVar19 = (bool)((byte)(uVar77 >> 5) & 1);
            bVar20 = (bool)((byte)(uVar77 >> 6) & 1);
            bVar21 = SUB81(uVar77 >> 7,0);
            auVar133._0_4_ =
                 (uint)(bVar71 & 1) *
                 ((uint)(bVar74 & 1) * auVar97._0_4_ | !(bool)(bVar74 & 1) * uVar81) |
                 !(bool)(bVar71 & 1) * auVar133._0_4_;
            bVar79 = (bool)((byte)(uVar80 >> 1) & 1);
            auVar133._4_4_ =
                 (uint)bVar79 * ((uint)bVar15 * auVar97._4_4_ | !bVar15 * uVar141) |
                 !bVar79 * auVar133._4_4_;
            bVar15 = (bool)((byte)(uVar80 >> 2) & 1);
            auVar133._8_4_ =
                 (uint)bVar15 * ((uint)bVar16 * auVar97._8_4_ | !bVar16 * uVar142) |
                 !bVar15 * auVar133._8_4_;
            bVar15 = (bool)((byte)(uVar80 >> 3) & 1);
            auVar133._12_4_ =
                 (uint)bVar15 * ((uint)bVar17 * auVar97._12_4_ | !bVar17 * uVar143) |
                 !bVar15 * auVar133._12_4_;
            bVar15 = (bool)((byte)(uVar80 >> 4) & 1);
            auVar133._16_4_ =
                 (uint)bVar15 * ((uint)bVar18 * auVar97._16_4_ | !bVar18 * uVar144) |
                 !bVar15 * auVar133._16_4_;
            bVar15 = (bool)((byte)(uVar80 >> 5) & 1);
            auVar133._20_4_ =
                 (uint)bVar15 * ((uint)bVar19 * auVar97._20_4_ | !bVar19 * uVar145) |
                 !bVar15 * auVar133._20_4_;
            bVar15 = (bool)((byte)(uVar80 >> 6) & 1);
            auVar133._24_4_ =
                 (uint)bVar15 * ((uint)bVar20 * auVar97._24_4_ | !bVar20 * uVar146) |
                 !bVar15 * auVar133._24_4_;
            bVar15 = SUB81(uVar80 >> 7,0);
            auVar133._28_4_ =
                 (uint)bVar15 * ((uint)bVar21 * auVar97._28_4_ | !bVar21 * uVar147) |
                 !bVar15 * auVar133._28_4_;
            bVar75 = (~bVar71 | bVar74) & bVar75;
          }
        }
        auVar286._8_4_ = 0x7fffffff;
        auVar286._0_8_ = 0x7fffffff7fffffff;
        auVar286._12_4_ = 0x7fffffff;
        auVar296 = ZEXT3264(auVar49);
        auVar293 = ZEXT3264(auVar292);
        auVar289 = ZEXT1664(auVar286);
        auVar279._0_4_ = (float)local_740._0_4_ * auVar273._0_4_;
        auVar279._4_4_ = (float)local_740._4_4_ * auVar273._4_4_;
        auVar279._8_4_ = fStack_738 * auVar273._8_4_;
        auVar279._12_4_ = fStack_734 * auVar273._12_4_;
        auVar279._16_4_ = fStack_730 * auVar273._16_4_;
        auVar279._20_4_ = fStack_72c * auVar273._20_4_;
        auVar279._28_36_ = auVar273._28_36_;
        auVar279._24_4_ = fStack_728 * auVar273._24_4_;
        auVar97 = vfmadd231ps_avx512vl(auVar279._0_32_,local_8e0,auVar98);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar95,auVar99);
        _local_1c0 = _local_720;
        local_1a0 = vminps_avx(local_440,auVar132);
        auVar256._8_4_ = 0x7fffffff;
        auVar256._0_8_ = 0x7fffffff7fffffff;
        auVar256._12_4_ = 0x7fffffff;
        auVar256._16_4_ = 0x7fffffff;
        auVar256._20_4_ = 0x7fffffff;
        auVar256._24_4_ = 0x7fffffff;
        auVar256._28_4_ = 0x7fffffff;
        auVar97 = vandps_avx(auVar97,auVar256);
        _local_6c0 = vmaxps_avx(_local_720,auVar133);
        auVar250 = ZEXT3264(_local_6c0);
        _local_460 = _local_6c0;
        auVar164._8_4_ = 0x3e99999a;
        auVar164._0_8_ = 0x3e99999a3e99999a;
        auVar164._12_4_ = 0x3e99999a;
        auVar164._16_4_ = 0x3e99999a;
        auVar164._20_4_ = 0x3e99999a;
        auVar164._24_4_ = 0x3e99999a;
        auVar164._28_4_ = 0x3e99999a;
        uVar24 = vcmpps_avx512vl(auVar97,auVar164,1);
        uVar25 = vcmpps_avx512vl(_local_720,local_1a0,2);
        bVar71 = (byte)uVar25 & bVar73;
        uVar26 = vcmpps_avx512vl(_local_6c0,local_440,2);
        if ((bVar73 & ((byte)uVar26 | (byte)uVar25)) == 0) {
          auVar273 = ZEXT3264(auVar256);
          auVar279 = ZEXT3264(_DAT_02020f20);
          auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar299 = ZEXT3264(auVar97);
        }
        else {
          auVar51._4_4_ = auVar272._4_4_ * (float)local_740._4_4_;
          auVar51._0_4_ = auVar272._0_4_ * (float)local_740._0_4_;
          auVar51._8_4_ = auVar272._8_4_ * fStack_738;
          auVar51._12_4_ = auVar272._12_4_ * fStack_734;
          auVar51._16_4_ = auVar272._16_4_ * fStack_730;
          auVar51._20_4_ = auVar272._20_4_ * fStack_72c;
          auVar51._24_4_ = auVar272._24_4_ * fStack_728;
          auVar51._28_4_ = 0x3e99999a;
          auVar97 = vfmadd213ps_avx512vl(auVar109,local_8e0,auVar51);
          auVar97 = vfmadd213ps_avx512vl(auVar101,auVar95,auVar97);
          auVar97 = vandps_avx(auVar97,auVar256);
          uVar25 = vcmpps_avx512vl(auVar97,auVar164,1);
          bVar74 = (byte)uVar25 | ~bVar75;
          auVar165._8_4_ = 2;
          auVar165._0_8_ = 0x200000002;
          auVar165._12_4_ = 2;
          auVar165._16_4_ = 2;
          auVar165._20_4_ = 2;
          auVar165._24_4_ = 2;
          auVar165._28_4_ = 2;
          auVar39._8_4_ = 3;
          auVar39._0_8_ = 0x300000003;
          auVar39._12_4_ = 3;
          auVar39._16_4_ = 3;
          auVar39._20_4_ = 3;
          auVar39._24_4_ = 3;
          auVar39._28_4_ = 3;
          auVar97 = vpblendmd_avx512vl(auVar165,auVar39);
          local_420._0_4_ = (uint)(bVar74 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar74 & 1) * 2;
          bVar15 = (bool)(bVar74 >> 1 & 1);
          local_420._4_4_ = (uint)bVar15 * auVar97._4_4_ | (uint)!bVar15 * 2;
          bVar15 = (bool)(bVar74 >> 2 & 1);
          local_420._8_4_ = (uint)bVar15 * auVar97._8_4_ | (uint)!bVar15 * 2;
          bVar15 = (bool)(bVar74 >> 3 & 1);
          local_420._12_4_ = (uint)bVar15 * auVar97._12_4_ | (uint)!bVar15 * 2;
          bVar15 = (bool)(bVar74 >> 4 & 1);
          local_420._16_4_ = (uint)bVar15 * auVar97._16_4_ | (uint)!bVar15 * 2;
          bVar15 = (bool)(bVar74 >> 5 & 1);
          local_420._20_4_ = (uint)bVar15 * auVar97._20_4_ | (uint)!bVar15 * 2;
          bVar15 = (bool)(bVar74 >> 6 & 1);
          local_420._24_4_ = (uint)bVar15 * auVar97._24_4_ | (uint)!bVar15 * 2;
          local_420._28_4_ = (uint)(bVar74 >> 7) * auVar97._28_4_ | (uint)!(bool)(bVar74 >> 7) * 2;
          local_5c0 = vpbroadcastd_avx512vl();
          uVar25 = vpcmpd_avx512vl(local_5c0,local_420,5);
          bVar74 = (byte)uVar25 & bVar71;
          if (bVar74 != 0) {
            auVar277 = vminps_avx(local_800._0_16_,local_840._0_16_);
            auVar88 = vmaxps_avx(local_800._0_16_,local_840._0_16_);
            auVar89 = vminps_avx(local_820._0_16_,local_860._0_16_);
            auVar22 = vminps_avx(auVar277,auVar89);
            auVar277 = vmaxps_avx(local_820._0_16_,local_860._0_16_);
            auVar89 = vmaxps_avx(auVar88,auVar277);
            auVar88 = vandps_avx(auVar286,auVar22);
            auVar277 = vandps_avx(auVar286,auVar89);
            auVar88 = vmaxps_avx(auVar88,auVar277);
            auVar277 = vmovshdup_avx(auVar88);
            auVar277 = vmaxss_avx(auVar277,auVar88);
            auVar88 = vshufpd_avx(auVar88,auVar88,1);
            auVar88 = vmaxss_avx(auVar88,auVar277);
            fVar251 = auVar88._0_4_ * 1.9073486e-06;
            local_7c0 = vshufps_avx(auVar89,auVar89,0xff);
            local_6a0 = (float)local_720._0_4_ + (float)local_700._0_4_;
            fStack_69c = (float)local_720._4_4_ + (float)local_700._4_4_;
            fStack_698 = fStack_718 + fStack_6f8;
            fStack_694 = fStack_714 + fStack_6f4;
            fStack_690 = fStack_710 + fStack_6f0;
            fStack_68c = fStack_70c + fStack_6ec;
            fStack_688 = fStack_708 + fStack_6e8;
            fStack_684 = fStack_704 + fStack_6e4;
            do {
              auVar166._8_4_ = 0x7f800000;
              auVar166._0_8_ = 0x7f8000007f800000;
              auVar166._12_4_ = 0x7f800000;
              auVar166._16_4_ = 0x7f800000;
              auVar166._20_4_ = 0x7f800000;
              auVar166._24_4_ = 0x7f800000;
              auVar166._28_4_ = 0x7f800000;
              auVar97 = vblendmps_avx512vl(auVar166,_local_720);
              auVar134._0_4_ =
                   (uint)(bVar74 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar74 & 1) * 0x7f800000;
              bVar15 = (bool)(bVar74 >> 1 & 1);
              auVar134._4_4_ = (uint)bVar15 * auVar97._4_4_ | (uint)!bVar15 * 0x7f800000;
              bVar15 = (bool)(bVar74 >> 2 & 1);
              auVar134._8_4_ = (uint)bVar15 * auVar97._8_4_ | (uint)!bVar15 * 0x7f800000;
              bVar15 = (bool)(bVar74 >> 3 & 1);
              auVar134._12_4_ = (uint)bVar15 * auVar97._12_4_ | (uint)!bVar15 * 0x7f800000;
              bVar15 = (bool)(bVar74 >> 4 & 1);
              auVar134._16_4_ = (uint)bVar15 * auVar97._16_4_ | (uint)!bVar15 * 0x7f800000;
              bVar15 = (bool)(bVar74 >> 5 & 1);
              auVar134._20_4_ = (uint)bVar15 * auVar97._20_4_ | (uint)!bVar15 * 0x7f800000;
              auVar134._24_4_ =
                   (uint)(bVar74 >> 6) * auVar97._24_4_ | (uint)!(bool)(bVar74 >> 6) * 0x7f800000;
              auVar134._28_4_ = 0x7f800000;
              auVar97 = vshufps_avx(auVar134,auVar134,0xb1);
              auVar97 = vminps_avx(auVar134,auVar97);
              auVar96 = vshufpd_avx(auVar97,auVar97,5);
              auVar97 = vminps_avx(auVar97,auVar96);
              auVar96 = vpermpd_avx2(auVar97,0x4e);
              auVar97 = vminps_avx(auVar97,auVar96);
              uVar25 = vcmpps_avx512vl(auVar134,auVar97,0);
              bVar68 = (byte)uVar25 & bVar74;
              bVar69 = bVar74;
              if (bVar68 != 0) {
                bVar69 = bVar68;
              }
              iVar2 = 0;
              for (uVar81 = (uint)bVar69; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x80000000) {
                iVar2 = iVar2 + 1;
              }
              uVar81 = *(uint *)(local_660 + (uint)(iVar2 << 2));
              uVar141 = *(uint *)(local_1c0 + (uint)(iVar2 << 2));
              fVar257 = auVar85._0_4_;
              if ((float)local_880._0_4_ < 0.0) {
                fVar257 = sqrtf((float)local_880._0_4_);
              }
              auVar273 = ZEXT464(uVar81);
              auVar271 = ZEXT464(uVar141);
              lVar78 = 4;
              do {
                fVar258 = auVar271._0_4_;
                auVar154._4_4_ = fVar258;
                auVar154._0_4_ = fVar258;
                auVar154._8_4_ = fVar258;
                auVar154._12_4_ = fVar258;
                auVar88 = vfmadd132ps_fma(auVar154,ZEXT816(0) << 0x40,local_870);
                fVar276 = auVar273._0_4_;
                fVar245 = 1.0 - fVar276;
                fVar261 = fVar245 * fVar245 * fVar245;
                fVar259 = fVar276 * fVar276;
                fVar263 = fVar276 * fVar259;
                auVar277 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar261),
                                           ZEXT416((uint)fVar263));
                fVar260 = fVar276 * fVar245;
                auVar87 = ZEXT416((uint)fVar245);
                auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar276 * fVar260 * 6.0)),
                                          ZEXT416((uint)(fVar260 * fVar245)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar263),
                                          ZEXT416((uint)fVar261));
                auVar90 = vfmadd231ss_fma(ZEXT416((uint)(fVar260 * fVar245 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar276 * fVar260)));
                fVar261 = fVar261 * 0.16666667;
                fVar274 = (auVar277._0_4_ + auVar22._0_4_) * 0.16666667;
                fVar244 = (auVar89._0_4_ + auVar90._0_4_) * 0.16666667;
                fVar263 = fVar263 * 0.16666667;
                auVar203._0_4_ = fVar263 * (float)local_860._0_4_;
                auVar203._4_4_ = fVar263 * (float)local_860._4_4_;
                auVar203._8_4_ = fVar263 * fStack_858;
                auVar203._12_4_ = fVar263 * fStack_854;
                auVar237._4_4_ = fVar244;
                auVar237._0_4_ = fVar244;
                auVar237._8_4_ = fVar244;
                auVar237._12_4_ = fVar244;
                auVar277 = vfmadd132ps_fma(auVar237,auVar203,local_820._0_16_);
                auVar204._4_4_ = fVar274;
                auVar204._0_4_ = fVar274;
                auVar204._8_4_ = fVar274;
                auVar204._12_4_ = fVar274;
                auVar277 = vfmadd132ps_fma(auVar204,auVar277,local_840._0_16_);
                auVar181._4_4_ = fVar261;
                auVar181._0_4_ = fVar261;
                auVar181._8_4_ = fVar261;
                auVar181._12_4_ = fVar261;
                auVar277 = vfmadd132ps_fma(auVar181,auVar277,local_800._0_16_);
                local_6e0._0_16_ = auVar277;
                auVar88 = vsubps_avx(auVar88,auVar277);
                local_8a0._0_16_ = auVar88;
                auVar88 = vdpps_avx(auVar88,auVar88,0x7f);
                auVar277 = auVar273._0_16_;
                local_8c0._0_16_ = auVar88;
                if (auVar88._0_4_ < 0.0) {
                  local_940._0_4_ = fVar259;
                  auVar289._0_4_ = sqrtf(auVar88._0_4_);
                  auVar289._4_60_ = extraout_var;
                  auVar88 = auVar289._0_16_;
                }
                else {
                  auVar88 = vsqrtss_avx(auVar88,auVar88);
                  local_940._0_4_ = fVar259;
                }
                auVar22 = vfnmsub213ss_fma(auVar277,auVar277,ZEXT416((uint)(fVar260 * 4.0)));
                auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar260 * 4.0)),auVar87,auVar87);
                fVar259 = fVar245 * -fVar245 * 0.5;
                fVar260 = auVar22._0_4_ * 0.5;
                fVar261 = auVar89._0_4_ * 0.5;
                local_940._0_4_ = (float)local_940._0_4_ * 0.5;
                auVar224._0_4_ = (float)local_940._0_4_ * (float)local_860._0_4_;
                auVar224._4_4_ = (float)local_940._0_4_ * (float)local_860._4_4_;
                auVar224._8_4_ = (float)local_940._0_4_ * fStack_858;
                auVar224._12_4_ = (float)local_940._0_4_ * fStack_854;
                auVar182._4_4_ = fVar261;
                auVar182._0_4_ = fVar261;
                auVar182._8_4_ = fVar261;
                auVar182._12_4_ = fVar261;
                auVar89 = vfmadd132ps_fma(auVar182,auVar224,local_820._0_16_);
                auVar205._4_4_ = fVar260;
                auVar205._0_4_ = fVar260;
                auVar205._8_4_ = fVar260;
                auVar205._12_4_ = fVar260;
                auVar89 = vfmadd132ps_fma(auVar205,auVar89,local_840._0_16_);
                auVar294._4_4_ = fVar259;
                auVar294._0_4_ = fVar259;
                auVar294._8_4_ = fVar259;
                auVar294._12_4_ = fVar259;
                local_940._0_16_ = vfmadd132ps_fma(auVar294,auVar89,local_800._0_16_);
                local_770 = vdpps_avx(local_940._0_16_,local_940._0_16_,0x7f);
                auVar53._12_4_ = 0;
                auVar53._0_12_ = ZEXT812(0);
                fVar259 = local_770._0_4_;
                auVar89 = vrsqrt14ss_avx512f(auVar53 << 0x20,ZEXT416((uint)fVar259));
                fVar260 = auVar89._0_4_;
                local_780 = vrcp14ss_avx512f(auVar53 << 0x20,ZEXT416((uint)fVar259));
                auVar89 = vfnmadd213ss_fma(local_780,local_770,ZEXT416(0x40000000));
                uVar81 = auVar88._0_4_;
                local_760 = fVar245;
                fStack_75c = fVar245;
                fStack_758 = fVar245;
                fStack_754 = fVar245;
                if (fVar259 < -fVar259) {
                  auVar273._0_4_ = sqrtf(fVar259);
                  auVar273._4_60_ = extraout_var_00;
                  auVar88 = ZEXT416(uVar81);
                  auVar90 = auVar273._0_16_;
                  auVar22 = local_940._0_16_;
                }
                else {
                  auVar90 = vsqrtss_avx512f(local_770,local_770);
                  auVar22 = local_940._0_16_;
                }
                fVar259 = fVar260 * 1.5 + fVar259 * -0.5 * fVar260 * fVar260 * fVar260;
                auVar155._0_4_ = auVar22._0_4_ * fVar259;
                auVar155._4_4_ = auVar22._4_4_ * fVar259;
                auVar155._8_4_ = auVar22._8_4_ * fVar259;
                auVar155._12_4_ = auVar22._12_4_ * fVar259;
                auVar269 = vdpps_avx(local_8a0._0_16_,auVar155,0x7f);
                fVar274 = auVar88._0_4_;
                fVar260 = auVar269._0_4_;
                auVar156._0_4_ = fVar260 * fVar260;
                auVar156._4_4_ = auVar269._4_4_ * auVar269._4_4_;
                auVar156._8_4_ = auVar269._8_4_ * auVar269._8_4_;
                auVar156._12_4_ = auVar269._12_4_ * auVar269._12_4_;
                auVar91 = vsubps_avx512vl(local_8c0._0_16_,auVar156);
                fVar261 = auVar91._0_4_;
                auVar183._4_12_ = ZEXT812(0) << 0x20;
                auVar183._0_4_ = fVar261;
                auVar92 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar183);
                auVar93 = vmulss_avx512f(auVar92,ZEXT416(0x3fc00000));
                auVar94 = vmulss_avx512f(auVar91,ZEXT416(0xbf000000));
                if (fVar261 < 0.0) {
                  local_7a0 = fVar259;
                  fStack_79c = fVar259;
                  fStack_798 = fVar259;
                  fStack_794 = fVar259;
                  local_790 = auVar92;
                  fVar261 = sqrtf(fVar261);
                  auVar94 = ZEXT416(auVar94._0_4_);
                  auVar93 = ZEXT416(auVar93._0_4_);
                  auVar90 = ZEXT416(auVar90._0_4_);
                  auVar88 = ZEXT416(uVar81);
                  auVar22 = local_940._0_16_;
                  auVar92 = local_790;
                  fVar259 = local_7a0;
                  fVar244 = fStack_79c;
                  fVar263 = fStack_798;
                  fVar245 = fStack_794;
                }
                else {
                  auVar91 = vsqrtss_avx(auVar91,auVar91);
                  fVar261 = auVar91._0_4_;
                  fVar244 = fVar259;
                  fVar263 = fVar259;
                  fVar245 = fVar259;
                }
                auVar296 = ZEXT1664(auVar22);
                auVar287._8_4_ = 0x7fffffff;
                auVar287._0_8_ = 0x7fffffff7fffffff;
                auVar287._12_4_ = 0x7fffffff;
                auVar289 = ZEXT1664(auVar287);
                auVar298 = ZEXT3264(local_8e0);
                auVar91 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar87,auVar277);
                auVar277 = vfmadd231ss_fma(auVar87,auVar277,SUB6416(ZEXT464(0xc0000000),0));
                auVar206._0_4_ = fVar276 * (float)local_860._0_4_;
                auVar206._4_4_ = fVar276 * (float)local_860._4_4_;
                auVar206._8_4_ = fVar276 * fStack_858;
                auVar206._12_4_ = fVar276 * fStack_854;
                auVar225._0_4_ = auVar277._0_4_;
                auVar225._4_4_ = auVar225._0_4_;
                auVar225._8_4_ = auVar225._0_4_;
                auVar225._12_4_ = auVar225._0_4_;
                auVar277 = vfmadd132ps_fma(auVar225,auVar206,local_820._0_16_);
                auVar184._0_4_ = auVar91._0_4_;
                auVar184._4_4_ = auVar184._0_4_;
                auVar184._8_4_ = auVar184._0_4_;
                auVar184._12_4_ = auVar184._0_4_;
                auVar277 = vfmadd132ps_fma(auVar184,auVar277,local_840._0_16_);
                auVar63._4_4_ = fStack_75c;
                auVar63._0_4_ = local_760;
                auVar63._8_4_ = fStack_758;
                auVar63._12_4_ = fStack_754;
                auVar277 = vfmadd132ps_fma(auVar63,auVar277,local_800._0_16_);
                auVar185._0_4_ = auVar277._0_4_ * (float)local_770._0_4_;
                auVar185._4_4_ = auVar277._4_4_ * (float)local_770._0_4_;
                auVar185._8_4_ = auVar277._8_4_ * (float)local_770._0_4_;
                auVar185._12_4_ = auVar277._12_4_ * (float)local_770._0_4_;
                auVar277 = vdpps_avx(auVar22,auVar277,0x7f);
                fVar262 = auVar277._0_4_;
                auVar207._0_4_ = auVar22._0_4_ * fVar262;
                auVar207._4_4_ = auVar22._4_4_ * fVar262;
                auVar207._8_4_ = auVar22._8_4_ * fVar262;
                auVar207._12_4_ = auVar22._12_4_ * fVar262;
                auVar277 = vsubps_avx(auVar185,auVar207);
                fVar262 = auVar89._0_4_ * (float)local_780._0_4_;
                auVar31._8_4_ = 0x80000000;
                auVar31._0_8_ = 0x8000000080000000;
                auVar31._12_4_ = 0x80000000;
                auVar136._16_16_ = local_8e0._16_16_;
                auVar91 = vxorps_avx512vl(auVar22,auVar31);
                auVar238._0_4_ = fVar259 * auVar277._0_4_ * fVar262;
                auVar238._4_4_ = fVar244 * auVar277._4_4_ * fVar262;
                auVar238._8_4_ = fVar263 * auVar277._8_4_ * fVar262;
                auVar238._12_4_ = fVar245 * auVar277._12_4_ * fVar262;
                auVar293 = ZEXT1664(auVar155);
                auVar277 = vdpps_avx(auVar91,auVar155,0x7f);
                auVar87 = vmaxss_avx(ZEXT416((uint)fVar251),
                                     ZEXT416((uint)(fVar258 * fVar257 * 1.9073486e-06)));
                auVar90 = vdivss_avx512f(ZEXT416((uint)fVar251),auVar90);
                auVar89 = vdpps_avx(local_8a0._0_16_,auVar238,0x7f);
                auVar88 = vfmadd213ss_fma(auVar88,ZEXT416((uint)fVar251),auVar87);
                auVar90 = vfmadd213ss_fma(ZEXT416((uint)(fVar274 + 1.0)),auVar90,auVar88);
                auVar88 = vdpps_avx(local_870,auVar155,0x7f);
                fVar259 = auVar277._0_4_ + auVar89._0_4_;
                auVar277 = vdpps_avx(local_8a0._0_16_,auVar91,0x7f);
                auVar91 = vmulss_avx512f(auVar94,auVar92);
                auVar92 = vmulss_avx512f(auVar92,auVar92);
                auVar89 = vdpps_avx(local_8a0._0_16_,local_870,0x7f);
                auVar93 = vaddss_avx512f(auVar93,ZEXT416((uint)(auVar91._0_4_ * auVar92._0_4_)));
                auVar92 = vfnmadd231ss_fma(auVar277,auVar269,ZEXT416((uint)fVar259));
                auVar91 = vfnmadd231ss_fma(auVar89,auVar269,auVar88);
                auVar277 = vpermilps_avx(local_6e0._0_16_,0xff);
                fVar261 = fVar261 - auVar277._0_4_;
                auVar277 = vshufps_avx(auVar22,auVar22,0xff);
                auVar89 = vfmsub213ss_fma(auVar92,auVar93,auVar277);
                fVar274 = auVar91._0_4_ * auVar93._0_4_;
                auVar92 = vfmsub231ss_fma(ZEXT416((uint)(auVar88._0_4_ * auVar89._0_4_)),
                                          ZEXT416((uint)fVar259),ZEXT416((uint)fVar274));
                fVar263 = auVar92._0_4_;
                fVar244 = fVar260 * (auVar89._0_4_ / fVar263);
                auVar250 = ZEXT464((uint)fVar244);
                fVar276 = fVar276 - (fVar260 * (fVar274 / fVar263) -
                                    fVar261 * (auVar88._0_4_ / fVar263));
                auVar273 = ZEXT464((uint)fVar276);
                fVar258 = fVar258 - (fVar261 * (fVar259 / fVar263) - fVar244);
                auVar271 = ZEXT464((uint)fVar258);
                auVar88 = vandps_avx(auVar269,auVar287);
                if (auVar90._0_4_ <= auVar88._0_4_) {
LAB_01c3a035:
                  bVar15 = false;
                }
                else {
                  auVar89 = vfmadd231ss_fma(ZEXT416((uint)(auVar90._0_4_ + auVar87._0_4_)),local_7c0
                                            ,ZEXT416(0x36000000));
                  auVar88 = vandps_avx(auVar287,ZEXT416((uint)fVar261));
                  if (auVar89._0_4_ <= auVar88._0_4_) goto LAB_01c3a035;
                  fVar258 = fVar258 + (float)local_7b0._0_4_;
                  auVar271 = ZEXT464((uint)fVar258);
                  bVar15 = true;
                  if ((((fVar171 <= fVar258) &&
                       (fVar259 = *(float *)(ray + k * 4 + 0x100), fVar258 <= fVar259)) &&
                      (0.0 <= fVar276)) && (fVar276 <= 1.0)) {
                    auVar136._0_16_ = ZEXT816(0) << 0x20;
                    auVar135._4_28_ = auVar136._4_28_;
                    auVar135._0_4_ = local_8c0._0_4_;
                    auVar88 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar135._0_16_);
                    fVar260 = auVar88._0_4_;
                    auVar88 = vmulss_avx512f(local_8c0._0_16_,ZEXT416(0xbf000000));
                    pGVar9 = (context->scene->geometries).items[uVar72].ptr;
                    if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      fVar260 = fVar260 * 1.5 + auVar88._0_4_ * fVar260 * fVar260 * fVar260;
                      auVar186._0_4_ = local_8a0._0_4_ * fVar260;
                      auVar186._4_4_ = local_8a0._4_4_ * fVar260;
                      auVar186._8_4_ = local_8a0._8_4_ * fVar260;
                      auVar186._12_4_ = local_8a0._12_4_ * fVar260;
                      auVar90 = vfmadd213ps_fma(auVar277,auVar186,auVar22);
                      auVar88 = vshufps_avx(auVar186,auVar186,0xc9);
                      auVar277 = vshufps_avx(auVar22,auVar22,0xc9);
                      auVar187._0_4_ = auVar186._0_4_ * auVar277._0_4_;
                      auVar187._4_4_ = auVar186._4_4_ * auVar277._4_4_;
                      auVar187._8_4_ = auVar186._8_4_ * auVar277._8_4_;
                      auVar187._12_4_ = auVar186._12_4_ * auVar277._12_4_;
                      auVar89 = vfmsub231ps_fma(auVar187,auVar22,auVar88);
                      auVar88 = vshufps_avx(auVar89,auVar89,0xc9);
                      auVar277 = vshufps_avx(auVar90,auVar90,0xc9);
                      auVar89 = vshufps_avx(auVar89,auVar89,0xd2);
                      auVar157._0_4_ = auVar90._0_4_ * auVar89._0_4_;
                      auVar157._4_4_ = auVar90._4_4_ * auVar89._4_4_;
                      auVar157._8_4_ = auVar90._8_4_ * auVar89._8_4_;
                      auVar157._12_4_ = auVar90._12_4_ * auVar89._12_4_;
                      auVar88 = vfmsub231ps_fma(auVar157,auVar88,auVar277);
                      uVar149 = auVar88._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = fVar258;
                        uVar8 = vextractps_avx(auVar88,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar8;
                        uVar8 = vextractps_avx(auVar88,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar8;
                        *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar149;
                        *(float *)(ray + k * 4 + 0x1e0) = fVar276;
                        *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                        *(uint *)(ray + k * 4 + 0x220) = uVar7;
                        *(uint *)(ray + k * 4 + 0x240) = uVar72;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar13 = context->user;
                        auVar214._8_4_ = 1;
                        auVar214._0_8_ = 0x100000001;
                        auVar214._12_4_ = 1;
                        auVar214._16_4_ = 1;
                        auVar214._20_4_ = 1;
                        auVar214._24_4_ = 1;
                        auVar214._28_4_ = 1;
                        auVar97 = vpermps_avx2(auVar214,ZEXT1632(auVar88));
                        auVar231._8_4_ = 2;
                        auVar231._0_8_ = 0x200000002;
                        auVar231._12_4_ = 2;
                        auVar231._16_4_ = 2;
                        auVar231._20_4_ = 2;
                        auVar231._24_4_ = 2;
                        auVar231._28_4_ = 2;
                        local_560 = vpermps_avx2(auVar231,ZEXT1632(auVar88));
                        local_580[0] = (RTCHitN)auVar97[0];
                        local_580[1] = (RTCHitN)auVar97[1];
                        local_580[2] = (RTCHitN)auVar97[2];
                        local_580[3] = (RTCHitN)auVar97[3];
                        local_580[4] = (RTCHitN)auVar97[4];
                        local_580[5] = (RTCHitN)auVar97[5];
                        local_580[6] = (RTCHitN)auVar97[6];
                        local_580[7] = (RTCHitN)auVar97[7];
                        local_580[8] = (RTCHitN)auVar97[8];
                        local_580[9] = (RTCHitN)auVar97[9];
                        local_580[10] = (RTCHitN)auVar97[10];
                        local_580[0xb] = (RTCHitN)auVar97[0xb];
                        local_580[0xc] = (RTCHitN)auVar97[0xc];
                        local_580[0xd] = (RTCHitN)auVar97[0xd];
                        local_580[0xe] = (RTCHitN)auVar97[0xe];
                        local_580[0xf] = (RTCHitN)auVar97[0xf];
                        local_580[0x10] = (RTCHitN)auVar97[0x10];
                        local_580[0x11] = (RTCHitN)auVar97[0x11];
                        local_580[0x12] = (RTCHitN)auVar97[0x12];
                        local_580[0x13] = (RTCHitN)auVar97[0x13];
                        local_580[0x14] = (RTCHitN)auVar97[0x14];
                        local_580[0x15] = (RTCHitN)auVar97[0x15];
                        local_580[0x16] = (RTCHitN)auVar97[0x16];
                        local_580[0x17] = (RTCHitN)auVar97[0x17];
                        local_580[0x18] = (RTCHitN)auVar97[0x18];
                        local_580[0x19] = (RTCHitN)auVar97[0x19];
                        local_580[0x1a] = (RTCHitN)auVar97[0x1a];
                        local_580[0x1b] = (RTCHitN)auVar97[0x1b];
                        local_580[0x1c] = (RTCHitN)auVar97[0x1c];
                        local_580[0x1d] = (RTCHitN)auVar97[0x1d];
                        local_580[0x1e] = (RTCHitN)auVar97[0x1e];
                        local_580[0x1f] = (RTCHitN)auVar97[0x1f];
                        local_540 = uVar149;
                        uStack_53c = uVar149;
                        uStack_538 = uVar149;
                        uStack_534 = uVar149;
                        uStack_530 = uVar149;
                        uStack_52c = uVar149;
                        uStack_528 = uVar149;
                        uStack_524 = uVar149;
                        local_520 = fVar276;
                        fStack_51c = fVar276;
                        fStack_518 = fVar276;
                        fStack_514 = fVar276;
                        fStack_510 = fVar276;
                        fStack_50c = fVar276;
                        fStack_508 = fVar276;
                        fStack_504 = fVar276;
                        local_500 = ZEXT432(0) << 0x20;
                        local_4e0 = local_600._0_8_;
                        uStack_4d8 = local_600._8_8_;
                        uStack_4d0 = local_600._16_8_;
                        uStack_4c8 = local_600._24_8_;
                        local_4c0 = local_5e0;
                        auVar97 = vpcmpeqd_avx2(local_5e0,local_5e0);
                        local_8f8[1] = auVar97;
                        *local_8f8 = auVar97;
                        local_4a0 = pRVar13->instID[0];
                        uStack_49c = local_4a0;
                        uStack_498 = local_4a0;
                        uStack_494 = local_4a0;
                        uStack_490 = local_4a0;
                        uStack_48c = local_4a0;
                        uStack_488 = local_4a0;
                        uStack_484 = local_4a0;
                        local_480 = pRVar13->instPrimID[0];
                        uStack_47c = local_480;
                        uStack_478 = local_480;
                        uStack_474 = local_480;
                        uStack_470 = local_480;
                        uStack_46c = local_480;
                        uStack_468 = local_480;
                        uStack_464 = local_480;
                        *(float *)(ray + k * 4 + 0x100) = fVar258;
                        local_7e0 = local_620._0_8_;
                        uStack_7d8 = local_620._8_8_;
                        uStack_7d0 = local_620._16_8_;
                        uStack_7c8 = local_620._24_8_;
                        local_970.valid = (int *)&local_7e0;
                        local_970.geometryUserPtr = pGVar9->userPtr;
                        local_970.context = context->user;
                        local_970.hit = local_580;
                        local_970.N = 8;
                        local_970.ray = (RTCRayN *)ray;
                        if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar250 = ZEXT464((uint)fVar244);
                          auVar293 = ZEXT1664(auVar155);
                          auVar296 = ZEXT1664(auVar22);
                          (*pGVar9->intersectionFilterN)(&local_970);
                          auVar271 = ZEXT1664(ZEXT416((uint)fVar258));
                          auVar273 = ZEXT1664(ZEXT416((uint)fVar276));
                          auVar298 = ZEXT3264(local_8e0);
                          auVar289 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        auVar59._8_8_ = uStack_7d8;
                        auVar59._0_8_ = local_7e0;
                        auVar59._16_8_ = uStack_7d0;
                        auVar59._24_8_ = uStack_7c8;
                        if (auVar59 != (undefined1  [32])0x0) {
                          p_Var14 = context->args->filter;
                          if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar250 = ZEXT1664(auVar250._0_16_);
                            auVar293 = ZEXT1664(auVar293._0_16_);
                            auVar296 = ZEXT1664(auVar296._0_16_);
                            (*p_Var14)(&local_970);
                            auVar271 = ZEXT1664(ZEXT416((uint)fVar258));
                            auVar273 = ZEXT1664(ZEXT416((uint)fVar276));
                            auVar298 = ZEXT3264(local_8e0);
                            auVar289 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar60._8_8_ = uStack_7d8;
                          auVar60._0_8_ = local_7e0;
                          auVar60._16_8_ = uStack_7d0;
                          auVar60._24_8_ = uStack_7c8;
                          if (auVar60 != (undefined1  [32])0x0) {
                            uVar80 = vptestmd_avx512vl(auVar60,auVar60);
                            iVar3 = *(int *)(local_970.hit + 4);
                            iVar4 = *(int *)(local_970.hit + 8);
                            iVar1 = *(int *)(local_970.hit + 0xc);
                            iVar55 = *(int *)(local_970.hit + 0x10);
                            iVar56 = *(int *)(local_970.hit + 0x14);
                            iVar57 = *(int *)(local_970.hit + 0x18);
                            iVar58 = *(int *)(local_970.hit + 0x1c);
                            bVar69 = (byte)uVar80;
                            bVar79 = (bool)((byte)(uVar80 >> 1) & 1);
                            bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
                            bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
                            bVar18 = (bool)((byte)(uVar80 >> 4) & 1);
                            bVar19 = (bool)((byte)(uVar80 >> 5) & 1);
                            bVar20 = (bool)((byte)(uVar80 >> 6) & 1);
                            bVar21 = SUB81(uVar80 >> 7,0);
                            *(uint *)(local_970.ray + 0x180) =
                                 (uint)(bVar69 & 1) * *(int *)local_970.hit |
                                 (uint)!(bool)(bVar69 & 1) * *(int *)(local_970.ray + 0x180);
                            *(uint *)(local_970.ray + 0x184) =
                                 (uint)bVar79 * iVar3 |
                                 (uint)!bVar79 * *(int *)(local_970.ray + 0x184);
                            *(uint *)(local_970.ray + 0x188) =
                                 (uint)bVar16 * iVar4 |
                                 (uint)!bVar16 * *(int *)(local_970.ray + 0x188);
                            *(uint *)(local_970.ray + 0x18c) =
                                 (uint)bVar17 * iVar1 |
                                 (uint)!bVar17 * *(int *)(local_970.ray + 0x18c);
                            *(uint *)(local_970.ray + 400) =
                                 (uint)bVar18 * iVar55 |
                                 (uint)!bVar18 * *(int *)(local_970.ray + 400);
                            *(uint *)(local_970.ray + 0x194) =
                                 (uint)bVar19 * iVar56 |
                                 (uint)!bVar19 * *(int *)(local_970.ray + 0x194);
                            *(uint *)(local_970.ray + 0x198) =
                                 (uint)bVar20 * iVar57 |
                                 (uint)!bVar20 * *(int *)(local_970.ray + 0x198);
                            *(uint *)(local_970.ray + 0x19c) =
                                 (uint)bVar21 * iVar58 |
                                 (uint)!bVar21 * *(int *)(local_970.ray + 0x19c);
                            iVar3 = *(int *)(local_970.hit + 0x24);
                            iVar4 = *(int *)(local_970.hit + 0x28);
                            iVar1 = *(int *)(local_970.hit + 0x2c);
                            iVar55 = *(int *)(local_970.hit + 0x30);
                            iVar56 = *(int *)(local_970.hit + 0x34);
                            iVar57 = *(int *)(local_970.hit + 0x38);
                            iVar58 = *(int *)(local_970.hit + 0x3c);
                            bVar79 = (bool)((byte)(uVar80 >> 1) & 1);
                            bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
                            bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
                            bVar18 = (bool)((byte)(uVar80 >> 4) & 1);
                            bVar19 = (bool)((byte)(uVar80 >> 5) & 1);
                            bVar20 = (bool)((byte)(uVar80 >> 6) & 1);
                            bVar21 = SUB81(uVar80 >> 7,0);
                            *(uint *)(local_970.ray + 0x1a0) =
                                 (uint)(bVar69 & 1) * *(int *)(local_970.hit + 0x20) |
                                 (uint)!(bool)(bVar69 & 1) * *(int *)(local_970.ray + 0x1a0);
                            *(uint *)(local_970.ray + 0x1a4) =
                                 (uint)bVar79 * iVar3 |
                                 (uint)!bVar79 * *(int *)(local_970.ray + 0x1a4);
                            *(uint *)(local_970.ray + 0x1a8) =
                                 (uint)bVar16 * iVar4 |
                                 (uint)!bVar16 * *(int *)(local_970.ray + 0x1a8);
                            *(uint *)(local_970.ray + 0x1ac) =
                                 (uint)bVar17 * iVar1 |
                                 (uint)!bVar17 * *(int *)(local_970.ray + 0x1ac);
                            *(uint *)(local_970.ray + 0x1b0) =
                                 (uint)bVar18 * iVar55 |
                                 (uint)!bVar18 * *(int *)(local_970.ray + 0x1b0);
                            *(uint *)(local_970.ray + 0x1b4) =
                                 (uint)bVar19 * iVar56 |
                                 (uint)!bVar19 * *(int *)(local_970.ray + 0x1b4);
                            *(uint *)(local_970.ray + 0x1b8) =
                                 (uint)bVar20 * iVar57 |
                                 (uint)!bVar20 * *(int *)(local_970.ray + 0x1b8);
                            *(uint *)(local_970.ray + 0x1bc) =
                                 (uint)bVar21 * iVar58 |
                                 (uint)!bVar21 * *(int *)(local_970.ray + 0x1bc);
                            iVar3 = *(int *)(local_970.hit + 0x44);
                            iVar4 = *(int *)(local_970.hit + 0x48);
                            iVar1 = *(int *)(local_970.hit + 0x4c);
                            iVar55 = *(int *)(local_970.hit + 0x50);
                            iVar56 = *(int *)(local_970.hit + 0x54);
                            iVar57 = *(int *)(local_970.hit + 0x58);
                            iVar58 = *(int *)(local_970.hit + 0x5c);
                            bVar79 = (bool)((byte)(uVar80 >> 1) & 1);
                            bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
                            bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
                            bVar18 = (bool)((byte)(uVar80 >> 4) & 1);
                            bVar19 = (bool)((byte)(uVar80 >> 5) & 1);
                            bVar20 = (bool)((byte)(uVar80 >> 6) & 1);
                            bVar21 = SUB81(uVar80 >> 7,0);
                            *(uint *)(local_970.ray + 0x1c0) =
                                 (uint)(bVar69 & 1) * *(int *)(local_970.hit + 0x40) |
                                 (uint)!(bool)(bVar69 & 1) * *(int *)(local_970.ray + 0x1c0);
                            *(uint *)(local_970.ray + 0x1c4) =
                                 (uint)bVar79 * iVar3 |
                                 (uint)!bVar79 * *(int *)(local_970.ray + 0x1c4);
                            *(uint *)(local_970.ray + 0x1c8) =
                                 (uint)bVar16 * iVar4 |
                                 (uint)!bVar16 * *(int *)(local_970.ray + 0x1c8);
                            *(uint *)(local_970.ray + 0x1cc) =
                                 (uint)bVar17 * iVar1 |
                                 (uint)!bVar17 * *(int *)(local_970.ray + 0x1cc);
                            *(uint *)(local_970.ray + 0x1d0) =
                                 (uint)bVar18 * iVar55 |
                                 (uint)!bVar18 * *(int *)(local_970.ray + 0x1d0);
                            *(uint *)(local_970.ray + 0x1d4) =
                                 (uint)bVar19 * iVar56 |
                                 (uint)!bVar19 * *(int *)(local_970.ray + 0x1d4);
                            *(uint *)(local_970.ray + 0x1d8) =
                                 (uint)bVar20 * iVar57 |
                                 (uint)!bVar20 * *(int *)(local_970.ray + 0x1d8);
                            *(uint *)(local_970.ray + 0x1dc) =
                                 (uint)bVar21 * iVar58 |
                                 (uint)!bVar21 * *(int *)(local_970.ray + 0x1dc);
                            iVar3 = *(int *)(local_970.hit + 100);
                            iVar4 = *(int *)(local_970.hit + 0x68);
                            iVar1 = *(int *)(local_970.hit + 0x6c);
                            iVar55 = *(int *)(local_970.hit + 0x70);
                            iVar56 = *(int *)(local_970.hit + 0x74);
                            iVar57 = *(int *)(local_970.hit + 0x78);
                            iVar58 = *(int *)(local_970.hit + 0x7c);
                            bVar79 = (bool)((byte)(uVar80 >> 1) & 1);
                            bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
                            bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
                            bVar18 = (bool)((byte)(uVar80 >> 4) & 1);
                            bVar19 = (bool)((byte)(uVar80 >> 5) & 1);
                            bVar20 = (bool)((byte)(uVar80 >> 6) & 1);
                            bVar21 = SUB81(uVar80 >> 7,0);
                            *(uint *)(local_970.ray + 0x1e0) =
                                 (uint)(bVar69 & 1) * *(int *)(local_970.hit + 0x60) |
                                 (uint)!(bool)(bVar69 & 1) * *(int *)(local_970.ray + 0x1e0);
                            *(uint *)(local_970.ray + 0x1e4) =
                                 (uint)bVar79 * iVar3 |
                                 (uint)!bVar79 * *(int *)(local_970.ray + 0x1e4);
                            *(uint *)(local_970.ray + 0x1e8) =
                                 (uint)bVar16 * iVar4 |
                                 (uint)!bVar16 * *(int *)(local_970.ray + 0x1e8);
                            *(uint *)(local_970.ray + 0x1ec) =
                                 (uint)bVar17 * iVar1 |
                                 (uint)!bVar17 * *(int *)(local_970.ray + 0x1ec);
                            *(uint *)(local_970.ray + 0x1f0) =
                                 (uint)bVar18 * iVar55 |
                                 (uint)!bVar18 * *(int *)(local_970.ray + 0x1f0);
                            *(uint *)(local_970.ray + 500) =
                                 (uint)bVar19 * iVar56 |
                                 (uint)!bVar19 * *(int *)(local_970.ray + 500);
                            *(uint *)(local_970.ray + 0x1f8) =
                                 (uint)bVar20 * iVar57 |
                                 (uint)!bVar20 * *(int *)(local_970.ray + 0x1f8);
                            *(uint *)(local_970.ray + 0x1fc) =
                                 (uint)bVar21 * iVar58 |
                                 (uint)!bVar21 * *(int *)(local_970.ray + 0x1fc);
                            iVar3 = *(int *)(local_970.hit + 0x84);
                            iVar4 = *(int *)(local_970.hit + 0x88);
                            iVar1 = *(int *)(local_970.hit + 0x8c);
                            iVar55 = *(int *)(local_970.hit + 0x90);
                            iVar56 = *(int *)(local_970.hit + 0x94);
                            iVar57 = *(int *)(local_970.hit + 0x98);
                            iVar58 = *(int *)(local_970.hit + 0x9c);
                            bVar79 = (bool)((byte)(uVar80 >> 1) & 1);
                            bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
                            bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
                            bVar18 = (bool)((byte)(uVar80 >> 4) & 1);
                            bVar19 = (bool)((byte)(uVar80 >> 5) & 1);
                            bVar20 = (bool)((byte)(uVar80 >> 6) & 1);
                            bVar21 = SUB81(uVar80 >> 7,0);
                            *(uint *)(local_970.ray + 0x200) =
                                 (uint)(bVar69 & 1) * *(int *)(local_970.hit + 0x80) |
                                 (uint)!(bool)(bVar69 & 1) * *(int *)(local_970.ray + 0x200);
                            *(uint *)(local_970.ray + 0x204) =
                                 (uint)bVar79 * iVar3 |
                                 (uint)!bVar79 * *(int *)(local_970.ray + 0x204);
                            *(uint *)(local_970.ray + 0x208) =
                                 (uint)bVar16 * iVar4 |
                                 (uint)!bVar16 * *(int *)(local_970.ray + 0x208);
                            *(uint *)(local_970.ray + 0x20c) =
                                 (uint)bVar17 * iVar1 |
                                 (uint)!bVar17 * *(int *)(local_970.ray + 0x20c);
                            *(uint *)(local_970.ray + 0x210) =
                                 (uint)bVar18 * iVar55 |
                                 (uint)!bVar18 * *(int *)(local_970.ray + 0x210);
                            *(uint *)(local_970.ray + 0x214) =
                                 (uint)bVar19 * iVar56 |
                                 (uint)!bVar19 * *(int *)(local_970.ray + 0x214);
                            *(uint *)(local_970.ray + 0x218) =
                                 (uint)bVar20 * iVar57 |
                                 (uint)!bVar20 * *(int *)(local_970.ray + 0x218);
                            *(uint *)(local_970.ray + 0x21c) =
                                 (uint)bVar21 * iVar58 |
                                 (uint)!bVar21 * *(int *)(local_970.ray + 0x21c);
                            auVar97 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                          (local_970.hit + 0xa0));
                            *(undefined1 (*) [32])(local_970.ray + 0x220) = auVar97;
                            auVar97 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                          (local_970.hit + 0xc0));
                            *(undefined1 (*) [32])(local_970.ray + 0x240) = auVar97;
                            auVar97 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                          (local_970.hit + 0xe0));
                            *(undefined1 (*) [32])(local_970.ray + 0x260) = auVar97;
                            auVar97 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                          (local_970.hit + 0x100));
                            *(undefined1 (*) [32])(local_970.ray + 0x280) = auVar97;
                            goto LAB_01c3a038;
                          }
                        }
                        *(float *)(ray + k * 4 + 0x100) = fVar259;
                      }
                    }
                  }
                }
LAB_01c3a038:
                bVar79 = lVar78 != 0;
                lVar78 = lVar78 + -1;
              } while ((!bVar15) && (bVar79));
              auVar65._4_4_ = fStack_69c;
              auVar65._0_4_ = local_6a0;
              auVar65._8_4_ = fStack_698;
              auVar65._12_4_ = fStack_694;
              auVar65._16_4_ = fStack_690;
              auVar65._20_4_ = fStack_68c;
              auVar65._24_4_ = fStack_688;
              auVar65._28_4_ = fStack_684;
              uVar149 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar40._4_4_ = uVar149;
              auVar40._0_4_ = uVar149;
              auVar40._8_4_ = uVar149;
              auVar40._12_4_ = uVar149;
              auVar40._16_4_ = uVar149;
              auVar40._20_4_ = uVar149;
              auVar40._24_4_ = uVar149;
              auVar40._28_4_ = uVar149;
              uVar25 = vcmpps_avx512vl(auVar65,auVar40,2);
              bVar74 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar74 & (byte)uVar25;
            } while (bVar74 != 0);
          }
          auVar167._0_4_ = (float)local_6c0._0_4_ + (float)local_700._0_4_;
          auVar167._4_4_ = (float)local_6c0._4_4_ + (float)local_700._4_4_;
          auVar167._8_4_ = fStack_6b8 + fStack_6f8;
          auVar167._12_4_ = fStack_6b4 + fStack_6f4;
          auVar167._16_4_ = fStack_6b0 + fStack_6f0;
          auVar167._20_4_ = fStack_6ac + fStack_6ec;
          auVar167._24_4_ = fStack_6a8 + fStack_6e8;
          auVar167._28_4_ = fStack_6a4 + fStack_6e4;
          uVar149 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar41._4_4_ = uVar149;
          auVar41._0_4_ = uVar149;
          auVar41._8_4_ = uVar149;
          auVar41._12_4_ = uVar149;
          auVar41._16_4_ = uVar149;
          auVar41._20_4_ = uVar149;
          auVar41._24_4_ = uVar149;
          auVar41._28_4_ = uVar149;
          uVar25 = vcmpps_avx512vl(auVar167,auVar41,2);
          bVar75 = (byte)uVar24 | ~bVar75;
          bVar73 = (byte)uVar26 & bVar73 & (byte)uVar25;
          auVar168._8_4_ = 2;
          auVar168._0_8_ = 0x200000002;
          auVar168._12_4_ = 2;
          auVar168._16_4_ = 2;
          auVar168._20_4_ = 2;
          auVar168._24_4_ = 2;
          auVar168._28_4_ = 2;
          auVar42._8_4_ = 3;
          auVar42._0_8_ = 0x300000003;
          auVar42._12_4_ = 3;
          auVar42._16_4_ = 3;
          auVar42._20_4_ = 3;
          auVar42._24_4_ = 3;
          auVar42._28_4_ = 3;
          auVar97 = vpblendmd_avx512vl(auVar168,auVar42);
          local_6c0._0_4_ = (uint)(bVar75 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar75 & 1) * 2;
          bVar15 = (bool)(bVar75 >> 1 & 1);
          local_6c0._4_4_ = (uint)bVar15 * auVar97._4_4_ | (uint)!bVar15 * 2;
          bVar15 = (bool)(bVar75 >> 2 & 1);
          fStack_6b8 = (float)((uint)bVar15 * auVar97._8_4_ | (uint)!bVar15 * 2);
          bVar15 = (bool)(bVar75 >> 3 & 1);
          fStack_6b4 = (float)((uint)bVar15 * auVar97._12_4_ | (uint)!bVar15 * 2);
          bVar15 = (bool)(bVar75 >> 4 & 1);
          fStack_6b0 = (float)((uint)bVar15 * auVar97._16_4_ | (uint)!bVar15 * 2);
          bVar15 = (bool)(bVar75 >> 5 & 1);
          fStack_6ac = (float)((uint)bVar15 * auVar97._20_4_ | (uint)!bVar15 * 2);
          bVar15 = (bool)(bVar75 >> 6 & 1);
          fStack_6a8 = (float)((uint)bVar15 * auVar97._24_4_ | (uint)!bVar15 * 2);
          fStack_6a4 = (float)((uint)(bVar75 >> 7) * auVar97._28_4_ | (uint)!(bool)(bVar75 >> 7) * 2
                              );
          uVar24 = vpcmpd_avx512vl(_local_6c0,local_5c0,2);
          bVar75 = (byte)uVar24 & bVar73;
          if (bVar75 != 0) {
            auVar277 = vminps_avx(local_800._0_16_,local_840._0_16_);
            auVar88 = vmaxps_avx(local_800._0_16_,local_840._0_16_);
            auVar89 = vminps_avx(local_820._0_16_,local_860._0_16_);
            auVar22 = vminps_avx(auVar277,auVar89);
            auVar277 = vmaxps_avx(local_820._0_16_,local_860._0_16_);
            auVar89 = vmaxps_avx(auVar88,auVar277);
            auVar88 = vandps_avx(auVar289._0_16_,auVar22);
            auVar277 = vandps_avx(auVar289._0_16_,auVar89);
            auVar88 = vmaxps_avx(auVar88,auVar277);
            auVar277 = vmovshdup_avx(auVar88);
            auVar277 = vmaxss_avx(auVar277,auVar88);
            auVar88 = vshufpd_avx(auVar88,auVar88,1);
            auVar88 = vmaxss_avx(auVar88,auVar277);
            fVar251 = auVar88._0_4_ * 1.9073486e-06;
            local_7c0 = vshufps_avx(auVar89,auVar89,0xff);
            _local_720 = _local_460;
            local_6a0 = (float)local_460._0_4_ + (float)local_700._0_4_;
            fStack_69c = (float)local_460._4_4_ + (float)local_700._4_4_;
            fStack_698 = fStack_458 + fStack_6f8;
            fStack_694 = fStack_454 + fStack_6f4;
            fStack_690 = fStack_450 + fStack_6f0;
            fStack_68c = fStack_44c + fStack_6ec;
            fStack_688 = fStack_448 + fStack_6e8;
            fStack_684 = fStack_444 + fStack_6e4;
            do {
              auVar169._8_4_ = 0x7f800000;
              auVar169._0_8_ = 0x7f8000007f800000;
              auVar169._12_4_ = 0x7f800000;
              auVar169._16_4_ = 0x7f800000;
              auVar169._20_4_ = 0x7f800000;
              auVar169._24_4_ = 0x7f800000;
              auVar169._28_4_ = 0x7f800000;
              auVar97 = vblendmps_avx512vl(auVar169,_local_720);
              auVar137._0_4_ =
                   (uint)(bVar75 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar75 & 1) * 0x7f800000;
              bVar15 = (bool)(bVar75 >> 1 & 1);
              auVar137._4_4_ = (uint)bVar15 * auVar97._4_4_ | (uint)!bVar15 * 0x7f800000;
              bVar15 = (bool)(bVar75 >> 2 & 1);
              auVar137._8_4_ = (uint)bVar15 * auVar97._8_4_ | (uint)!bVar15 * 0x7f800000;
              bVar15 = (bool)(bVar75 >> 3 & 1);
              auVar137._12_4_ = (uint)bVar15 * auVar97._12_4_ | (uint)!bVar15 * 0x7f800000;
              bVar15 = (bool)(bVar75 >> 4 & 1);
              auVar137._16_4_ = (uint)bVar15 * auVar97._16_4_ | (uint)!bVar15 * 0x7f800000;
              bVar15 = (bool)(bVar75 >> 5 & 1);
              auVar137._20_4_ = (uint)bVar15 * auVar97._20_4_ | (uint)!bVar15 * 0x7f800000;
              auVar137._24_4_ =
                   (uint)(bVar75 >> 6) * auVar97._24_4_ | (uint)!(bool)(bVar75 >> 6) * 0x7f800000;
              auVar137._28_4_ = 0x7f800000;
              auVar97 = vshufps_avx(auVar137,auVar137,0xb1);
              auVar97 = vminps_avx(auVar137,auVar97);
              auVar96 = vshufpd_avx(auVar97,auVar97,5);
              auVar97 = vminps_avx(auVar97,auVar96);
              auVar96 = vpermpd_avx2(auVar97,0x4e);
              auVar97 = vminps_avx(auVar97,auVar96);
              uVar24 = vcmpps_avx512vl(auVar137,auVar97,0);
              bVar69 = (byte)uVar24 & bVar75;
              bVar74 = bVar75;
              if (bVar69 != 0) {
                bVar74 = bVar69;
              }
              iVar2 = 0;
              for (uVar81 = (uint)bVar74; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x80000000) {
                iVar2 = iVar2 + 1;
              }
              uVar81 = *(uint *)(local_680 + (uint)(iVar2 << 2));
              fVar257 = *(float *)(local_440 + (uint)(iVar2 << 2));
              fVar258 = auVar86._0_4_;
              if ((float)local_880._0_4_ < 0.0) {
                fVar258 = sqrtf((float)local_880._0_4_);
              }
              auVar273 = ZEXT464(uVar81);
              lVar78 = 4;
              do {
                auVar158._4_4_ = fVar257;
                auVar158._0_4_ = fVar257;
                auVar158._8_4_ = fVar257;
                auVar158._12_4_ = fVar257;
                auVar88 = vfmadd132ps_fma(auVar158,ZEXT816(0) << 0x40,local_870);
                fVar276 = auVar273._0_4_;
                fVar245 = 1.0 - fVar276;
                fVar261 = fVar245 * fVar245 * fVar245;
                fVar259 = fVar276 * fVar276;
                fVar263 = fVar276 * fVar259;
                auVar277 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar261),
                                           ZEXT416((uint)fVar263));
                fVar260 = fVar276 * fVar245;
                auVar87 = ZEXT416((uint)fVar245);
                auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar276 * fVar260 * 6.0)),
                                          ZEXT416((uint)(fVar260 * fVar245)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar263),
                                          ZEXT416((uint)fVar261));
                auVar90 = vfmadd231ss_fma(ZEXT416((uint)(fVar260 * fVar245 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar276 * fVar260)));
                fVar261 = fVar261 * 0.16666667;
                fVar274 = (auVar277._0_4_ + auVar22._0_4_) * 0.16666667;
                fVar244 = (auVar89._0_4_ + auVar90._0_4_) * 0.16666667;
                fVar263 = fVar263 * 0.16666667;
                auVar208._0_4_ = fVar263 * (float)local_860._0_4_;
                auVar208._4_4_ = fVar263 * (float)local_860._4_4_;
                auVar208._8_4_ = fVar263 * fStack_858;
                auVar208._12_4_ = fVar263 * fStack_854;
                auVar239._4_4_ = fVar244;
                auVar239._0_4_ = fVar244;
                auVar239._8_4_ = fVar244;
                auVar239._12_4_ = fVar244;
                auVar277 = vfmadd132ps_fma(auVar239,auVar208,local_820._0_16_);
                auVar209._4_4_ = fVar274;
                auVar209._0_4_ = fVar274;
                auVar209._8_4_ = fVar274;
                auVar209._12_4_ = fVar274;
                auVar277 = vfmadd132ps_fma(auVar209,auVar277,local_840._0_16_);
                auVar188._4_4_ = fVar261;
                auVar188._0_4_ = fVar261;
                auVar188._8_4_ = fVar261;
                auVar188._12_4_ = fVar261;
                auVar277 = vfmadd132ps_fma(auVar188,auVar277,local_800._0_16_);
                local_6e0._0_16_ = auVar277;
                auVar88 = vsubps_avx(auVar88,auVar277);
                local_8a0._0_16_ = auVar88;
                auVar88 = vdpps_avx(auVar88,auVar88,0x7f);
                auVar277 = auVar273._0_16_;
                local_8c0._0_16_ = auVar88;
                if (auVar88._0_4_ < 0.0) {
                  local_940._0_4_ = fVar259;
                  auVar299._0_4_ = sqrtf(auVar88._0_4_);
                  auVar299._4_60_ = extraout_var_01;
                  auVar88 = auVar299._0_16_;
                }
                else {
                  auVar88 = vsqrtss_avx(auVar88,auVar88);
                  local_940._0_4_ = fVar259;
                }
                auVar22 = vfnmsub213ss_fma(auVar277,auVar277,ZEXT416((uint)(fVar260 * 4.0)));
                auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar260 * 4.0)),auVar87,auVar87);
                fVar259 = fVar245 * -fVar245 * 0.5;
                fVar260 = auVar22._0_4_ * 0.5;
                fVar261 = auVar89._0_4_ * 0.5;
                local_940._0_4_ = (float)local_940._0_4_ * 0.5;
                auVar226._0_4_ = (float)local_940._0_4_ * (float)local_860._0_4_;
                auVar226._4_4_ = (float)local_940._0_4_ * (float)local_860._4_4_;
                auVar226._8_4_ = (float)local_940._0_4_ * fStack_858;
                auVar226._12_4_ = (float)local_940._0_4_ * fStack_854;
                auVar189._4_4_ = fVar261;
                auVar189._0_4_ = fVar261;
                auVar189._8_4_ = fVar261;
                auVar189._12_4_ = fVar261;
                auVar89 = vfmadd132ps_fma(auVar189,auVar226,local_820._0_16_);
                auVar210._4_4_ = fVar260;
                auVar210._0_4_ = fVar260;
                auVar210._8_4_ = fVar260;
                auVar210._12_4_ = fVar260;
                auVar89 = vfmadd132ps_fma(auVar210,auVar89,local_840._0_16_);
                auVar295._4_4_ = fVar259;
                auVar295._0_4_ = fVar259;
                auVar295._8_4_ = fVar259;
                auVar295._12_4_ = fVar259;
                local_940._0_16_ = vfmadd132ps_fma(auVar295,auVar89,local_800._0_16_);
                local_770 = vdpps_avx(local_940._0_16_,local_940._0_16_,0x7f);
                auVar54._12_4_ = 0;
                auVar54._0_12_ = ZEXT812(0);
                fVar259 = local_770._0_4_;
                auVar89 = vrsqrt14ss_avx512f(auVar54 << 0x20,ZEXT416((uint)fVar259));
                fVar260 = auVar89._0_4_;
                local_780 = vrcp14ss_avx512f(auVar54 << 0x20,ZEXT416((uint)fVar259));
                auVar89 = vfnmadd213ss_fma(local_780,local_770,ZEXT416(0x40000000));
                uVar81 = auVar88._0_4_;
                local_760 = fVar245;
                fStack_75c = fVar245;
                fStack_758 = fVar245;
                fStack_754 = fVar245;
                if (fVar259 < -fVar259) {
                  auVar217._0_4_ = sqrtf(fVar259);
                  auVar217._4_60_ = extraout_var_02;
                  auVar88 = ZEXT416(uVar81);
                  auVar90 = auVar217._0_16_;
                  auVar22 = local_940._0_16_;
                }
                else {
                  auVar90 = vsqrtss_avx512f(local_770,local_770);
                  auVar22 = local_940._0_16_;
                }
                fVar259 = fVar260 * 1.5 + fVar259 * -0.5 * fVar260 * fVar260 * fVar260;
                auVar159._0_4_ = auVar22._0_4_ * fVar259;
                auVar159._4_4_ = auVar22._4_4_ * fVar259;
                auVar159._8_4_ = auVar22._8_4_ * fVar259;
                auVar159._12_4_ = auVar22._12_4_ * fVar259;
                auVar269 = vdpps_avx(local_8a0._0_16_,auVar159,0x7f);
                fVar274 = auVar88._0_4_;
                fVar260 = auVar269._0_4_;
                auVar160._0_4_ = fVar260 * fVar260;
                auVar160._4_4_ = auVar269._4_4_ * auVar269._4_4_;
                auVar160._8_4_ = auVar269._8_4_ * auVar269._8_4_;
                auVar160._12_4_ = auVar269._12_4_ * auVar269._12_4_;
                auVar91 = vsubps_avx512vl(local_8c0._0_16_,auVar160);
                fVar261 = auVar91._0_4_;
                auVar190._4_12_ = ZEXT812(0) << 0x20;
                auVar190._0_4_ = fVar261;
                auVar92 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar190);
                auVar93 = vmulss_avx512f(auVar92,ZEXT416(0x3fc00000));
                auVar94 = vmulss_avx512f(auVar91,ZEXT416(0xbf000000));
                if (fVar261 < 0.0) {
                  local_7a0 = fVar259;
                  fStack_79c = fVar259;
                  fStack_798 = fVar259;
                  fStack_794 = fVar259;
                  local_790 = auVar92;
                  fVar261 = sqrtf(fVar261);
                  auVar94 = ZEXT416(auVar94._0_4_);
                  auVar93 = ZEXT416(auVar93._0_4_);
                  auVar90 = ZEXT416(auVar90._0_4_);
                  auVar88 = ZEXT416(uVar81);
                  auVar22 = local_940._0_16_;
                  auVar92 = local_790;
                  fVar259 = local_7a0;
                  fVar244 = fStack_79c;
                  fVar263 = fStack_798;
                  fVar245 = fStack_794;
                }
                else {
                  auVar91 = vsqrtss_avx(auVar91,auVar91);
                  fVar261 = auVar91._0_4_;
                  fVar244 = fVar259;
                  fVar263 = fVar259;
                  fVar245 = fVar259;
                }
                auVar296 = ZEXT1664(auVar22);
                auVar289 = ZEXT1664(local_8a0._0_16_);
                auVar270._8_4_ = 0x7fffffff;
                auVar270._0_8_ = 0x7fffffff7fffffff;
                auVar270._12_4_ = 0x7fffffff;
                auVar271 = ZEXT1664(auVar270);
                auVar298 = ZEXT3264(local_8e0);
                auVar91 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar87,auVar277);
                auVar277 = vfmadd231ss_fma(auVar87,auVar277,SUB6416(ZEXT464(0xc0000000),0));
                auVar211._0_4_ = fVar276 * (float)local_860._0_4_;
                auVar211._4_4_ = fVar276 * (float)local_860._4_4_;
                auVar211._8_4_ = fVar276 * fStack_858;
                auVar211._12_4_ = fVar276 * fStack_854;
                auVar227._0_4_ = auVar277._0_4_;
                auVar227._4_4_ = auVar227._0_4_;
                auVar227._8_4_ = auVar227._0_4_;
                auVar227._12_4_ = auVar227._0_4_;
                auVar277 = vfmadd132ps_fma(auVar227,auVar211,local_820._0_16_);
                auVar191._0_4_ = auVar91._0_4_;
                auVar191._4_4_ = auVar191._0_4_;
                auVar191._8_4_ = auVar191._0_4_;
                auVar191._12_4_ = auVar191._0_4_;
                auVar277 = vfmadd132ps_fma(auVar191,auVar277,local_840._0_16_);
                auVar64._4_4_ = fStack_75c;
                auVar64._0_4_ = local_760;
                auVar64._8_4_ = fStack_758;
                auVar64._12_4_ = fStack_754;
                auVar277 = vfmadd132ps_fma(auVar64,auVar277,local_800._0_16_);
                auVar192._0_4_ = auVar277._0_4_ * (float)local_770._0_4_;
                auVar192._4_4_ = auVar277._4_4_ * (float)local_770._0_4_;
                auVar192._8_4_ = auVar277._8_4_ * (float)local_770._0_4_;
                auVar192._12_4_ = auVar277._12_4_ * (float)local_770._0_4_;
                auVar277 = vdpps_avx(auVar22,auVar277,0x7f);
                fVar262 = auVar277._0_4_;
                auVar212._0_4_ = auVar22._0_4_ * fVar262;
                auVar212._4_4_ = auVar22._4_4_ * fVar262;
                auVar212._8_4_ = auVar22._8_4_ * fVar262;
                auVar212._12_4_ = auVar22._12_4_ * fVar262;
                auVar277 = vsubps_avx(auVar192,auVar212);
                fVar262 = auVar89._0_4_ * (float)local_780._0_4_;
                auVar32._8_4_ = 0x80000000;
                auVar32._0_8_ = 0x8000000080000000;
                auVar32._12_4_ = 0x80000000;
                auVar139._16_16_ = local_8e0._16_16_;
                auVar91 = vxorps_avx512vl(auVar22,auVar32);
                auVar240._0_4_ = fVar259 * auVar277._0_4_ * fVar262;
                auVar240._4_4_ = fVar244 * auVar277._4_4_ * fVar262;
                auVar240._8_4_ = fVar263 * auVar277._8_4_ * fVar262;
                auVar240._12_4_ = fVar245 * auVar277._12_4_ * fVar262;
                auVar293 = ZEXT1664(auVar159);
                auVar277 = vdpps_avx(auVar91,auVar159,0x7f);
                auVar87 = vmaxss_avx(ZEXT416((uint)fVar251),
                                     ZEXT416((uint)(fVar257 * fVar258 * 1.9073486e-06)));
                auVar90 = vdivss_avx512f(ZEXT416((uint)fVar251),auVar90);
                auVar89 = vdpps_avx(local_8a0._0_16_,auVar240,0x7f);
                auVar88 = vfmadd213ss_fma(auVar88,ZEXT416((uint)fVar251),auVar87);
                auVar90 = vfmadd213ss_fma(ZEXT416((uint)(fVar274 + 1.0)),auVar90,auVar88);
                auVar88 = vdpps_avx(local_870,auVar159,0x7f);
                fVar259 = auVar277._0_4_ + auVar89._0_4_;
                auVar277 = vdpps_avx(local_8a0._0_16_,auVar91,0x7f);
                auVar91 = vmulss_avx512f(auVar94,auVar92);
                auVar92 = vmulss_avx512f(auVar92,auVar92);
                auVar89 = vdpps_avx(local_8a0._0_16_,local_870,0x7f);
                auVar93 = vaddss_avx512f(auVar93,ZEXT416((uint)(auVar91._0_4_ * auVar92._0_4_)));
                auVar92 = vfnmadd231ss_fma(auVar277,auVar269,ZEXT416((uint)fVar259));
                auVar91 = vfnmadd231ss_fma(auVar89,auVar269,auVar88);
                auVar277 = vpermilps_avx(local_6e0._0_16_,0xff);
                fVar261 = fVar261 - auVar277._0_4_;
                auVar277 = vshufps_avx(auVar22,auVar22,0xff);
                auVar89 = vfmsub213ss_fma(auVar92,auVar93,auVar277);
                fVar274 = auVar91._0_4_ * auVar93._0_4_;
                auVar92 = vfmsub231ss_fma(ZEXT416((uint)(auVar88._0_4_ * auVar89._0_4_)),
                                          ZEXT416((uint)fVar259),ZEXT416((uint)fVar274));
                fVar263 = auVar92._0_4_;
                fVar244 = fVar260 * (auVar89._0_4_ / fVar263);
                auVar250 = ZEXT464((uint)fVar244);
                fVar276 = fVar276 - (fVar260 * (fVar274 / fVar263) -
                                    fVar261 * (auVar88._0_4_ / fVar263));
                auVar273 = ZEXT464((uint)fVar276);
                fVar257 = fVar257 - (fVar261 * (fVar259 / fVar263) - fVar244);
                auVar88 = vandps_avx(auVar269,auVar270);
                if (auVar90._0_4_ <= auVar88._0_4_) {
LAB_01c3ac0b:
                  bVar15 = false;
                }
                else {
                  auVar89 = vfmadd231ss_fma(ZEXT416((uint)(auVar90._0_4_ + auVar87._0_4_)),local_7c0
                                            ,ZEXT416(0x36000000));
                  auVar88 = vandps_avx(auVar270,ZEXT416((uint)fVar261));
                  if (auVar89._0_4_ <= auVar88._0_4_) goto LAB_01c3ac0b;
                  fVar257 = fVar257 + (float)local_7b0._0_4_;
                  bVar15 = true;
                  if ((((fVar171 <= fVar257) &&
                       (fVar259 = *(float *)(ray + k * 4 + 0x100), fVar257 <= fVar259)) &&
                      (0.0 <= fVar276)) && (fVar276 <= 1.0)) {
                    auVar139._0_16_ = ZEXT816(0) << 0x20;
                    auVar138._4_28_ = auVar139._4_28_;
                    auVar138._0_4_ = local_8c0._0_4_;
                    auVar88 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar138._0_16_);
                    fVar260 = auVar88._0_4_;
                    auVar88 = vmulss_avx512f(local_8c0._0_16_,ZEXT416(0xbf000000));
                    pGVar9 = (context->scene->geometries).items[uVar72].ptr;
                    if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      fVar260 = fVar260 * 1.5 + auVar88._0_4_ * fVar260 * fVar260 * fVar260;
                      auVar193._0_4_ = local_8a0._0_4_ * fVar260;
                      auVar193._4_4_ = local_8a0._4_4_ * fVar260;
                      auVar193._8_4_ = local_8a0._8_4_ * fVar260;
                      auVar193._12_4_ = local_8a0._12_4_ * fVar260;
                      auVar90 = vfmadd213ps_fma(auVar277,auVar193,auVar22);
                      auVar88 = vshufps_avx(auVar193,auVar193,0xc9);
                      auVar277 = vshufps_avx(auVar22,auVar22,0xc9);
                      auVar194._0_4_ = auVar193._0_4_ * auVar277._0_4_;
                      auVar194._4_4_ = auVar193._4_4_ * auVar277._4_4_;
                      auVar194._8_4_ = auVar193._8_4_ * auVar277._8_4_;
                      auVar194._12_4_ = auVar193._12_4_ * auVar277._12_4_;
                      auVar89 = vfmsub231ps_fma(auVar194,auVar22,auVar88);
                      auVar88 = vshufps_avx(auVar89,auVar89,0xc9);
                      auVar277 = vshufps_avx(auVar90,auVar90,0xc9);
                      auVar89 = vshufps_avx(auVar89,auVar89,0xd2);
                      auVar161._0_4_ = auVar90._0_4_ * auVar89._0_4_;
                      auVar161._4_4_ = auVar90._4_4_ * auVar89._4_4_;
                      auVar161._8_4_ = auVar90._8_4_ * auVar89._8_4_;
                      auVar161._12_4_ = auVar90._12_4_ * auVar89._12_4_;
                      auVar88 = vfmsub231ps_fma(auVar161,auVar88,auVar277);
                      uVar149 = auVar88._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = fVar257;
                        uVar8 = vextractps_avx(auVar88,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar8;
                        uVar8 = vextractps_avx(auVar88,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar8;
                        *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar149;
                        *(float *)(ray + k * 4 + 0x1e0) = fVar276;
                        *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                        *(uint *)(ray + k * 4 + 0x220) = uVar7;
                        *(uint *)(ray + k * 4 + 0x240) = uVar72;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar13 = context->user;
                        auVar215._8_4_ = 1;
                        auVar215._0_8_ = 0x100000001;
                        auVar215._12_4_ = 1;
                        auVar215._16_4_ = 1;
                        auVar215._20_4_ = 1;
                        auVar215._24_4_ = 1;
                        auVar215._28_4_ = 1;
                        auVar97 = vpermps_avx2(auVar215,ZEXT1632(auVar88));
                        auVar232._8_4_ = 2;
                        auVar232._0_8_ = 0x200000002;
                        auVar232._12_4_ = 2;
                        auVar232._16_4_ = 2;
                        auVar232._20_4_ = 2;
                        auVar232._24_4_ = 2;
                        auVar232._28_4_ = 2;
                        local_560 = vpermps_avx2(auVar232,ZEXT1632(auVar88));
                        local_580[0] = (RTCHitN)auVar97[0];
                        local_580[1] = (RTCHitN)auVar97[1];
                        local_580[2] = (RTCHitN)auVar97[2];
                        local_580[3] = (RTCHitN)auVar97[3];
                        local_580[4] = (RTCHitN)auVar97[4];
                        local_580[5] = (RTCHitN)auVar97[5];
                        local_580[6] = (RTCHitN)auVar97[6];
                        local_580[7] = (RTCHitN)auVar97[7];
                        local_580[8] = (RTCHitN)auVar97[8];
                        local_580[9] = (RTCHitN)auVar97[9];
                        local_580[10] = (RTCHitN)auVar97[10];
                        local_580[0xb] = (RTCHitN)auVar97[0xb];
                        local_580[0xc] = (RTCHitN)auVar97[0xc];
                        local_580[0xd] = (RTCHitN)auVar97[0xd];
                        local_580[0xe] = (RTCHitN)auVar97[0xe];
                        local_580[0xf] = (RTCHitN)auVar97[0xf];
                        local_580[0x10] = (RTCHitN)auVar97[0x10];
                        local_580[0x11] = (RTCHitN)auVar97[0x11];
                        local_580[0x12] = (RTCHitN)auVar97[0x12];
                        local_580[0x13] = (RTCHitN)auVar97[0x13];
                        local_580[0x14] = (RTCHitN)auVar97[0x14];
                        local_580[0x15] = (RTCHitN)auVar97[0x15];
                        local_580[0x16] = (RTCHitN)auVar97[0x16];
                        local_580[0x17] = (RTCHitN)auVar97[0x17];
                        local_580[0x18] = (RTCHitN)auVar97[0x18];
                        local_580[0x19] = (RTCHitN)auVar97[0x19];
                        local_580[0x1a] = (RTCHitN)auVar97[0x1a];
                        local_580[0x1b] = (RTCHitN)auVar97[0x1b];
                        local_580[0x1c] = (RTCHitN)auVar97[0x1c];
                        local_580[0x1d] = (RTCHitN)auVar97[0x1d];
                        local_580[0x1e] = (RTCHitN)auVar97[0x1e];
                        local_580[0x1f] = (RTCHitN)auVar97[0x1f];
                        local_540 = uVar149;
                        uStack_53c = uVar149;
                        uStack_538 = uVar149;
                        uStack_534 = uVar149;
                        uStack_530 = uVar149;
                        uStack_52c = uVar149;
                        uStack_528 = uVar149;
                        uStack_524 = uVar149;
                        local_520 = fVar276;
                        fStack_51c = fVar276;
                        fStack_518 = fVar276;
                        fStack_514 = fVar276;
                        fStack_510 = fVar276;
                        fStack_50c = fVar276;
                        fStack_508 = fVar276;
                        fStack_504 = fVar276;
                        local_500 = ZEXT432(0) << 0x20;
                        local_4e0 = local_600._0_8_;
                        uStack_4d8 = local_600._8_8_;
                        uStack_4d0 = local_600._16_8_;
                        uStack_4c8 = local_600._24_8_;
                        local_4c0 = local_5e0;
                        auVar97 = vpcmpeqd_avx2(local_5e0,local_5e0);
                        local_8f8[1] = auVar97;
                        *local_8f8 = auVar97;
                        local_4a0 = pRVar13->instID[0];
                        uStack_49c = local_4a0;
                        uStack_498 = local_4a0;
                        uStack_494 = local_4a0;
                        uStack_490 = local_4a0;
                        uStack_48c = local_4a0;
                        uStack_488 = local_4a0;
                        uStack_484 = local_4a0;
                        local_480 = pRVar13->instPrimID[0];
                        uStack_47c = local_480;
                        uStack_478 = local_480;
                        uStack_474 = local_480;
                        uStack_470 = local_480;
                        uStack_46c = local_480;
                        uStack_468 = local_480;
                        uStack_464 = local_480;
                        *(float *)(ray + k * 4 + 0x100) = fVar257;
                        local_7e0 = local_620._0_8_;
                        uStack_7d8 = local_620._8_8_;
                        uStack_7d0 = local_620._16_8_;
                        uStack_7c8 = local_620._24_8_;
                        local_970.valid = (int *)&local_7e0;
                        local_970.geometryUserPtr = pGVar9->userPtr;
                        local_970.context = context->user;
                        local_970.hit = local_580;
                        local_970.N = 8;
                        local_970.ray = (RTCRayN *)ray;
                        if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar250 = ZEXT464((uint)fVar244);
                          auVar271 = ZEXT1664(auVar270);
                          auVar289 = ZEXT1664(local_8a0._0_16_);
                          auVar293 = ZEXT1664(auVar159);
                          auVar296 = ZEXT1664(auVar22);
                          (*pGVar9->intersectionFilterN)(&local_970);
                          auVar273 = ZEXT1664(ZEXT416((uint)fVar276));
                          auVar298 = ZEXT3264(local_8e0);
                        }
                        auVar61._8_8_ = uStack_7d8;
                        auVar61._0_8_ = local_7e0;
                        auVar61._16_8_ = uStack_7d0;
                        auVar61._24_8_ = uStack_7c8;
                        if (auVar61 != (undefined1  [32])0x0) {
                          p_Var14 = context->args->filter;
                          if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar250 = ZEXT1664(auVar250._0_16_);
                            auVar271 = ZEXT1664(auVar271._0_16_);
                            auVar289 = ZEXT1664(auVar289._0_16_);
                            auVar293 = ZEXT1664(auVar293._0_16_);
                            auVar296 = ZEXT1664(auVar296._0_16_);
                            (*p_Var14)(&local_970);
                            auVar273 = ZEXT1664(ZEXT416((uint)fVar276));
                            auVar298 = ZEXT3264(local_8e0);
                          }
                          auVar62._8_8_ = uStack_7d8;
                          auVar62._0_8_ = local_7e0;
                          auVar62._16_8_ = uStack_7d0;
                          auVar62._24_8_ = uStack_7c8;
                          if (auVar62 != (undefined1  [32])0x0) {
                            uVar80 = vptestmd_avx512vl(auVar62,auVar62);
                            iVar3 = *(int *)(local_970.hit + 4);
                            iVar4 = *(int *)(local_970.hit + 8);
                            iVar1 = *(int *)(local_970.hit + 0xc);
                            iVar55 = *(int *)(local_970.hit + 0x10);
                            iVar56 = *(int *)(local_970.hit + 0x14);
                            iVar57 = *(int *)(local_970.hit + 0x18);
                            iVar58 = *(int *)(local_970.hit + 0x1c);
                            bVar74 = (byte)uVar80;
                            bVar79 = (bool)((byte)(uVar80 >> 1) & 1);
                            bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
                            bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
                            bVar18 = (bool)((byte)(uVar80 >> 4) & 1);
                            bVar19 = (bool)((byte)(uVar80 >> 5) & 1);
                            bVar20 = (bool)((byte)(uVar80 >> 6) & 1);
                            bVar21 = SUB81(uVar80 >> 7,0);
                            *(uint *)(local_970.ray + 0x180) =
                                 (uint)(bVar74 & 1) * *(int *)local_970.hit |
                                 (uint)!(bool)(bVar74 & 1) * *(int *)(local_970.ray + 0x180);
                            *(uint *)(local_970.ray + 0x184) =
                                 (uint)bVar79 * iVar3 |
                                 (uint)!bVar79 * *(int *)(local_970.ray + 0x184);
                            *(uint *)(local_970.ray + 0x188) =
                                 (uint)bVar16 * iVar4 |
                                 (uint)!bVar16 * *(int *)(local_970.ray + 0x188);
                            *(uint *)(local_970.ray + 0x18c) =
                                 (uint)bVar17 * iVar1 |
                                 (uint)!bVar17 * *(int *)(local_970.ray + 0x18c);
                            *(uint *)(local_970.ray + 400) =
                                 (uint)bVar18 * iVar55 |
                                 (uint)!bVar18 * *(int *)(local_970.ray + 400);
                            *(uint *)(local_970.ray + 0x194) =
                                 (uint)bVar19 * iVar56 |
                                 (uint)!bVar19 * *(int *)(local_970.ray + 0x194);
                            *(uint *)(local_970.ray + 0x198) =
                                 (uint)bVar20 * iVar57 |
                                 (uint)!bVar20 * *(int *)(local_970.ray + 0x198);
                            *(uint *)(local_970.ray + 0x19c) =
                                 (uint)bVar21 * iVar58 |
                                 (uint)!bVar21 * *(int *)(local_970.ray + 0x19c);
                            iVar3 = *(int *)(local_970.hit + 0x24);
                            iVar4 = *(int *)(local_970.hit + 0x28);
                            iVar1 = *(int *)(local_970.hit + 0x2c);
                            iVar55 = *(int *)(local_970.hit + 0x30);
                            iVar56 = *(int *)(local_970.hit + 0x34);
                            iVar57 = *(int *)(local_970.hit + 0x38);
                            iVar58 = *(int *)(local_970.hit + 0x3c);
                            bVar79 = (bool)((byte)(uVar80 >> 1) & 1);
                            bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
                            bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
                            bVar18 = (bool)((byte)(uVar80 >> 4) & 1);
                            bVar19 = (bool)((byte)(uVar80 >> 5) & 1);
                            bVar20 = (bool)((byte)(uVar80 >> 6) & 1);
                            bVar21 = SUB81(uVar80 >> 7,0);
                            *(uint *)(local_970.ray + 0x1a0) =
                                 (uint)(bVar74 & 1) * *(int *)(local_970.hit + 0x20) |
                                 (uint)!(bool)(bVar74 & 1) * *(int *)(local_970.ray + 0x1a0);
                            *(uint *)(local_970.ray + 0x1a4) =
                                 (uint)bVar79 * iVar3 |
                                 (uint)!bVar79 * *(int *)(local_970.ray + 0x1a4);
                            *(uint *)(local_970.ray + 0x1a8) =
                                 (uint)bVar16 * iVar4 |
                                 (uint)!bVar16 * *(int *)(local_970.ray + 0x1a8);
                            *(uint *)(local_970.ray + 0x1ac) =
                                 (uint)bVar17 * iVar1 |
                                 (uint)!bVar17 * *(int *)(local_970.ray + 0x1ac);
                            *(uint *)(local_970.ray + 0x1b0) =
                                 (uint)bVar18 * iVar55 |
                                 (uint)!bVar18 * *(int *)(local_970.ray + 0x1b0);
                            *(uint *)(local_970.ray + 0x1b4) =
                                 (uint)bVar19 * iVar56 |
                                 (uint)!bVar19 * *(int *)(local_970.ray + 0x1b4);
                            *(uint *)(local_970.ray + 0x1b8) =
                                 (uint)bVar20 * iVar57 |
                                 (uint)!bVar20 * *(int *)(local_970.ray + 0x1b8);
                            *(uint *)(local_970.ray + 0x1bc) =
                                 (uint)bVar21 * iVar58 |
                                 (uint)!bVar21 * *(int *)(local_970.ray + 0x1bc);
                            iVar3 = *(int *)(local_970.hit + 0x44);
                            iVar4 = *(int *)(local_970.hit + 0x48);
                            iVar1 = *(int *)(local_970.hit + 0x4c);
                            iVar55 = *(int *)(local_970.hit + 0x50);
                            iVar56 = *(int *)(local_970.hit + 0x54);
                            iVar57 = *(int *)(local_970.hit + 0x58);
                            iVar58 = *(int *)(local_970.hit + 0x5c);
                            bVar79 = (bool)((byte)(uVar80 >> 1) & 1);
                            bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
                            bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
                            bVar18 = (bool)((byte)(uVar80 >> 4) & 1);
                            bVar19 = (bool)((byte)(uVar80 >> 5) & 1);
                            bVar20 = (bool)((byte)(uVar80 >> 6) & 1);
                            bVar21 = SUB81(uVar80 >> 7,0);
                            *(uint *)(local_970.ray + 0x1c0) =
                                 (uint)(bVar74 & 1) * *(int *)(local_970.hit + 0x40) |
                                 (uint)!(bool)(bVar74 & 1) * *(int *)(local_970.ray + 0x1c0);
                            *(uint *)(local_970.ray + 0x1c4) =
                                 (uint)bVar79 * iVar3 |
                                 (uint)!bVar79 * *(int *)(local_970.ray + 0x1c4);
                            *(uint *)(local_970.ray + 0x1c8) =
                                 (uint)bVar16 * iVar4 |
                                 (uint)!bVar16 * *(int *)(local_970.ray + 0x1c8);
                            *(uint *)(local_970.ray + 0x1cc) =
                                 (uint)bVar17 * iVar1 |
                                 (uint)!bVar17 * *(int *)(local_970.ray + 0x1cc);
                            *(uint *)(local_970.ray + 0x1d0) =
                                 (uint)bVar18 * iVar55 |
                                 (uint)!bVar18 * *(int *)(local_970.ray + 0x1d0);
                            *(uint *)(local_970.ray + 0x1d4) =
                                 (uint)bVar19 * iVar56 |
                                 (uint)!bVar19 * *(int *)(local_970.ray + 0x1d4);
                            *(uint *)(local_970.ray + 0x1d8) =
                                 (uint)bVar20 * iVar57 |
                                 (uint)!bVar20 * *(int *)(local_970.ray + 0x1d8);
                            *(uint *)(local_970.ray + 0x1dc) =
                                 (uint)bVar21 * iVar58 |
                                 (uint)!bVar21 * *(int *)(local_970.ray + 0x1dc);
                            iVar3 = *(int *)(local_970.hit + 100);
                            iVar4 = *(int *)(local_970.hit + 0x68);
                            iVar1 = *(int *)(local_970.hit + 0x6c);
                            iVar55 = *(int *)(local_970.hit + 0x70);
                            iVar56 = *(int *)(local_970.hit + 0x74);
                            iVar57 = *(int *)(local_970.hit + 0x78);
                            iVar58 = *(int *)(local_970.hit + 0x7c);
                            bVar79 = (bool)((byte)(uVar80 >> 1) & 1);
                            bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
                            bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
                            bVar18 = (bool)((byte)(uVar80 >> 4) & 1);
                            bVar19 = (bool)((byte)(uVar80 >> 5) & 1);
                            bVar20 = (bool)((byte)(uVar80 >> 6) & 1);
                            bVar21 = SUB81(uVar80 >> 7,0);
                            *(uint *)(local_970.ray + 0x1e0) =
                                 (uint)(bVar74 & 1) * *(int *)(local_970.hit + 0x60) |
                                 (uint)!(bool)(bVar74 & 1) * *(int *)(local_970.ray + 0x1e0);
                            *(uint *)(local_970.ray + 0x1e4) =
                                 (uint)bVar79 * iVar3 |
                                 (uint)!bVar79 * *(int *)(local_970.ray + 0x1e4);
                            *(uint *)(local_970.ray + 0x1e8) =
                                 (uint)bVar16 * iVar4 |
                                 (uint)!bVar16 * *(int *)(local_970.ray + 0x1e8);
                            *(uint *)(local_970.ray + 0x1ec) =
                                 (uint)bVar17 * iVar1 |
                                 (uint)!bVar17 * *(int *)(local_970.ray + 0x1ec);
                            *(uint *)(local_970.ray + 0x1f0) =
                                 (uint)bVar18 * iVar55 |
                                 (uint)!bVar18 * *(int *)(local_970.ray + 0x1f0);
                            *(uint *)(local_970.ray + 500) =
                                 (uint)bVar19 * iVar56 |
                                 (uint)!bVar19 * *(int *)(local_970.ray + 500);
                            *(uint *)(local_970.ray + 0x1f8) =
                                 (uint)bVar20 * iVar57 |
                                 (uint)!bVar20 * *(int *)(local_970.ray + 0x1f8);
                            *(uint *)(local_970.ray + 0x1fc) =
                                 (uint)bVar21 * iVar58 |
                                 (uint)!bVar21 * *(int *)(local_970.ray + 0x1fc);
                            iVar3 = *(int *)(local_970.hit + 0x84);
                            iVar4 = *(int *)(local_970.hit + 0x88);
                            iVar1 = *(int *)(local_970.hit + 0x8c);
                            iVar55 = *(int *)(local_970.hit + 0x90);
                            iVar56 = *(int *)(local_970.hit + 0x94);
                            iVar57 = *(int *)(local_970.hit + 0x98);
                            iVar58 = *(int *)(local_970.hit + 0x9c);
                            bVar79 = (bool)((byte)(uVar80 >> 1) & 1);
                            bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
                            bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
                            bVar18 = (bool)((byte)(uVar80 >> 4) & 1);
                            bVar19 = (bool)((byte)(uVar80 >> 5) & 1);
                            bVar20 = (bool)((byte)(uVar80 >> 6) & 1);
                            bVar21 = SUB81(uVar80 >> 7,0);
                            *(uint *)(local_970.ray + 0x200) =
                                 (uint)(bVar74 & 1) * *(int *)(local_970.hit + 0x80) |
                                 (uint)!(bool)(bVar74 & 1) * *(int *)(local_970.ray + 0x200);
                            *(uint *)(local_970.ray + 0x204) =
                                 (uint)bVar79 * iVar3 |
                                 (uint)!bVar79 * *(int *)(local_970.ray + 0x204);
                            *(uint *)(local_970.ray + 0x208) =
                                 (uint)bVar16 * iVar4 |
                                 (uint)!bVar16 * *(int *)(local_970.ray + 0x208);
                            *(uint *)(local_970.ray + 0x20c) =
                                 (uint)bVar17 * iVar1 |
                                 (uint)!bVar17 * *(int *)(local_970.ray + 0x20c);
                            *(uint *)(local_970.ray + 0x210) =
                                 (uint)bVar18 * iVar55 |
                                 (uint)!bVar18 * *(int *)(local_970.ray + 0x210);
                            *(uint *)(local_970.ray + 0x214) =
                                 (uint)bVar19 * iVar56 |
                                 (uint)!bVar19 * *(int *)(local_970.ray + 0x214);
                            *(uint *)(local_970.ray + 0x218) =
                                 (uint)bVar20 * iVar57 |
                                 (uint)!bVar20 * *(int *)(local_970.ray + 0x218);
                            *(uint *)(local_970.ray + 0x21c) =
                                 (uint)bVar21 * iVar58 |
                                 (uint)!bVar21 * *(int *)(local_970.ray + 0x21c);
                            auVar97 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                          (local_970.hit + 0xa0));
                            *(undefined1 (*) [32])(local_970.ray + 0x220) = auVar97;
                            auVar97 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                          (local_970.hit + 0xc0));
                            *(undefined1 (*) [32])(local_970.ray + 0x240) = auVar97;
                            auVar97 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                          (local_970.hit + 0xe0));
                            *(undefined1 (*) [32])(local_970.ray + 0x260) = auVar97;
                            auVar97 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                          (local_970.hit + 0x100));
                            *(undefined1 (*) [32])(local_970.ray + 0x280) = auVar97;
                            goto LAB_01c3ac0e;
                          }
                        }
                        *(float *)(ray + k * 4 + 0x100) = fVar259;
                      }
                    }
                  }
                }
LAB_01c3ac0e:
                bVar79 = lVar78 != 0;
                lVar78 = lVar78 + -1;
              } while ((!bVar15) && (bVar79));
              auVar66._4_4_ = fStack_69c;
              auVar66._0_4_ = local_6a0;
              auVar66._8_4_ = fStack_698;
              auVar66._12_4_ = fStack_694;
              auVar66._16_4_ = fStack_690;
              auVar66._20_4_ = fStack_68c;
              auVar66._24_4_ = fStack_688;
              auVar66._28_4_ = fStack_684;
              uVar149 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar43._4_4_ = uVar149;
              auVar43._0_4_ = uVar149;
              auVar43._8_4_ = uVar149;
              auVar43._12_4_ = uVar149;
              auVar43._16_4_ = uVar149;
              auVar43._20_4_ = uVar149;
              auVar43._24_4_ = uVar149;
              auVar43._28_4_ = uVar149;
              uVar24 = vcmpps_avx512vl(auVar66,auVar43,2);
              bVar75 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar75 & (byte)uVar24;
            } while (bVar75 != 0);
          }
          uVar25 = vpcmpd_avx512vl(local_5c0,_local_6c0,1);
          uVar26 = vpcmpd_avx512vl(local_5c0,local_420,1);
          auVar195._0_4_ = (float)local_700._0_4_ + (float)local_1c0._0_4_;
          auVar195._4_4_ = (float)local_700._4_4_ + (float)local_1c0._4_4_;
          auVar195._8_4_ = fStack_6f8 + fStack_1b8;
          auVar195._12_4_ = fStack_6f4 + fStack_1b4;
          auVar195._16_4_ = fStack_6f0 + fStack_1b0;
          auVar195._20_4_ = fStack_6ec + fStack_1ac;
          auVar195._24_4_ = fStack_6e8 + fStack_1a8;
          auVar195._28_4_ = fStack_6e4 + fStack_1a4;
          uVar149 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar216._4_4_ = uVar149;
          auVar216._0_4_ = uVar149;
          auVar216._8_4_ = uVar149;
          auVar216._12_4_ = uVar149;
          auVar216._16_4_ = uVar149;
          auVar216._20_4_ = uVar149;
          auVar216._24_4_ = uVar149;
          auVar216._28_4_ = uVar149;
          uVar24 = vcmpps_avx512vl(auVar195,auVar216,2);
          bVar71 = bVar71 & (byte)uVar26 & (byte)uVar24;
          auVar233._0_4_ = (float)local_700._0_4_ + (float)local_460._0_4_;
          auVar233._4_4_ = (float)local_700._4_4_ + (float)local_460._4_4_;
          auVar233._8_4_ = fStack_6f8 + fStack_458;
          auVar233._12_4_ = fStack_6f4 + fStack_454;
          auVar233._16_4_ = fStack_6f0 + fStack_450;
          auVar233._20_4_ = fStack_6ec + fStack_44c;
          auVar233._24_4_ = fStack_6e8 + fStack_448;
          auVar233._28_4_ = fStack_6e4 + fStack_444;
          uVar24 = vcmpps_avx512vl(auVar233,auVar216,2);
          bVar73 = bVar73 & (byte)uVar25 & (byte)uVar24 | bVar71;
          prim = local_8f0;
          if (bVar73 == 0) {
            auVar273 = ZEXT3264(CONCAT428(0x7fffffff,
                                          CONCAT424(0x7fffffff,
                                                    CONCAT420(0x7fffffff,
                                                              CONCAT416(0x7fffffff,
                                                                        CONCAT412(0x7fffffff,
                                                                                  CONCAT48(
                                                  0x7fffffff,0x7fffffff7fffffff)))))));
            auVar279 = ZEXT3264(_DAT_02020f20);
            auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar299 = ZEXT3264(auVar97);
          }
          else {
            abStack_180[uVar70 * 0x60] = bVar73;
            bVar15 = (bool)(bVar71 >> 1 & 1);
            bVar79 = (bool)(bVar71 >> 2 & 1);
            bVar16 = (bool)(bVar71 >> 3 & 1);
            bVar17 = (bool)(bVar71 >> 4 & 1);
            bVar18 = (bool)(bVar71 >> 5 & 1);
            auStack_160[uVar70 * 0x18] =
                 (uint)(bVar71 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar71 & 1) * local_460._0_4_;
            auStack_160[uVar70 * 0x18 + 1] =
                 (uint)bVar15 * local_1c0._4_4_ | (uint)!bVar15 * local_460._4_4_;
            auStack_160[uVar70 * 0x18 + 2] =
                 (uint)bVar79 * (int)fStack_1b8 | (uint)!bVar79 * (int)fStack_458;
            auStack_160[uVar70 * 0x18 + 3] =
                 (uint)bVar16 * (int)fStack_1b4 | (uint)!bVar16 * (int)fStack_454;
            auStack_160[uVar70 * 0x18 + 4] =
                 (uint)bVar17 * (int)fStack_1b0 | (uint)!bVar17 * (int)fStack_450;
            auStack_160[uVar70 * 0x18 + 5] =
                 (uint)bVar18 * (int)fStack_1ac | (uint)!bVar18 * (int)fStack_44c;
            auStack_160[uVar70 * 0x18 + 6] =
                 (uint)(bVar71 >> 6) * (int)fStack_1a8 |
                 (uint)!(bool)(bVar71 >> 6) * (int)fStack_448;
            (&fStack_144)[uVar70 * 0x18] = fStack_444;
            uVar24 = vmovlps_avx(local_910);
            (&uStack_140)[uVar70 * 0xc] = uVar24;
            afStack_138[uVar70 * 0x18] = (float)((int)local_8e8 + 1);
            uVar70 = (ulong)((int)uVar70 + 1);
            auVar273 = ZEXT3264(CONCAT428(0x7fffffff,
                                          CONCAT424(0x7fffffff,
                                                    CONCAT420(0x7fffffff,
                                                              CONCAT416(0x7fffffff,
                                                                        CONCAT412(0x7fffffff,
                                                                                  CONCAT48(
                                                  0x7fffffff,0x7fffffff7fffffff)))))));
            auVar279 = ZEXT3264(_DAT_02020f20);
            auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar299 = ZEXT3264(auVar97);
          }
        }
      }
    }
    auVar217 = ZEXT1664(local_910);
    do {
      if ((int)uVar70 == 0) {
        uVar149 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar33._4_4_ = uVar149;
        auVar33._0_4_ = uVar149;
        auVar33._8_4_ = uVar149;
        auVar33._12_4_ = uVar149;
        uVar24 = vcmpps_avx512vl(local_630,auVar33,2);
        uVar72 = (uint)uVar24 & (uint)local_748 - 1 & (uint)local_748;
        local_748 = (ulong)uVar72;
        if (uVar72 == 0) {
          return;
        }
        goto LAB_01c38837;
      }
      uVar80 = (ulong)((int)uVar70 - 1);
      auVar97 = *(undefined1 (*) [32])(auStack_160 + uVar80 * 0x18);
      auVar196._0_4_ = auVar97._0_4_ + (float)local_700._0_4_;
      auVar196._4_4_ = auVar97._4_4_ + (float)local_700._4_4_;
      auVar196._8_4_ = auVar97._8_4_ + fStack_6f8;
      auVar196._12_4_ = auVar97._12_4_ + fStack_6f4;
      auVar196._16_4_ = auVar97._16_4_ + fStack_6f0;
      auVar196._20_4_ = auVar97._20_4_ + fStack_6ec;
      auVar196._24_4_ = auVar97._24_4_ + fStack_6e8;
      auVar196._28_4_ = auVar97._28_4_ + fStack_6e4;
      uVar149 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar44._4_4_ = uVar149;
      auVar44._0_4_ = uVar149;
      auVar44._8_4_ = uVar149;
      auVar44._12_4_ = uVar149;
      auVar44._16_4_ = uVar149;
      auVar44._20_4_ = uVar149;
      auVar44._24_4_ = uVar149;
      auVar44._28_4_ = uVar149;
      uVar24 = vcmpps_avx512vl(auVar196,auVar44,2);
      uVar81 = (uint)uVar24 & (uint)abStack_180[uVar80 * 0x60];
      bVar73 = (byte)uVar81;
      if (uVar81 != 0) {
        auVar197._8_4_ = 0x7f800000;
        auVar197._0_8_ = 0x7f8000007f800000;
        auVar197._12_4_ = 0x7f800000;
        auVar197._16_4_ = 0x7f800000;
        auVar197._20_4_ = 0x7f800000;
        auVar197._24_4_ = 0x7f800000;
        auVar197._28_4_ = 0x7f800000;
        auVar96 = vblendmps_avx512vl(auVar197,auVar97);
        auVar140._0_4_ =
             (uint)(bVar73 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar73 & 1) * (int)auVar97._0_4_;
        bVar15 = (bool)((byte)(uVar81 >> 1) & 1);
        auVar140._4_4_ = (uint)bVar15 * auVar96._4_4_ | (uint)!bVar15 * (int)auVar97._4_4_;
        bVar15 = (bool)((byte)(uVar81 >> 2) & 1);
        auVar140._8_4_ = (uint)bVar15 * auVar96._8_4_ | (uint)!bVar15 * (int)auVar97._8_4_;
        bVar15 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar140._12_4_ = (uint)bVar15 * auVar96._12_4_ | (uint)!bVar15 * (int)auVar97._12_4_;
        bVar15 = (bool)((byte)(uVar81 >> 4) & 1);
        auVar140._16_4_ = (uint)bVar15 * auVar96._16_4_ | (uint)!bVar15 * (int)auVar97._16_4_;
        bVar15 = (bool)((byte)(uVar81 >> 5) & 1);
        auVar140._20_4_ = (uint)bVar15 * auVar96._20_4_ | (uint)!bVar15 * (int)auVar97._20_4_;
        bVar15 = (bool)((byte)(uVar81 >> 6) & 1);
        auVar140._24_4_ = (uint)bVar15 * auVar96._24_4_ | (uint)!bVar15 * (int)auVar97._24_4_;
        auVar140._28_4_ =
             (uVar81 >> 7) * auVar96._28_4_ | (uint)!SUB41(uVar81 >> 7,0) * (int)auVar97._28_4_;
        auVar97 = vshufps_avx(auVar140,auVar140,0xb1);
        auVar97 = vminps_avx(auVar140,auVar97);
        auVar96 = vshufpd_avx(auVar97,auVar97,5);
        auVar97 = vminps_avx(auVar97,auVar96);
        auVar96 = vpermpd_avx2(auVar97,0x4e);
        auVar97 = vminps_avx(auVar97,auVar96);
        uVar24 = vcmpps_avx512vl(auVar140,auVar97,0);
        bVar75 = (byte)uVar24 & bVar73;
        if (bVar75 != 0) {
          uVar81 = (uint)bVar75;
        }
        fVar251 = afStack_138[uVar80 * 0x18 + -1];
        uVar141 = 0;
        for (; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x80000000) {
          uVar141 = uVar141 + 1;
        }
        local_8e8 = (ulong)(uint)afStack_138[uVar80 * 0x18];
        bVar75 = ~('\x01' << ((byte)uVar141 & 0x1f)) & bVar73;
        abStack_180[uVar80 * 0x60] = bVar75;
        uVar77 = uVar80;
        if (bVar75 != 0) {
          uVar77 = uVar70;
        }
        fVar257 = *(float *)(&uStack_140 + uVar80 * 0xc);
        auVar198._4_4_ = fVar257;
        auVar198._0_4_ = fVar257;
        auVar198._8_4_ = fVar257;
        auVar198._12_4_ = fVar257;
        auVar198._16_4_ = fVar257;
        auVar198._20_4_ = fVar257;
        auVar198._24_4_ = fVar257;
        auVar198._28_4_ = fVar257;
        fVar251 = fVar251 - fVar257;
        auVar170._4_4_ = fVar251;
        auVar170._0_4_ = fVar251;
        auVar170._8_4_ = fVar251;
        auVar170._12_4_ = fVar251;
        auVar170._16_4_ = fVar251;
        auVar170._20_4_ = fVar251;
        auVar170._24_4_ = fVar251;
        auVar170._28_4_ = fVar251;
        auVar88 = vfmadd132ps_fma(auVar170,auVar198,auVar279._0_32_);
        auVar97 = ZEXT1632(auVar88);
        local_580[0] = (RTCHitN)auVar97[0];
        local_580[1] = (RTCHitN)auVar97[1];
        local_580[2] = (RTCHitN)auVar97[2];
        local_580[3] = (RTCHitN)auVar97[3];
        local_580[4] = (RTCHitN)auVar97[4];
        local_580[5] = (RTCHitN)auVar97[5];
        local_580[6] = (RTCHitN)auVar97[6];
        local_580[7] = (RTCHitN)auVar97[7];
        local_580[8] = (RTCHitN)auVar97[8];
        local_580[9] = (RTCHitN)auVar97[9];
        local_580[10] = (RTCHitN)auVar97[10];
        local_580[0xb] = (RTCHitN)auVar97[0xb];
        local_580[0xc] = (RTCHitN)auVar97[0xc];
        local_580[0xd] = (RTCHitN)auVar97[0xd];
        local_580[0xe] = (RTCHitN)auVar97[0xe];
        local_580[0xf] = (RTCHitN)auVar97[0xf];
        local_580[0x10] = (RTCHitN)auVar97[0x10];
        local_580[0x11] = (RTCHitN)auVar97[0x11];
        local_580[0x12] = (RTCHitN)auVar97[0x12];
        local_580[0x13] = (RTCHitN)auVar97[0x13];
        local_580[0x14] = (RTCHitN)auVar97[0x14];
        local_580[0x15] = (RTCHitN)auVar97[0x15];
        local_580[0x16] = (RTCHitN)auVar97[0x16];
        local_580[0x17] = (RTCHitN)auVar97[0x17];
        local_580[0x18] = (RTCHitN)auVar97[0x18];
        local_580[0x19] = (RTCHitN)auVar97[0x19];
        local_580[0x1a] = (RTCHitN)auVar97[0x1a];
        local_580[0x1b] = (RTCHitN)auVar97[0x1b];
        local_580[0x1c] = (RTCHitN)auVar97[0x1c];
        local_580[0x1d] = (RTCHitN)auVar97[0x1d];
        local_580[0x1e] = (RTCHitN)auVar97[0x1e];
        local_580[0x1f] = (RTCHitN)auVar97[0x1f];
        auVar217 = ZEXT864(*(ulong *)(local_580 + (ulong)uVar141 * 4));
        uVar80 = uVar77;
      }
      uVar70 = uVar80;
      auVar96 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    } while (bVar73 == 0);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }